

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O1

void av1_resize_and_extend_frame_ssse3
               (YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *dst,InterpFilter filter,int phase,
               int num_planes)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  ushort *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  ushort *puVar6;
  ushort *puVar7;
  ushort *puVar8;
  ulong uVar9;
  int16_t *piVar10;
  code *pcVar11;
  code *pcVar12;
  char cVar13;
  byte bVar14;
  byte bVar22;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  char cVar61;
  char cVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [12];
  undefined1 auVar94 [12];
  undefined1 auVar95 [12];
  undefined1 auVar96 [12];
  undefined1 auVar97 [12];
  undefined1 auVar98 [12];
  undefined1 auVar99 [12];
  undefined1 auVar100 [12];
  undefined1 auVar101 [12];
  undefined1 auVar102 [12];
  undefined1 auVar103 [12];
  undefined1 auVar104 [12];
  undefined1 auVar105 [12];
  undefined1 *puVar106;
  uint uVar107;
  int iVar108;
  int iVar109;
  ulong uVar110;
  long lVar111;
  undefined8 *__ptr;
  undefined1 (*__ptr_00) [16];
  uint uVar112;
  InterpFilterParams *pIVar113;
  ulong uVar114;
  uint8_t *puVar115;
  long lVar116;
  uint8_t *puVar117;
  uint uVar118;
  int iVar119;
  ulong uVar120;
  uint8_t *puVar121;
  undefined1 (*pauVar122) [16];
  int iVar123;
  uint uVar124;
  long lVar125;
  long lVar126;
  uint8_t *puVar127;
  long lVar128;
  long lVar129;
  long lVar130;
  long lVar131;
  ulong uVar132;
  uint8_t *puVar133;
  ulong uVar134;
  long lVar135;
  int iVar136;
  int iVar137;
  undefined1 (*pauVar138) [16];
  long lVar139;
  int iVar140;
  ulong *puVar141;
  undefined8 *puVar142;
  bool bVar143;
  bool bVar144;
  undefined2 uVar145;
  ushort uVar146;
  ushort uVar147;
  undefined8 uVar150;
  ushort uVar167;
  ushort uVar168;
  ushort uVar169;
  ushort uVar171;
  ushort uVar172;
  ushort uVar173;
  ushort uVar174;
  ushort uVar175;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  undefined8 uVar151;
  undefined8 uVar152;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar160 [16];
  ushort uVar170;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  ushort uVar176;
  undefined1 auVar166 [16];
  undefined2 uVar177;
  ushort uVar178;
  ushort uVar193;
  ushort uVar194;
  ushort uVar195;
  ushort uVar196;
  ushort uVar197;
  ushort uVar198;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  ushort uVar199;
  undefined2 uVar200;
  undefined1 auVar205 [12];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar216 [16];
  undefined2 uVar222;
  ushort uVar223;
  ushort uVar238;
  ushort uVar239;
  ushort uVar240;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar233 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar258 [16];
  undefined1 auVar266 [16];
  undefined1 auVar274 [16];
  undefined1 auVar282 [16];
  undefined1 auVar290 [16];
  undefined1 auVar298 [16];
  undefined1 auVar306 [16];
  undefined1 auVar314 [16];
  undefined1 auVar322 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [12];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar355 [16];
  undefined1 auVar363 [16];
  undefined1 auVar371 [16];
  undefined1 auVar379 [16];
  undefined1 auVar387 [16];
  undefined1 auVar395 [16];
  undefined1 auVar403 [16];
  undefined1 auVar411 [16];
  undefined1 auVar419 [16];
  undefined1 auVar427 [16];
  undefined1 auVar430 [16];
  undefined4 uVar431;
  undefined1 auVar435 [16];
  undefined1 auVar438 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar450 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar530 [16];
  undefined1 auVar538 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined4 uVar550;
  undefined1 auVar554 [16];
  undefined1 auVar558 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [12];
  undefined1 auVar659 [12];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar666 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined4 uVar688;
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined4 uVar704;
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  __m128i s [12];
  __m128i f2 [5];
  __m128i f1 [5];
  uint8_t *local_350;
  uint8_t *local_340;
  undefined1 local_328 [16];
  undefined1 local_308 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  short local_2c8;
  short sStack_2c6;
  short sStack_2c4;
  short sStack_2c2;
  short sStack_2c0;
  short sStack_2be;
  short sStack_2bc;
  short sStack_2ba;
  undefined8 local_288;
  short sStack_280;
  short sStack_27e;
  short sStack_27c;
  short sStack_27a;
  undefined1 local_278 [16];
  uint local_238;
  undefined8 local_228 [2];
  undefined2 local_218;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  undefined8 uStack_210;
  undefined4 local_208 [4];
  undefined2 local_1f8;
  undefined2 uStack_1f6;
  undefined2 uStack_1f4;
  undefined2 uStack_1f2;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined8 uStack_1e0;
  undefined2 local_1d8;
  undefined2 uStack_1d6;
  undefined2 uStack_1d4;
  undefined2 uStack_1d2;
  undefined8 uStack_1d0;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [16];
  undefined8 local_158;
  undefined8 uStack_150;
  long local_148;
  InterpKernel *local_140;
  ulong local_138;
  undefined4 *local_130;
  undefined8 *local_128;
  undefined4 *local_120;
  undefined8 *local_118;
  char *local_110;
  char *local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  char acStack_c8 [64];
  undefined1 local_88 [16];
  char acStack_78 [72];
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  undefined4 uVar148;
  undefined1 auVar161 [16];
  undefined6 uVar149;
  undefined1 auVar162 [16];
  undefined1 auVar156 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined4 uVar179;
  undefined6 uVar180;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar181 [12];
  undefined1 auVar182 [14];
  undefined1 auVar191 [16];
  undefined1 auVar209 [16];
  undefined4 uVar201;
  undefined6 uVar202;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined8 uVar203;
  undefined1 auVar204 [12];
  undefined1 auVar206 [14];
  undefined1 auVar221 [16];
  undefined1 auVar220 [16];
  undefined4 uVar224;
  undefined1 auVar234 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar241 [16];
  undefined1 auVar333 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar339 [14];
  undefined1 auVar345 [16];
  undefined1 auVar446 [16];
  undefined1 auVar432 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar447 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar433 [16];
  undefined1 auVar448 [16];
  undefined1 auVar434 [16];
  undefined1 auVar449 [16];
  undefined1 auVar551 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar661 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar660 [14];
  undefined1 auVar673 [16];
  undefined1 auVar672 [16];
  undefined1 auVar689 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar705 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  
  iVar123 = (src->field_2).field_0.y_crop_width;
  iVar119 = (src->field_3).field_0.y_crop_height;
  iVar140 = (dst->field_2).field_0.y_crop_width;
  iVar108 = (dst->field_3).field_0.y_crop_height;
  bVar143 = true;
  if (iVar108 * 2 != iVar119 || iVar140 * 2 != iVar123) {
    if ((iVar108 * 4 != iVar119 || iVar140 * 4 != iVar123) &&
       ((iVar140 * 4 + iVar123 * -3 != 0 || (iVar108 * 4 + iVar119 * -3 != 0)))) {
      bVar143 = iVar119 * 2 == iVar108 && iVar123 * 2 == iVar140;
    }
  }
  if (1 < num_planes) {
    if (!bVar143) goto LAB_003e8686;
    iVar123 = (src->field_2).field_0.uv_crop_width;
    iVar119 = (src->field_3).field_0.uv_crop_height;
    iVar140 = (dst->field_2).field_0.uv_crop_width;
    iVar108 = (dst->field_3).field_0.uv_crop_height;
    if (iVar108 * 2 == iVar119 && iVar140 * 2 == iVar123) goto LAB_003e5fba;
    if ((iVar108 * 4 == iVar119 && iVar140 * 4 == iVar123) ||
       ((iVar140 * 4 + iVar123 * -3 == 0 && (iVar108 * 4 + iVar119 * -3 == 0)))) goto LAB_003e5fba;
    bVar143 = iVar119 * 2 == iVar108 && iVar123 * 2 == iVar140;
  }
  if (bVar143) {
LAB_003e5fba:
    if (0 < num_planes) {
      uVar134 = 3;
      if (num_planes < 3) {
        uVar134 = (ulong)(uint)num_planes;
      }
      pIVar113 = av1_interp_filter_params_list + filter;
      uVar112 = phase + 0x15;
      uVar107 = phase + 0x2a;
      uVar118 = uVar112 >> 4 & 1;
      uVar124 = uVar107 >> 4 & 1;
      local_138 = (ulong)uVar124;
      local_100 = (ulong)(uVar118 * 8);
      local_108 = acStack_78 + (uVar118 << 4);
      local_110 = acStack_c8 + (uVar124 << 4);
      local_118 = local_228 + (long)((int)uVar112 >> 5) * 2;
      local_120 = local_208 + (long)((int)uVar112 >> 5) * 4;
      local_128 = local_228 + (long)((int)uVar107 >> 5) * 2;
      local_130 = local_208 + (long)((int)uVar107 >> 5) * 4;
      local_148 = (long)phase * 0x10;
      local_140 = av1_bilinear_filters + phase;
      local_e8 = (ulong)((phase & 0xfU) << 4);
      local_f0 = (ulong)((uVar112 & 0xf) << 4);
      local_f8 = (ulong)((uVar107 & 0xf) << 4);
      uVar132 = 0;
      bVar143 = false;
      auVar166 = _DAT_0050f2b0;
      do {
        auVar153 = local_278;
        bVar144 = uVar132 != 0;
        lVar111 = (ulong)bVar144 * 4;
        iVar123 = *(int *)((long)src->store_buf_adr + lVar111 + -0x38);
        local_278._0_4_ = *(uint *)((long)src->store_buf_adr + lVar111 + -0x30);
        local_278._4_4_ = 0;
        iVar119 = *(int *)((long)dst->store_buf_adr + lVar111 + -0x38);
        iVar140 = *(int *)((long)dst->store_buf_adr + lVar111 + -0x30);
        uVar110 = (long)(dst->field_2).field_0.y_crop_width + 1U & 0xfffffffffffffffe;
        uVar120 = (long)(dst->field_3).field_0.y_crop_height + 1;
        uVar114 = uVar120 & 0xfffffffffffffffe;
        local_278 = auVar153;
        if ((iVar119 * 2 == iVar123) && (iVar140 * 2 == local_278._0_4_)) {
          if (phase == 0) {
            puVar115 = src->store_buf_adr[uVar132 - 4];
            iVar123 = *(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar144 * 4) - 0x28));
            puVar133 = dst->store_buf_adr[uVar132 - 4];
            iVar108 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar144 * 4) - 0x28));
            uVar107 = iVar119 + 0xfU & 0xfffffff0;
            do {
              lVar129 = 0;
              lVar111 = (long)(int)uVar107 * 2 + (long)iVar123 * -2;
              do {
                puVar3 = (ushort *)(puVar115 + lVar129 * 2);
                uVar63 = puVar3[1];
                uVar64 = puVar3[2];
                uVar65 = puVar3[3];
                uVar66 = puVar3[4];
                uVar67 = puVar3[5];
                uVar68 = puVar3[6];
                uVar69 = puVar3[7];
                puVar6 = (ushort *)(puVar115 + lVar129 * 2 + 0x10);
                uVar147 = *puVar6;
                uVar169 = puVar6[1];
                uVar172 = puVar6[2];
                uVar175 = puVar6[3];
                uVar223 = puVar6[4];
                uVar238 = puVar6[5];
                uVar239 = puVar6[6];
                uVar240 = puVar6[7];
                uVar146 = *puVar3 & 0xff;
                uVar167 = uVar63 & 0xff;
                uVar168 = uVar64 & 0xff;
                uVar170 = uVar65 & 0xff;
                uVar171 = uVar66 & 0xff;
                uVar173 = uVar67 & 0xff;
                uVar174 = uVar68 & 0xff;
                uVar176 = uVar69 & 0xff;
                uVar178 = uVar147 & 0xff;
                uVar193 = uVar169 & 0xff;
                uVar194 = uVar172 & 0xff;
                uVar195 = uVar175 & 0xff;
                uVar196 = uVar223 & 0xff;
                uVar197 = uVar238 & 0xff;
                uVar198 = uVar239 & 0xff;
                uVar199 = uVar240 & 0xff;
                puVar127 = puVar133 + lVar129;
                *puVar127 = (uVar146 != 0) * (uVar146 < 0x100) * (char)*puVar3 - (0xff < uVar146);
                puVar127[1] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar63 - (0xff < uVar167);
                puVar127[2] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar64 - (0xff < uVar168);
                puVar127[3] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar65 - (0xff < uVar170);
                puVar127[4] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar66 - (0xff < uVar171);
                puVar127[5] = (uVar173 != 0) * (uVar173 < 0x100) * (char)uVar67 - (0xff < uVar173);
                puVar127[6] = (uVar174 != 0) * (uVar174 < 0x100) * (char)uVar68 - (0xff < uVar174);
                puVar127[7] = (uVar176 != 0) * (uVar176 < 0x100) * (char)uVar69 - (0xff < uVar176);
                puVar127[8] = (uVar178 != 0) * (uVar178 < 0x100) * (char)uVar147 - (0xff < uVar178);
                puVar127[9] = (uVar193 != 0) * (uVar193 < 0x100) * (char)uVar169 - (0xff < uVar193);
                puVar127[10] = (uVar194 != 0) * (uVar194 < 0x100) * (char)uVar172 - (0xff < uVar194)
                ;
                puVar127[0xb] =
                     (uVar195 != 0) * (uVar195 < 0x100) * (char)uVar175 - (0xff < uVar195);
                puVar127[0xc] =
                     (uVar196 != 0) * (uVar196 < 0x100) * (char)uVar223 - (0xff < uVar196);
                puVar127[0xd] =
                     (uVar197 != 0) * (uVar197 < 0x100) * (char)uVar238 - (0xff < uVar197);
                puVar127[0xe] =
                     (uVar198 != 0) * (uVar198 < 0x100) * (char)uVar239 - (0xff < uVar198);
                puVar127[0xf] =
                     (uVar199 != 0) * (uVar199 < 0x100) * (char)uVar240 - (0xff < uVar199);
                lVar129 = lVar129 + 0x10;
                lVar111 = lVar111 + -0x20;
              } while (uVar107 != (uint)lVar129);
              puVar115 = puVar115 + -lVar111;
              puVar133 = puVar133 + lVar129 + ((long)iVar108 - (long)(int)uVar107);
              iVar140 = iVar140 + -1;
            } while (iVar140 != 0);
          }
          else if (filter == BILINEAR) {
            lVar111 = (long)*(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar144 * 4) - 0x28))
            ;
            puVar115 = dst->store_buf_adr[uVar132 - 4];
            iVar123 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar144 * 4) - 0x28));
            uVar107 = iVar119 + 0xfU & 0xfffffff0;
            auVar153 = ZEXT416(CONCAT22((short)((uint)*(int *)(*local_140 + 4) >> 8),
                                        (ushort)(*(int *)(*local_140 + 4) << 8) | (*local_140)[3]));
            auVar153 = pshuflw(auVar153,auVar153,0);
            auVar154._0_4_ = auVar153._0_4_;
            auVar154._4_4_ = auVar154._0_4_;
            auVar154._8_4_ = auVar154._0_4_;
            auVar154._12_4_ = auVar154._0_4_;
            puVar133 = src->store_buf_adr[uVar132 - 4];
            do {
              puVar127 = puVar133 + (lVar111 - (int)uVar107) * 2;
              lVar129 = 0;
              do {
                auVar153 = pmaddubsw(*(undefined1 (*) [16])(puVar133 + lVar129 * 2),auVar154);
                auVar207 = pmaddubsw(*(undefined1 (*) [16])(puVar133 + lVar129 * 2 + 0x10),auVar154)
                ;
                auVar153 = paddsw(auVar153,auVar166);
                auVar207 = paddsw(auVar207,auVar166);
                auVar153 = psraw(auVar153,7);
                auVar207 = psraw(auVar207,7);
                sVar30 = auVar153._0_2_;
                sVar31 = auVar153._2_2_;
                sVar33 = auVar153._4_2_;
                sVar35 = auVar153._6_2_;
                sVar37 = auVar153._8_2_;
                sVar39 = auVar153._10_2_;
                sVar41 = auVar153._12_2_;
                sVar43 = auVar153._14_2_;
                cVar13 = (0 < sVar43) * (sVar43 < 0x100) * auVar153[0xe] - (0xff < sVar43);
                sVar45 = auVar207._0_2_;
                sVar47 = auVar207._2_2_;
                sVar49 = auVar207._4_2_;
                sVar51 = auVar207._6_2_;
                sVar53 = auVar207._8_2_;
                sVar55 = auVar207._10_2_;
                sVar57 = auVar207._12_2_;
                sVar59 = auVar207._14_2_;
                auVar208 = pmaddubsw(*(undefined1 (*) [16])(puVar133 + lVar129 * 2 + lVar111),
                                     auVar154);
                auVar225 = pmaddubsw(*(undefined1 (*) [16])(puVar133 + lVar129 * 2 + lVar111 + 0x10)
                                     ,auVar154);
                auVar208 = paddsw(auVar208,auVar166);
                auVar225 = paddsw(auVar225,auVar166);
                auVar208 = psraw(auVar208,7);
                auVar225 = psraw(auVar225,7);
                sVar43 = auVar208._0_2_;
                sVar32 = auVar208._2_2_;
                sVar34 = auVar208._4_2_;
                sVar36 = auVar208._6_2_;
                sVar38 = auVar208._8_2_;
                sVar40 = auVar208._10_2_;
                sVar42 = auVar208._12_2_;
                sVar44 = auVar208._14_2_;
                sVar46 = auVar225._0_2_;
                sVar48 = auVar225._2_2_;
                sVar50 = auVar225._4_2_;
                sVar52 = auVar225._6_2_;
                sVar54 = auVar225._8_2_;
                sVar56 = auVar225._10_2_;
                sVar58 = auVar225._12_2_;
                sVar60 = auVar225._14_2_;
                auVar226._8_8_ =
                     (undefined8)
                     (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11((0 < sVar44) *
                                                                                     (sVar44 < 0x100
                                                                                     ) * auVar208[
                                                  0xe] - (0xff < sVar44),cVar13),
                                                  (0 < sVar42) * (sVar42 < 0x100) * auVar208[0xc] -
                                                  (0xff < sVar42)),
                                                  (0 < sVar41) * (sVar41 < 0x100) * auVar153[0xc] -
                                                  (0xff < sVar41)),
                                                  (0 < sVar40) * (sVar40 < 0x100) * auVar208[10] -
                                                  (0xff < sVar40)),
                                                 (0 < sVar39) * (sVar39 < 0x100) * auVar153[10] -
                                                 (0xff < sVar39)),
                                        (0 < sVar38) * (sVar38 < 0x100) * auVar208[8] -
                                        (0xff < sVar38)),
                               CONCAT11((0 < sVar37) * (sVar37 < 0x100) * auVar153[8] -
                                        (0xff < sVar37),cVar13)) >> 8);
                auVar226[7] = (0 < sVar36) * (sVar36 < 0x100) * auVar208[6] - (0xff < sVar36);
                auVar226[6] = (0 < sVar35) * (sVar35 < 0x100) * auVar153[6] - (0xff < sVar35);
                auVar226[5] = (0 < sVar34) * (sVar34 < 0x100) * auVar208[4] - (0xff < sVar34);
                auVar226[4] = (0 < sVar33) * (sVar33 < 0x100) * auVar153[4] - (0xff < sVar33);
                auVar226[3] = (0 < sVar32) * (sVar32 < 0x100) * auVar208[2] - (0xff < sVar32);
                auVar226[2] = (0 < sVar31) * (sVar31 < 0x100) * auVar153[2] - (0xff < sVar31);
                auVar226[1] = (0 < sVar43) * (sVar43 < 0x100) * auVar208[0] - (0xff < sVar43);
                auVar226[0] = (0 < sVar30) * (sVar30 < 0x100) * auVar153[0] - (0xff < sVar30);
                auVar183[1] = (0 < sVar46) * (sVar46 < 0x100) * auVar225[0] - (0xff < sVar46);
                auVar183[0] = (0 < sVar45) * (sVar45 < 0x100) * auVar207[0] - (0xff < sVar45);
                auVar183[2] = (0 < sVar47) * (sVar47 < 0x100) * auVar207[2] - (0xff < sVar47);
                auVar183[3] = (0 < sVar48) * (sVar48 < 0x100) * auVar225[2] - (0xff < sVar48);
                auVar183[4] = (0 < sVar49) * (sVar49 < 0x100) * auVar207[4] - (0xff < sVar49);
                auVar183[5] = (0 < sVar50) * (sVar50 < 0x100) * auVar225[4] - (0xff < sVar50);
                auVar183[6] = (0 < sVar51) * (sVar51 < 0x100) * auVar207[6] - (0xff < sVar51);
                auVar183[7] = (0 < sVar52) * (sVar52 < 0x100) * auVar225[6] - (0xff < sVar52);
                auVar183[8] = (0 < sVar53) * (sVar53 < 0x100) * auVar207[8] - (0xff < sVar53);
                auVar183[9] = (0 < sVar54) * (sVar54 < 0x100) * auVar225[8] - (0xff < sVar54);
                auVar183[10] = (0 < sVar55) * (sVar55 < 0x100) * auVar207[10] - (0xff < sVar55);
                auVar183[0xb] = (0 < sVar56) * (sVar56 < 0x100) * auVar225[10] - (0xff < sVar56);
                auVar183[0xc] = (0 < sVar57) * (sVar57 < 0x100) * auVar207[0xc] - (0xff < sVar57);
                auVar183[0xd] = (0 < sVar58) * (sVar58 < 0x100) * auVar225[0xc] - (0xff < sVar58);
                auVar183[0xe] = (0 < sVar59) * (sVar59 < 0x100) * auVar207[0xe] - (0xff < sVar59);
                auVar183[0xf] = (0 < sVar60) * (sVar60 < 0x100) * auVar225[0xe] - (0xff < sVar60);
                auVar207 = pmaddubsw(auVar226,auVar154);
                auVar153 = pmaddubsw(auVar183,auVar154);
                auVar207 = paddsw(auVar207,auVar166);
                auVar153 = paddsw(auVar153,auVar166);
                auVar207 = psraw(auVar207,7);
                auVar153 = psraw(auVar153,7);
                sVar30 = auVar207._0_2_;
                sVar43 = auVar207._2_2_;
                sVar31 = auVar207._4_2_;
                sVar32 = auVar207._6_2_;
                sVar33 = auVar207._8_2_;
                sVar34 = auVar207._10_2_;
                sVar35 = auVar207._12_2_;
                sVar36 = auVar207._14_2_;
                sVar37 = auVar153._0_2_;
                sVar38 = auVar153._2_2_;
                sVar39 = auVar153._4_2_;
                sVar40 = auVar153._6_2_;
                sVar41 = auVar153._8_2_;
                sVar42 = auVar153._10_2_;
                sVar44 = auVar153._12_2_;
                sVar45 = auVar153._14_2_;
                puVar117 = puVar115 + lVar129;
                *puVar117 = (0 < sVar30) * (sVar30 < 0x100) * auVar207[0] - (0xff < sVar30);
                puVar117[1] = (0 < sVar43) * (sVar43 < 0x100) * auVar207[2] - (0xff < sVar43);
                puVar117[2] = (0 < sVar31) * (sVar31 < 0x100) * auVar207[4] - (0xff < sVar31);
                puVar117[3] = (0 < sVar32) * (sVar32 < 0x100) * auVar207[6] - (0xff < sVar32);
                puVar117[4] = (0 < sVar33) * (sVar33 < 0x100) * auVar207[8] - (0xff < sVar33);
                puVar117[5] = (0 < sVar34) * (sVar34 < 0x100) * auVar207[10] - (0xff < sVar34);
                puVar117[6] = (0 < sVar35) * (sVar35 < 0x100) * auVar207[0xc] - (0xff < sVar35);
                puVar117[7] = (0 < sVar36) * (sVar36 < 0x100) * auVar207[0xe] - (0xff < sVar36);
                puVar117[8] = (0 < sVar37) * (sVar37 < 0x100) * auVar153[0] - (0xff < sVar37);
                puVar117[9] = (0 < sVar38) * (sVar38 < 0x100) * auVar153[2] - (0xff < sVar38);
                puVar117[10] = (0 < sVar39) * (sVar39 < 0x100) * auVar153[4] - (0xff < sVar39);
                puVar117[0xb] = (0 < sVar40) * (sVar40 < 0x100) * auVar153[6] - (0xff < sVar40);
                puVar117[0xc] = (0 < sVar41) * (sVar41 < 0x100) * auVar153[8] - (0xff < sVar41);
                puVar117[0xd] = (0 < sVar42) * (sVar42 < 0x100) * auVar153[10] - (0xff < sVar42);
                puVar117[0xe] = (0 < sVar44) * (sVar44 < 0x100) * auVar153[0xc] - (0xff < sVar44);
                puVar117[0xf] = (0 < sVar45) * (sVar45 < 0x100) * auVar153[0xe] - (0xff < sVar45);
                lVar129 = lVar129 + 0x10;
                puVar127 = puVar127 + 0x20;
              } while (uVar107 != (uint)lVar129);
              puVar115 = puVar115 + lVar129 + ((long)iVar123 - (long)(int)uVar107);
              iVar140 = iVar140 + -1;
              puVar133 = puVar127;
            } while (iVar140 != 0);
          }
          else {
            __ptr_00 = (undefined1 (*) [16])
                       malloc((uVar114 * 2 + 0xd & 0x3ffffffffffffff8) *
                              (uVar110 + 3 & 0xfffffffffffffffc));
            if (__ptr_00 == (undefined1 (*) [16])0x0) {
              bVar144 = true;
              bVar143 = true;
            }
            else {
              iVar123 = *(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar144 * 4) - 0x28));
              lVar130 = (long)iVar123;
              puVar115 = dst->store_buf_adr[uVar132 - 4];
              iVar108 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar144 * 4) - 0x28));
              lVar111 = (long)iVar108;
              uVar112 = iVar119 + 3U & 0xfffffffc;
              uVar107 = iVar140 * 2 + 0xdU & 0xfffffff8;
              auVar166 = *(undefined1 (*) [16])((long)pIVar113->filter_ptr + local_148);
              auVar153 = pshufb(auVar166,_DAT_0050f310);
              auVar207 = pshufb(auVar166,_DAT_0050f360);
              auVar208 = pshufb(auVar166,_DAT_0050f330);
              auVar166 = pshufb(auVar166,_DAT_0050f370);
              puVar133 = src->store_buf_adr[uVar132 - 4] + (iVar123 * -3 + -5);
              local_2d8._0_8_ = SEXT48((int)(iVar123 * 8 + uVar112 * -2));
              local_2e8._0_8_ = lVar130 * 4;
              lVar129 = (long)(int)(uVar112 * 2);
              local_308._0_8_ = lVar129 * 2;
              local_328._0_8_ = SEXT48((int)(uVar112 * 6));
              pauVar138 = __ptr_00;
              do {
                uVar110 = *(ulong *)(puVar133 + 2);
                uVar150 = *(undefined8 *)(puVar133 + lVar130 + 2);
                auVar246._8_4_ = 0;
                auVar246._0_8_ = uVar110;
                auVar246._12_2_ = (short)(uVar110 >> 0x30);
                auVar246._14_2_ = (short)((ulong)uVar150 >> 0x30);
                auVar245._12_4_ = auVar246._12_4_;
                auVar245._8_2_ = 0;
                auVar245._0_8_ = uVar110;
                auVar245._10_2_ = (short)((ulong)uVar150 >> 0x20);
                auVar244._10_6_ = auVar245._10_6_;
                auVar244._8_2_ = (short)(uVar110 >> 0x20);
                auVar244._0_8_ = uVar110;
                auVar90._4_8_ = auVar244._8_8_;
                auVar90._2_2_ = (short)((ulong)uVar150 >> 0x10);
                auVar90._0_2_ = (short)(uVar110 >> 0x10);
                auVar243._0_4_ = CONCAT22((short)uVar150,(short)uVar110);
                auVar243._4_12_ = auVar90;
                uVar110 = *(ulong *)(puVar133 + lVar130 * 2 + 2);
                uVar150 = *(undefined8 *)(puVar133 + lVar130 * 3 + 2);
                auVar437._8_4_ = 0;
                auVar437._0_8_ = uVar110;
                auVar437._12_2_ = (short)(uVar110 >> 0x30);
                auVar437._14_2_ = (short)((ulong)uVar150 >> 0x30);
                auVar436._12_4_ = auVar437._12_4_;
                auVar436._8_2_ = 0;
                auVar436._0_8_ = uVar110;
                auVar436._10_2_ = (short)((ulong)uVar150 >> 0x20);
                auVar435._10_6_ = auVar436._10_6_;
                auVar435._8_2_ = (short)(uVar110 >> 0x20);
                auVar435._0_8_ = uVar110;
                auVar91._4_8_ = auVar435._8_8_;
                auVar91._2_2_ = (short)((ulong)uVar150 >> 0x10);
                auVar91._0_2_ = (short)(uVar110 >> 0x10);
                auVar708._6_2_ = (short)uVar150;
                auVar708._4_2_ = (short)uVar110;
                lVar128 = lVar130 * 4 + 2;
                uVar110 = *(ulong *)(puVar133 + lVar130 * 4 + 2);
                uVar150 = *(undefined8 *)(puVar133 + lVar130 + lVar128);
                auVar557._8_4_ = 0;
                auVar557._0_8_ = uVar110;
                auVar557._12_2_ = (short)(uVar110 >> 0x30);
                auVar557._14_2_ = (short)((ulong)uVar150 >> 0x30);
                auVar556._12_4_ = auVar557._12_4_;
                auVar556._8_2_ = 0;
                auVar556._0_8_ = uVar110;
                auVar556._10_2_ = (short)((ulong)uVar150 >> 0x20);
                auVar555._10_6_ = auVar556._10_6_;
                auVar555._8_2_ = (short)(uVar110 >> 0x20);
                auVar555._0_8_ = uVar110;
                auVar92._4_8_ = auVar555._8_8_;
                auVar92._2_2_ = (short)((ulong)uVar150 >> 0x10);
                auVar92._0_2_ = (short)(uVar110 >> 0x10);
                auVar554._0_4_ = CONCAT22((short)uVar150,(short)uVar110);
                auVar554._4_12_ = auVar92;
                uVar110 = *(ulong *)(puVar133 + lVar130 * 2 + lVar128);
                uVar150 = *(undefined8 *)(puVar133 + lVar130 * 3 + lVar128);
                auVar665._8_4_ = 0;
                auVar665._0_8_ = uVar110;
                auVar665._12_2_ = (short)(uVar110 >> 0x30);
                auVar665._14_2_ = (short)((ulong)uVar150 >> 0x30);
                auVar664._12_4_ = auVar665._12_4_;
                auVar664._8_2_ = 0;
                auVar664._0_8_ = uVar110;
                auVar664._10_2_ = (short)((ulong)uVar150 >> 0x20);
                auVar663._10_6_ = auVar664._10_6_;
                auVar663._8_2_ = (short)(uVar110 >> 0x20);
                auVar663._0_8_ = uVar110;
                auVar93._4_8_ = auVar663._8_8_;
                auVar93._2_2_ = (short)((ulong)uVar150 >> 0x10);
                auVar93._0_2_ = (short)(uVar110 >> 0x10);
                auVar708._14_2_ = (short)uVar150;
                auVar708._12_2_ = (short)uVar110;
                auVar342._0_8_ = auVar243._0_8_;
                auVar342._8_4_ = auVar90._0_4_;
                auVar342._12_4_ = auVar91._0_4_;
                auVar708._0_4_ = auVar243._0_4_;
                auVar692._0_8_ = auVar554._0_8_;
                auVar692._8_4_ = auVar92._0_4_;
                auVar692._12_4_ = auVar93._0_4_;
                auVar708._8_4_ = auVar554._0_4_;
                auVar247._4_4_ = auVar435._8_4_;
                auVar247._0_4_ = auVar244._8_4_;
                auVar247._12_4_ = auVar663._8_4_;
                auVar247._8_4_ = auVar555._8_4_;
                auVar343._8_8_ = auVar692._8_8_;
                auVar343._0_8_ = auVar342._8_8_;
                lVar128 = 0;
                iVar123 = -uVar112;
                do {
                  uVar110 = *(ulong *)(puVar133 + lVar128 + 8);
                  uVar150 = *(undefined8 *)(puVar133 + lVar130 + lVar128 + 8);
                  lVar139 = lVar130 + lVar128 + 8;
                  auVar441._8_4_ = 0;
                  auVar441._0_8_ = uVar110;
                  auVar441._12_2_ = (short)(uVar110 >> 0x30);
                  auVar441._14_2_ = (short)((ulong)uVar150 >> 0x30);
                  auVar440._12_4_ = auVar441._12_4_;
                  auVar440._8_2_ = 0;
                  auVar440._0_8_ = uVar110;
                  auVar440._10_2_ = (short)((ulong)uVar150 >> 0x20);
                  auVar439._10_6_ = auVar440._10_6_;
                  auVar439._8_2_ = (short)(uVar110 >> 0x20);
                  auVar439._0_8_ = uVar110;
                  auVar94._4_8_ = auVar439._8_8_;
                  auVar94._2_2_ = (short)((ulong)uVar150 >> 0x10);
                  auVar94._0_2_ = (short)(uVar110 >> 0x10);
                  auVar438._0_4_ = CONCAT22((short)uVar150,(short)uVar110);
                  auVar438._4_12_ = auVar94;
                  uVar110 = *(ulong *)(puVar133 + lVar130 + lVar139);
                  lVar139 = lVar130 + lVar139;
                  uVar150 = *(undefined8 *)(puVar133 + lVar130 + lVar139);
                  lVar139 = lVar130 + lVar139;
                  auVar560._8_4_ = 0;
                  auVar560._0_8_ = uVar110;
                  auVar560._12_2_ = (short)(uVar110 >> 0x30);
                  auVar560._14_2_ = (short)((ulong)uVar150 >> 0x30);
                  auVar559._12_4_ = auVar560._12_4_;
                  auVar559._8_2_ = 0;
                  auVar559._0_8_ = uVar110;
                  auVar559._10_2_ = (short)((ulong)uVar150 >> 0x20);
                  auVar558._10_6_ = auVar559._10_6_;
                  auVar558._8_2_ = (short)(uVar110 >> 0x20);
                  auVar558._0_8_ = uVar110;
                  auVar95._4_8_ = auVar558._8_8_;
                  auVar95._2_2_ = (short)((ulong)uVar150 >> 0x10);
                  auVar95._0_2_ = (short)(uVar110 >> 0x10);
                  auVar696._6_2_ = (short)uVar150;
                  auVar696._4_2_ = (short)uVar110;
                  uVar110 = *(ulong *)(puVar133 + lVar130 + lVar139);
                  lVar139 = lVar130 + lVar139;
                  uVar150 = *(undefined8 *)(puVar133 + lVar130 + lVar139);
                  lVar139 = lVar130 + lVar139;
                  auVar669._8_4_ = 0;
                  auVar669._0_8_ = uVar110;
                  auVar669._12_2_ = (short)(uVar110 >> 0x30);
                  auVar669._14_2_ = (short)((ulong)uVar150 >> 0x30);
                  auVar668._12_4_ = auVar669._12_4_;
                  auVar668._8_2_ = 0;
                  auVar668._0_8_ = uVar110;
                  auVar668._10_2_ = (short)((ulong)uVar150 >> 0x20);
                  auVar667._10_6_ = auVar668._10_6_;
                  auVar667._8_2_ = (short)(uVar110 >> 0x20);
                  auVar667._0_8_ = uVar110;
                  auVar96._4_8_ = auVar667._8_8_;
                  auVar96._2_2_ = (short)((ulong)uVar150 >> 0x10);
                  auVar96._0_2_ = (short)(uVar110 >> 0x10);
                  auVar666._0_4_ = CONCAT22((short)uVar150,(short)uVar110);
                  auVar666._4_12_ = auVar96;
                  uVar110 = *(ulong *)(puVar133 + lVar130 + lVar139);
                  uVar150 = *(undefined8 *)(puVar133 + lVar130 * 2 + lVar139);
                  auVar695._8_4_ = 0;
                  auVar695._0_8_ = uVar110;
                  auVar695._12_2_ = (short)(uVar110 >> 0x30);
                  auVar695._14_2_ = (short)((ulong)uVar150 >> 0x30);
                  auVar694._12_4_ = auVar695._12_4_;
                  auVar694._8_2_ = 0;
                  auVar694._0_8_ = uVar110;
                  auVar694._10_2_ = (short)((ulong)uVar150 >> 0x20);
                  auVar693._10_6_ = auVar694._10_6_;
                  auVar693._8_2_ = (short)(uVar110 >> 0x20);
                  auVar693._0_8_ = uVar110;
                  auVar97._4_8_ = auVar693._8_8_;
                  auVar97._2_2_ = (short)((ulong)uVar150 >> 0x10);
                  auVar97._0_2_ = (short)(uVar110 >> 0x10);
                  auVar696._14_2_ = (short)uVar150;
                  auVar696._12_2_ = (short)uVar110;
                  auVar720._0_8_ = auVar438._0_8_;
                  auVar720._8_4_ = auVar94._0_4_;
                  auVar720._12_4_ = auVar95._0_4_;
                  auVar696._0_4_ = auVar438._0_4_;
                  auVar728._0_8_ = auVar666._0_8_;
                  auVar728._8_4_ = auVar96._0_4_;
                  auVar728._12_4_ = auVar97._0_4_;
                  auVar696._8_4_ = auVar666._0_4_;
                  auVar442._0_8_ = CONCAT44(auVar558._8_4_,auVar439._8_4_);
                  auVar442._8_4_ = auVar440._12_4_;
                  auVar442._12_4_ = auVar559._12_4_;
                  auVar670._0_8_ = CONCAT44(auVar693._8_4_,auVar667._8_4_);
                  auVar670._8_4_ = auVar668._12_4_;
                  auVar670._12_4_ = auVar694._12_4_;
                  auVar721._8_8_ = auVar728._8_8_;
                  auVar721._0_8_ = auVar720._8_8_;
                  auVar561._8_8_ = auVar670._0_8_;
                  auVar561._0_8_ = auVar442._0_8_;
                  auVar443._8_8_ = auVar670._8_8_;
                  auVar443._0_8_ = auVar442._8_8_;
                  auVar709 = pmaddubsw(auVar708,auVar153);
                  auVar729 = pmaddubsw(auVar343,auVar207);
                  auVar225 = pmaddubsw(auVar247,auVar208);
                  auVar710 = pmaddubsw(auVar696,auVar166);
                  auVar711._0_2_ = auVar710._0_2_ + auVar729._0_2_;
                  auVar711._2_2_ = auVar710._2_2_ + auVar729._2_2_;
                  auVar711._4_2_ = auVar710._4_2_ + auVar729._4_2_;
                  auVar711._6_2_ = auVar710._6_2_ + auVar729._6_2_;
                  auVar711._8_2_ = auVar710._8_2_ + auVar729._8_2_;
                  auVar711._10_2_ = auVar710._10_2_ + auVar729._10_2_;
                  auVar711._12_2_ = auVar710._12_2_ + auVar729._12_2_;
                  auVar711._14_2_ = auVar710._14_2_ + auVar729._14_2_;
                  auVar671._0_2_ = auVar225._0_2_ + auVar709._0_2_ + 0x40;
                  auVar671._2_2_ = auVar225._2_2_ + auVar709._2_2_ + 0x40;
                  auVar671._4_2_ = auVar225._4_2_ + auVar709._4_2_ + 0x40;
                  auVar671._6_2_ = auVar225._6_2_ + auVar709._6_2_ + 0x40;
                  auVar671._8_2_ = auVar225._8_2_ + auVar709._8_2_ + 0x40;
                  auVar671._10_2_ = auVar225._10_2_ + auVar709._10_2_ + 0x40;
                  auVar671._12_2_ = auVar225._12_2_ + auVar709._12_2_ + 0x40;
                  auVar671._14_2_ = auVar225._14_2_ + auVar709._14_2_ + 0x40;
                  auVar709 = paddsw(auVar671,auVar711);
                  auVar225 = pmaddubsw(auVar343,auVar153);
                  auVar729 = pmaddubsw(auVar247,auVar207);
                  auVar710 = pmaddubsw(auVar721,auVar166);
                  auVar722._0_2_ = auVar710._0_2_ + auVar729._0_2_;
                  auVar722._2_2_ = auVar710._2_2_ + auVar729._2_2_;
                  auVar722._4_2_ = auVar710._4_2_ + auVar729._4_2_;
                  auVar722._6_2_ = auVar710._6_2_ + auVar729._6_2_;
                  auVar722._8_2_ = auVar710._8_2_ + auVar729._8_2_;
                  auVar722._10_2_ = auVar710._10_2_ + auVar729._10_2_;
                  auVar722._12_2_ = auVar710._12_2_ + auVar729._12_2_;
                  auVar722._14_2_ = auVar710._14_2_ + auVar729._14_2_;
                  auVar710 = pmaddubsw(auVar696,auVar208);
                  auVar344._0_2_ = auVar225._0_2_ + 0x40 + auVar710._0_2_;
                  auVar344._2_2_ = auVar225._2_2_ + 0x40 + auVar710._2_2_;
                  auVar344._4_2_ = auVar225._4_2_ + 0x40 + auVar710._4_2_;
                  auVar344._6_2_ = auVar225._6_2_ + 0x40 + auVar710._6_2_;
                  auVar344._8_2_ = auVar225._8_2_ + 0x40 + auVar710._8_2_;
                  auVar344._10_2_ = auVar225._10_2_ + 0x40 + auVar710._10_2_;
                  auVar344._12_2_ = auVar225._12_2_ + 0x40 + auVar710._12_2_;
                  auVar344._14_2_ = auVar225._14_2_ + 0x40 + auVar710._14_2_;
                  auVar225 = paddsw(auVar344,auVar722);
                  auVar710 = pmaddubsw(auVar696,auVar207);
                  auVar729 = pmaddubsw(auVar561,auVar166);
                  auVar730._0_2_ = auVar729._0_2_ + auVar710._0_2_;
                  auVar730._2_2_ = auVar729._2_2_ + auVar710._2_2_;
                  auVar730._4_2_ = auVar729._4_2_ + auVar710._4_2_;
                  auVar730._6_2_ = auVar729._6_2_ + auVar710._6_2_;
                  auVar730._8_2_ = auVar729._8_2_ + auVar710._8_2_;
                  auVar730._10_2_ = auVar729._10_2_ + auVar710._10_2_;
                  auVar730._12_2_ = auVar729._12_2_ + auVar710._12_2_;
                  auVar730._14_2_ = auVar729._14_2_ + auVar710._14_2_;
                  auVar710 = psraw(auVar709,7);
                  auVar709 = psraw(auVar225,7);
                  auVar225 = pmaddubsw(auVar247,auVar153);
                  auVar729 = pmaddubsw(auVar721,auVar208);
                  auVar248._0_2_ = auVar225._0_2_ + 0x40 + auVar729._0_2_;
                  auVar248._2_2_ = auVar225._2_2_ + 0x40 + auVar729._2_2_;
                  auVar248._4_2_ = auVar225._4_2_ + 0x40 + auVar729._4_2_;
                  auVar248._6_2_ = auVar225._6_2_ + 0x40 + auVar729._6_2_;
                  auVar248._8_2_ = auVar225._8_2_ + 0x40 + auVar729._8_2_;
                  auVar248._10_2_ = auVar225._10_2_ + 0x40 + auVar729._10_2_;
                  auVar248._12_2_ = auVar225._12_2_ + 0x40 + auVar729._12_2_;
                  auVar248._14_2_ = auVar225._14_2_ + 0x40 + auVar729._14_2_;
                  auVar225 = paddsw(auVar248,auVar730);
                  auVar225 = psraw(auVar225,7);
                  sVar30 = auVar710._0_2_;
                  sVar43 = auVar710._2_2_;
                  uVar177 = CONCAT11((0 < sVar43) * (sVar43 < 0x100) * auVar710[2] - (0xff < sVar43)
                                     ,(0 < sVar30) * (sVar30 < 0x100) * auVar710[0] -
                                      (0xff < sVar30));
                  sVar30 = auVar710._4_2_;
                  sVar43 = auVar710._6_2_;
                  uVar179 = CONCAT13((0 < sVar43) * (sVar43 < 0x100) * auVar710[6] - (0xff < sVar43)
                                     ,CONCAT12((0 < sVar30) * (sVar30 < 0x100) * auVar710[4] -
                                               (0xff < sVar30),uVar177));
                  sVar30 = auVar710._8_2_;
                  sVar43 = auVar710._10_2_;
                  uVar180 = CONCAT15((0 < sVar43) * (sVar43 < 0x100) * auVar710[10] -
                                     (0xff < sVar43),
                                     CONCAT14((0 < sVar30) * (sVar30 < 0x100) * auVar710[8] -
                                              (0xff < sVar30),uVar179));
                  sVar30 = auVar710._12_2_;
                  sVar43 = auVar710._14_2_;
                  uVar151 = CONCAT17((0 < sVar43) * (sVar43 < 0x100) * auVar710[0xe] -
                                     (0xff < sVar43),
                                     CONCAT16((0 < sVar30) * (sVar30 < 0x100) * auVar710[0xc] -
                                              (0xff < sVar30),uVar180));
                  sVar30 = auVar225._0_2_;
                  sVar43 = auVar225._2_2_;
                  auVar658._0_10_ =
                       CONCAT19((0 < sVar43) * (sVar43 < 0x100) * auVar225[2] - (0xff < sVar43),
                                CONCAT18((0 < sVar30) * (sVar30 < 0x100) * auVar225[0] -
                                         (0xff < sVar30),uVar151));
                  sVar30 = auVar225._4_2_;
                  auVar658[10] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[4] - (0xff < sVar30);
                  sVar30 = auVar225._6_2_;
                  auVar658[0xb] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[6] - (0xff < sVar30);
                  sVar30 = auVar225._8_2_;
                  auVar660[0xc] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[8] - (0xff < sVar30);
                  auVar660._0_12_ = auVar658;
                  sVar30 = auVar225._10_2_;
                  auVar660[0xd] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[10] - (0xff < sVar30);
                  sVar30 = auVar225._12_2_;
                  auVar672[0xe] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[0xc] - (0xff < sVar30);
                  auVar672._0_14_ = auVar660;
                  sVar30 = auVar225._14_2_;
                  auVar672[0xf] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[0xe] - (0xff < sVar30);
                  auVar710 = pmaddubsw(auVar696,auVar153);
                  auVar732 = pmaddubsw(auVar721,auVar207);
                  auVar729 = pmaddubsw(auVar561,auVar208);
                  auVar225 = pmaddubsw(auVar443,auVar166);
                  auVar444._0_2_ = auVar225._0_2_ + auVar732._0_2_;
                  auVar444._2_2_ = auVar225._2_2_ + auVar732._2_2_;
                  auVar444._4_2_ = auVar225._4_2_ + auVar732._4_2_;
                  auVar444._6_2_ = auVar225._6_2_ + auVar732._6_2_;
                  auVar444._8_2_ = auVar225._8_2_ + auVar732._8_2_;
                  auVar444._10_2_ = auVar225._10_2_ + auVar732._10_2_;
                  auVar444._12_2_ = auVar225._12_2_ + auVar732._12_2_;
                  auVar444._14_2_ = auVar225._14_2_ + auVar732._14_2_;
                  auVar723._0_2_ = auVar729._0_2_ + auVar710._0_2_ + 0x40;
                  auVar723._2_2_ = auVar729._2_2_ + auVar710._2_2_ + 0x40;
                  auVar723._4_2_ = auVar729._4_2_ + auVar710._4_2_ + 0x40;
                  auVar723._6_2_ = auVar729._6_2_ + auVar710._6_2_ + 0x40;
                  auVar723._8_2_ = auVar729._8_2_ + auVar710._8_2_ + 0x40;
                  auVar723._10_2_ = auVar729._10_2_ + auVar710._10_2_ + 0x40;
                  auVar723._12_2_ = auVar729._12_2_ + auVar710._12_2_ + 0x40;
                  auVar723._14_2_ = auVar729._14_2_ + auVar710._14_2_ + 0x40;
                  auVar225 = paddsw(auVar723,auVar444);
                  auVar225 = psraw(auVar225,7);
                  sVar30 = auVar709._0_2_;
                  sVar43 = auVar709._2_2_;
                  uVar145 = CONCAT11((0 < sVar43) * (sVar43 < 0x100) * auVar709[2] - (0xff < sVar43)
                                     ,(0 < sVar30) * (sVar30 < 0x100) * auVar709[0] -
                                      (0xff < sVar30));
                  sVar30 = auVar709._4_2_;
                  sVar43 = auVar709._6_2_;
                  uVar148 = CONCAT13((0 < sVar43) * (sVar43 < 0x100) * auVar709[6] - (0xff < sVar43)
                                     ,CONCAT12((0 < sVar30) * (sVar30 < 0x100) * auVar709[4] -
                                               (0xff < sVar30),uVar145));
                  sVar30 = auVar709._8_2_;
                  sVar43 = auVar709._10_2_;
                  uVar149 = CONCAT15((0 < sVar43) * (sVar43 < 0x100) * auVar709[10] -
                                     (0xff < sVar43),
                                     CONCAT14((0 < sVar30) * (sVar30 < 0x100) * auVar709[8] -
                                              (0xff < sVar30),uVar148));
                  sVar30 = auVar709._12_2_;
                  sVar43 = auVar709._14_2_;
                  uVar150 = CONCAT17((0 < sVar43) * (sVar43 < 0x100) * auVar709[0xe] -
                                     (0xff < sVar43),
                                     CONCAT16((0 < sVar30) * (sVar30 < 0x100) * auVar709[0xc] -
                                              (0xff < sVar30),uVar149));
                  sVar30 = auVar225._0_2_;
                  sVar43 = auVar225._2_2_;
                  auVar338._0_10_ =
                       CONCAT19((0 < sVar43) * (sVar43 < 0x100) * auVar225[2] - (0xff < sVar43),
                                CONCAT18((0 < sVar30) * (sVar30 < 0x100) * auVar225[0] -
                                         (0xff < sVar30),uVar150));
                  sVar30 = auVar225._4_2_;
                  auVar338[10] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[4] - (0xff < sVar30);
                  sVar30 = auVar225._6_2_;
                  auVar338[0xb] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[6] - (0xff < sVar30);
                  sVar30 = auVar225._8_2_;
                  auVar339[0xc] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[8] - (0xff < sVar30);
                  auVar339._0_12_ = auVar338;
                  sVar30 = auVar225._10_2_;
                  auVar339[0xd] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[10] - (0xff < sVar30);
                  sVar30 = auVar225._12_2_;
                  auVar345[0xe] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[0xc] - (0xff < sVar30);
                  auVar345._0_14_ = auVar339;
                  sVar30 = auVar225._14_2_;
                  auVar345[0xf] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[0xe] - (0xff < sVar30);
                  auVar449._12_2_ = (short)((ulong)uVar151 >> 0x30);
                  auVar449._0_12_ = auVar658;
                  auVar449._14_2_ = (short)((ulong)uVar150 >> 0x30);
                  auVar448._12_4_ = auVar449._12_4_;
                  auVar448._10_2_ = (short)((uint6)uVar149 >> 0x20);
                  auVar448._0_10_ = auVar658._0_10_;
                  auVar447._10_6_ = auVar448._10_6_;
                  auVar447._8_2_ = (short)((uint6)uVar180 >> 0x20);
                  auVar447._0_8_ = uVar151;
                  auVar446._8_8_ = auVar447._8_8_;
                  auVar446._6_2_ = (short)((uint)uVar148 >> 0x10);
                  auVar446._0_6_ = uVar180;
                  auVar445._6_10_ = auVar446._6_10_;
                  auVar445._4_2_ = (short)((uint)uVar179 >> 0x10);
                  auVar445._0_4_ = uVar179;
                  uVar148 = CONCAT22((short)((unkuint10)auVar338._0_10_ >> 0x40),
                                     (short)((unkuint10)auVar658._0_10_ >> 0x40));
                  auVar659._0_8_ = CONCAT26(auVar338._10_2_,CONCAT24(auVar658._10_2_,uVar148));
                  auVar659._8_2_ = auVar660._12_2_;
                  auVar659._10_2_ = auVar339._12_2_;
                  auVar673._12_2_ = auVar672._14_2_;
                  auVar673._0_12_ = auVar659;
                  auVar673._14_2_ = auVar345._14_2_;
                  *(ulong *)(*pauVar138 + lVar128) = CONCAT44(uVar148,CONCAT22(uVar145,uVar177));
                  *(ulong *)(*pauVar138 + lVar128 + lVar129) =
                       CONCAT44((int)((ulong)auVar659._0_8_ >> 0x20),auVar445._4_4_);
                  *(ulong *)(*pauVar138 + lVar128 + lVar129 * 2) =
                       CONCAT44(auVar659._8_4_,auVar447._8_4_);
                  *(ulong *)(*pauVar138 + lVar128 + lVar129 * 3) =
                       CONCAT44(auVar673._12_4_,auVar448._12_4_);
                  lVar128 = lVar128 + 8;
                  iVar123 = iVar123 + 4;
                  auVar247 = auVar443;
                  auVar343 = auVar561;
                  auVar708 = auVar721;
                } while (iVar123 != 0);
                puVar133 = puVar133 + lVar128 + local_2d8._0_8_;
                pauVar138 = (undefined1 (*) [16])(*pauVar138 + lVar128 + local_328._0_8_);
                uVar107 = uVar107 - 8;
              } while (uVar107 != 0);
              uVar118 = iVar119 + 7U & 0xfffffff8;
              uVar107 = iVar140 + 3U & 0xfffffffc;
              pauVar138 = __ptr_00;
              do {
                pauVar122 = (undefined1 (*) [16])(*pauVar138 + local_328._0_8_);
                auVar225 = *(undefined1 (*) [16])(*pauVar138 + lVar129);
                auVar709 = *(undefined1 (*) [16])(*pauVar138 + (long)(int)uVar112 * 4);
                auVar710 = *pauVar138;
                iVar123 = -uVar107;
                do {
                  auVar729 = *pauVar122;
                  auVar732 = *(undefined1 (*) [16])(*pauVar122 + lVar129);
                  auVar719 = *(undefined1 (*) [16])(*pauVar122 + lVar129 * 2);
                  auVar712 = pmaddubsw(auVar710,auVar153);
                  auVar724 = pmaddubsw(auVar225,auVar207);
                  auVar710 = pmaddubsw(auVar709,auVar208);
                  auVar713 = pmaddubsw(auVar729,auVar166);
                  auVar714._0_2_ = auVar713._0_2_ + auVar724._0_2_;
                  auVar714._2_2_ = auVar713._2_2_ + auVar724._2_2_;
                  auVar714._4_2_ = auVar713._4_2_ + auVar724._4_2_;
                  auVar714._6_2_ = auVar713._6_2_ + auVar724._6_2_;
                  auVar714._8_2_ = auVar713._8_2_ + auVar724._8_2_;
                  auVar714._10_2_ = auVar713._10_2_ + auVar724._10_2_;
                  auVar714._12_2_ = auVar713._12_2_ + auVar724._12_2_;
                  auVar714._14_2_ = auVar713._14_2_ + auVar724._14_2_;
                  auVar674._0_2_ = auVar710._0_2_ + auVar712._0_2_ + 0x40;
                  auVar674._2_2_ = auVar710._2_2_ + auVar712._2_2_ + 0x40;
                  auVar674._4_2_ = auVar710._4_2_ + auVar712._4_2_ + 0x40;
                  auVar674._6_2_ = auVar710._6_2_ + auVar712._6_2_ + 0x40;
                  auVar674._8_2_ = auVar710._8_2_ + auVar712._8_2_ + 0x40;
                  auVar674._10_2_ = auVar710._10_2_ + auVar712._10_2_ + 0x40;
                  auVar674._12_2_ = auVar710._12_2_ + auVar712._12_2_ + 0x40;
                  auVar674._14_2_ = auVar710._14_2_ + auVar712._14_2_ + 0x40;
                  auVar712 = paddsw(auVar674,auVar714);
                  auVar225 = pmaddubsw(auVar225,auVar153);
                  auVar713 = pmaddubsw(auVar709,auVar207);
                  auVar710 = pmaddubsw(auVar732,auVar166);
                  auVar697._0_2_ = auVar710._0_2_ + auVar713._0_2_;
                  auVar697._2_2_ = auVar710._2_2_ + auVar713._2_2_;
                  auVar697._4_2_ = auVar710._4_2_ + auVar713._4_2_;
                  auVar697._6_2_ = auVar710._6_2_ + auVar713._6_2_;
                  auVar697._8_2_ = auVar710._8_2_ + auVar713._8_2_;
                  auVar697._10_2_ = auVar710._10_2_ + auVar713._10_2_;
                  auVar697._12_2_ = auVar710._12_2_ + auVar713._12_2_;
                  auVar697._14_2_ = auVar710._14_2_ + auVar713._14_2_;
                  auVar710 = pmaddubsw(auVar729,auVar208);
                  auVar249._0_2_ = auVar225._0_2_ + 0x40 + auVar710._0_2_;
                  auVar249._2_2_ = auVar225._2_2_ + 0x40 + auVar710._2_2_;
                  auVar249._4_2_ = auVar225._4_2_ + 0x40 + auVar710._4_2_;
                  auVar249._6_2_ = auVar225._6_2_ + 0x40 + auVar710._6_2_;
                  auVar249._8_2_ = auVar225._8_2_ + 0x40 + auVar710._8_2_;
                  auVar249._10_2_ = auVar225._10_2_ + 0x40 + auVar710._10_2_;
                  auVar249._12_2_ = auVar225._12_2_ + 0x40 + auVar710._12_2_;
                  auVar249._14_2_ = auVar225._14_2_ + 0x40 + auVar710._14_2_;
                  auVar710 = *(undefined1 (*) [16])(*pauVar122 + lVar129 * 3);
                  pauVar122 = (undefined1 (*) [16])(*pauVar122 + (int)(uVar112 << 3));
                  auVar712 = psraw(auVar712,7);
                  sVar30 = auVar712._0_2_;
                  sVar31 = auVar712._2_2_;
                  sVar33 = auVar712._4_2_;
                  sVar35 = auVar712._6_2_;
                  sVar37 = auVar712._8_2_;
                  sVar39 = auVar712._10_2_;
                  sVar41 = auVar712._12_2_;
                  sVar44 = auVar712._14_2_;
                  auVar225 = paddsw(auVar249,auVar697);
                  auVar225 = psraw(auVar225,7);
                  sVar43 = auVar225._0_2_;
                  sVar32 = auVar225._2_2_;
                  sVar34 = auVar225._4_2_;
                  sVar36 = auVar225._6_2_;
                  sVar38 = auVar225._8_2_;
                  sVar40 = auVar225._10_2_;
                  sVar42 = auVar225._12_2_;
                  sVar45 = auVar225._14_2_;
                  auVar709 = pmaddubsw(auVar709,auVar153);
                  auVar713 = pmaddubsw(auVar729,auVar207);
                  auVar724 = pmaddubsw(auVar732,auVar208);
                  *(ulong *)puVar115 =
                       CONCAT17((0 < sVar44) * (sVar44 < 0x100) * auVar712[0xe] - (0xff < sVar44),
                                CONCAT16((0 < sVar41) * (sVar41 < 0x100) * auVar712[0xc] -
                                         (0xff < sVar41),
                                         CONCAT15((0 < sVar39) * (sVar39 < 0x100) * auVar712[10] -
                                                  (0xff < sVar39),
                                                  CONCAT14((0 < sVar37) * (sVar37 < 0x100) *
                                                           auVar712[8] - (0xff < sVar37),
                                                           CONCAT13((0 < sVar35) * (sVar35 < 0x100)
                                                                    * auVar712[6] - (0xff < sVar35),
                                                                    CONCAT12((0 < sVar33) *
                                                                             (sVar33 < 0x100) *
                                                                             auVar712[4] -
                                                                             (0xff < sVar33),
                                                                             CONCAT11((0 < sVar31) *
                                                                                      (sVar31 < 
                                                  0x100) * auVar712[2] - (0xff < sVar31),
                                                  (0 < sVar30) * (sVar30 < 0x100) * auVar712[0] -
                                                  (0xff < sVar30))))))));
                  *(ulong *)(puVar115 + lVar111) =
                       CONCAT17((0 < sVar45) * (sVar45 < 0x100) * auVar225[0xe] - (0xff < sVar45),
                                CONCAT16((0 < sVar42) * (sVar42 < 0x100) * auVar225[0xc] -
                                         (0xff < sVar42),
                                         CONCAT15((0 < sVar40) * (sVar40 < 0x100) * auVar225[10] -
                                                  (0xff < sVar40),
                                                  CONCAT14((0 < sVar38) * (sVar38 < 0x100) *
                                                           auVar225[8] - (0xff < sVar38),
                                                           CONCAT13((0 < sVar36) * (sVar36 < 0x100)
                                                                    * auVar225[6] - (0xff < sVar36),
                                                                    CONCAT12((0 < sVar34) *
                                                                             (sVar34 < 0x100) *
                                                                             auVar225[4] -
                                                                             (0xff < sVar34),
                                                                             CONCAT11((0 < sVar32) *
                                                                                      (sVar32 < 
                                                  0x100) * auVar225[2] - (0xff < sVar32),
                                                  (0 < sVar43) * (sVar43 < 0x100) * auVar225[0] -
                                                  (0xff < sVar43))))))));
                  auVar225 = pmaddubsw(auVar719,auVar166);
                  auVar562._0_2_ = auVar225._0_2_ + auVar713._0_2_;
                  auVar562._2_2_ = auVar225._2_2_ + auVar713._2_2_;
                  auVar562._4_2_ = auVar225._4_2_ + auVar713._4_2_;
                  auVar562._6_2_ = auVar225._6_2_ + auVar713._6_2_;
                  auVar562._8_2_ = auVar225._8_2_ + auVar713._8_2_;
                  auVar562._10_2_ = auVar225._10_2_ + auVar713._10_2_;
                  auVar562._12_2_ = auVar225._12_2_ + auVar713._12_2_;
                  auVar562._14_2_ = auVar225._14_2_ + auVar713._14_2_;
                  auVar346._0_2_ = auVar709._0_2_ + 0x40 + auVar724._0_2_;
                  auVar346._2_2_ = auVar709._2_2_ + 0x40 + auVar724._2_2_;
                  auVar346._4_2_ = auVar709._4_2_ + 0x40 + auVar724._4_2_;
                  auVar346._6_2_ = auVar709._6_2_ + 0x40 + auVar724._6_2_;
                  auVar346._8_2_ = auVar709._8_2_ + 0x40 + auVar724._8_2_;
                  auVar346._10_2_ = auVar709._10_2_ + 0x40 + auVar724._10_2_;
                  auVar346._12_2_ = auVar709._12_2_ + 0x40 + auVar724._12_2_;
                  auVar346._14_2_ = auVar709._14_2_ + 0x40 + auVar724._14_2_;
                  auVar225 = paddsw(auVar346,auVar562);
                  auVar225 = psraw(auVar225,7);
                  sVar30 = auVar225._0_2_;
                  sVar43 = auVar225._2_2_;
                  sVar31 = auVar225._4_2_;
                  sVar32 = auVar225._6_2_;
                  sVar33 = auVar225._8_2_;
                  sVar34 = auVar225._10_2_;
                  sVar35 = auVar225._12_2_;
                  sVar36 = auVar225._14_2_;
                  auVar709 = pmaddubsw(auVar729,auVar153);
                  auVar712 = pmaddubsw(auVar732,auVar207);
                  auVar729 = pmaddubsw(auVar719,auVar208);
                  *(ulong *)(puVar115 + lVar111 * 2) =
                       CONCAT17((0 < sVar36) * (sVar36 < 0x100) * auVar225[0xe] - (0xff < sVar36),
                                CONCAT16((0 < sVar35) * (sVar35 < 0x100) * auVar225[0xc] -
                                         (0xff < sVar35),
                                         CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar225[10] -
                                                  (0xff < sVar34),
                                                  CONCAT14((0 < sVar33) * (sVar33 < 0x100) *
                                                           auVar225[8] - (0xff < sVar33),
                                                           CONCAT13((0 < sVar32) * (sVar32 < 0x100)
                                                                    * auVar225[6] - (0xff < sVar32),
                                                                    CONCAT12((0 < sVar31) *
                                                                             (sVar31 < 0x100) *
                                                                             auVar225[4] -
                                                                             (0xff < sVar31),
                                                                             CONCAT11((0 < sVar43) *
                                                                                      (sVar43 < 
                                                  0x100) * auVar225[2] - (0xff < sVar43),
                                                  (0 < sVar30) * (sVar30 < 0x100) * auVar225[0] -
                                                  (0xff < sVar30))))))));
                  auVar225 = pmaddubsw(auVar710,auVar166);
                  auVar731._0_2_ = auVar225._0_2_ + auVar712._0_2_;
                  auVar731._2_2_ = auVar225._2_2_ + auVar712._2_2_;
                  auVar731._4_2_ = auVar225._4_2_ + auVar712._4_2_;
                  auVar731._6_2_ = auVar225._6_2_ + auVar712._6_2_;
                  auVar731._8_2_ = auVar225._8_2_ + auVar712._8_2_;
                  auVar731._10_2_ = auVar225._10_2_ + auVar712._10_2_;
                  auVar731._12_2_ = auVar225._12_2_ + auVar712._12_2_;
                  auVar731._14_2_ = auVar225._14_2_ + auVar712._14_2_;
                  auVar675._0_2_ = auVar729._0_2_ + auVar709._0_2_ + 0x40;
                  auVar675._2_2_ = auVar729._2_2_ + auVar709._2_2_ + 0x40;
                  auVar675._4_2_ = auVar729._4_2_ + auVar709._4_2_ + 0x40;
                  auVar675._6_2_ = auVar729._6_2_ + auVar709._6_2_ + 0x40;
                  auVar675._8_2_ = auVar729._8_2_ + auVar709._8_2_ + 0x40;
                  auVar675._10_2_ = auVar729._10_2_ + auVar709._10_2_ + 0x40;
                  auVar675._12_2_ = auVar729._12_2_ + auVar709._12_2_ + 0x40;
                  auVar675._14_2_ = auVar729._14_2_ + auVar709._14_2_ + 0x40;
                  auVar225 = paddsw(auVar675,auVar731);
                  auVar225 = psraw(auVar225,7);
                  sVar30 = auVar225._0_2_;
                  sVar43 = auVar225._2_2_;
                  sVar31 = auVar225._4_2_;
                  sVar32 = auVar225._6_2_;
                  sVar33 = auVar225._8_2_;
                  sVar34 = auVar225._10_2_;
                  sVar35 = auVar225._12_2_;
                  sVar36 = auVar225._14_2_;
                  *(ulong *)(puVar115 + lVar111 * 3) =
                       CONCAT17((0 < sVar36) * (sVar36 < 0x100) * auVar225[0xe] - (0xff < sVar36),
                                CONCAT16((0 < sVar35) * (sVar35 < 0x100) * auVar225[0xc] -
                                         (0xff < sVar35),
                                         CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar225[10] -
                                                  (0xff < sVar34),
                                                  CONCAT14((0 < sVar33) * (sVar33 < 0x100) *
                                                           auVar225[8] - (0xff < sVar33),
                                                           CONCAT13((0 < sVar32) * (sVar32 < 0x100)
                                                                    * auVar225[6] - (0xff < sVar32),
                                                                    CONCAT12((0 < sVar31) *
                                                                             (sVar31 < 0x100) *
                                                                             auVar225[4] -
                                                                             (0xff < sVar31),
                                                                             CONCAT11((0 < sVar43) *
                                                                                      (sVar43 < 
                                                  0x100) * auVar225[2] - (0xff < sVar43),
                                                  (0 < sVar30) * (sVar30 < 0x100) * auVar225[0] -
                                                  (0xff < sVar30))))))));
                  puVar115 = puVar115 + lVar111 * 4;
                  iVar123 = iVar123 + 4;
                  auVar225 = auVar719;
                  auVar709 = auVar710;
                  auVar710 = auVar732;
                } while (iVar123 != 0);
                pauVar138 = (undefined1 (*) [16])
                            ((long)pauVar122 +
                            (0x10 - (long)(int)((iVar140 * 2 + 6U | 6) * uVar112)));
                puVar115 = puVar115 + (8 - (long)(int)(iVar108 * uVar107));
                uVar118 = uVar118 - 8;
              } while (uVar118 != 0);
              free(__ptr_00);
              bVar144 = false;
            }
LAB_003e8648:
            auVar166 = _DAT_0050f2b0;
            if (__ptr_00 == (undefined1 (*) [16])0x0) goto LAB_003e8651;
          }
LAB_003e864f:
          bVar144 = false;
        }
        else {
          uVar107 = iVar140 * 4;
          iVar108 = (int)uVar110;
          local_278._8_8_ = auVar153._8_8_;
          if ((iVar119 * 4 == iVar123) && (uVar107 == local_278._0_4_)) {
            if (phase == 0) {
              puVar115 = src->store_buf_adr[uVar132 - 4];
              iVar123 = *(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar144 * 4) - 0x28));
              puVar133 = dst->store_buf_adr[uVar132 - 4];
              iVar108 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar144 * 4) - 0x28));
              uVar107 = iVar119 + 0xfU & 0xfffffff0;
              do {
                lVar129 = 0;
                lVar111 = (long)(int)uVar107 * 4 + (long)iVar123 * -4;
                do {
                  puVar3 = (ushort *)(puVar115 + lVar129 * 4);
                  puVar6 = (ushort *)(puVar115 + lVar129 * 4 + 0x10);
                  puVar7 = (ushort *)(puVar115 + lVar129 * 4 + 0x20);
                  puVar8 = (ushort *)(puVar115 + lVar129 * 4 + 0x30);
                  uVar147 = *puVar3 & 0xff;
                  uVar169 = puVar3[2] & 0xff;
                  uVar172 = puVar3[4] & 0xff;
                  uVar175 = puVar3[6] & 0xff;
                  uVar223 = *puVar6 & 0xff;
                  uVar238 = puVar6[2] & 0xff;
                  uVar239 = puVar6[4] & 0xff;
                  uVar240 = puVar6[6] & 0xff;
                  bVar14 = (uVar147 != 0) * (uVar147 < 0x100) * (char)*puVar3 - (0xff < uVar147);
                  bVar15 = (uVar169 != 0) * (uVar169 < 0x100) * (char)puVar3[2] - (0xff < uVar169);
                  bVar16 = (uVar172 != 0) * (uVar172 < 0x100) * (char)puVar3[4] - (0xff < uVar172);
                  bVar17 = (uVar175 != 0) * (uVar175 < 0x100) * (char)puVar3[6] - (0xff < uVar175);
                  bVar18 = (uVar223 != 0) * (uVar223 < 0x100) * (char)*puVar6 - (0xff < uVar223);
                  bVar19 = (uVar238 != 0) * (uVar238 < 0x100) * (char)puVar6[2] - (0xff < uVar238);
                  bVar20 = (uVar239 != 0) * (uVar239 < 0x100) * (char)puVar6[4] - (0xff < uVar239);
                  bVar21 = (uVar240 != 0) * (uVar240 < 0x100) * (char)puVar6[6] - (0xff < uVar240);
                  uVar147 = *puVar7 & 0xff;
                  uVar169 = puVar7[2] & 0xff;
                  uVar172 = puVar7[4] & 0xff;
                  uVar175 = puVar7[6] & 0xff;
                  uVar223 = *puVar8 & 0xff;
                  uVar238 = puVar8[2] & 0xff;
                  uVar239 = puVar8[4] & 0xff;
                  uVar240 = puVar8[6] & 0xff;
                  bVar22 = (uVar147 != 0) * (uVar147 < 0x100) * (char)*puVar7 - (0xff < uVar147);
                  bVar23 = (uVar169 != 0) * (uVar169 < 0x100) * (char)puVar7[2] - (0xff < uVar169);
                  bVar24 = (uVar172 != 0) * (uVar172 < 0x100) * (char)puVar7[4] - (0xff < uVar172);
                  bVar25 = (uVar175 != 0) * (uVar175 < 0x100) * (char)puVar7[6] - (0xff < uVar175);
                  bVar26 = (uVar223 != 0) * (uVar223 < 0x100) * (char)*puVar8 - (0xff < uVar223);
                  bVar27 = (uVar238 != 0) * (uVar238 < 0x100) * (char)puVar8[2] - (0xff < uVar238);
                  bVar28 = (uVar239 != 0) * (uVar239 < 0x100) * (char)puVar8[4] - (0xff < uVar239);
                  bVar29 = (uVar240 != 0) * (uVar240 < 0x100) * (char)puVar8[6] - (0xff < uVar240);
                  puVar127 = puVar133 + lVar129;
                  *puVar127 = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
                  puVar127[1] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
                  puVar127[2] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
                  puVar127[3] = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
                  puVar127[4] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
                  puVar127[5] = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
                  puVar127[6] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
                  puVar127[7] = (bVar21 != 0) * (bVar21 < 0x100) * bVar21 - (0xff < bVar21);
                  puVar127[8] = (bVar22 != 0) * (bVar22 < 0x100) * bVar22 - (0xff < bVar22);
                  puVar127[9] = (bVar23 != 0) * (bVar23 < 0x100) * bVar23 - (0xff < bVar23);
                  puVar127[10] = (bVar24 != 0) * (bVar24 < 0x100) * bVar24 - (0xff < bVar24);
                  puVar127[0xb] = (bVar25 != 0) * (bVar25 < 0x100) * bVar25 - (0xff < bVar25);
                  puVar127[0xc] = (bVar26 != 0) * (bVar26 < 0x100) * bVar26 - (0xff < bVar26);
                  puVar127[0xd] = (bVar27 != 0) * (bVar27 < 0x100) * bVar27 - (0xff < bVar27);
                  puVar127[0xe] = (bVar28 != 0) * (bVar28 < 0x100) * bVar28 - (0xff < bVar28);
                  puVar127[0xf] = (bVar29 != 0) * (bVar29 < 0x100) * bVar29 - (0xff < bVar29);
                  lVar129 = lVar129 + 0x10;
                  lVar111 = lVar111 + -0x40;
                } while (uVar107 != (uint)lVar129);
                puVar115 = puVar115 + -lVar111;
                puVar133 = puVar133 + lVar129 + ((long)iVar108 - (long)(int)uVar107);
                iVar140 = iVar140 + -1;
              } while (iVar140 != 0);
            }
            else {
              if (filter != BILINEAR) {
                __ptr_00 = (undefined1 (*) [16])
                           malloc((long)(int)((((int)uVar120 << 2 | 6U) + 7 & 0xfffffff8) * iVar108
                                             + 0x10));
                if (__ptr_00 == (undefined1 (*) [16])0x0) {
                  bVar144 = true;
                  bVar143 = true;
                }
                else {
                  iVar123 = *(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar144 * 4) - 0x28))
                  ;
                  lVar129 = (long)iVar123;
                  puVar115 = dst->store_buf_adr[uVar132 - 4];
                  iVar108 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar144 * 4) - 0x28))
                  ;
                  uVar112 = iVar119 + 1U & 0xfffffffe;
                  local_328._0_4_ = uVar107 + 0xd & 0xfffffff8;
                  auVar166 = *(undefined1 (*) [16])((long)pIVar113->filter_ptr + local_148);
                  auVar153 = pshufb(auVar166,_DAT_0050f310);
                  auVar207 = pshufb(auVar166,_DAT_0050f360);
                  auVar208 = pshufb(auVar166,_DAT_0050f330);
                  auVar166 = pshufb(auVar166,_DAT_0050f370);
                  puVar133 = src->store_buf_adr[uVar132 - 4] + (iVar123 * -3 + -7);
                  local_2d8._0_8_ = lVar129 * 3;
                  local_2e8._0_8_ = lVar129 * 4;
                  lVar111 = (long)(int)(uVar112 * 2);
                  local_308._0_8_ = lVar111 * 2;
                  local_278._0_8_ = SEXT48((int)(uVar112 * 4));
                  pauVar138 = __ptr_00;
                  do {
                    uVar110 = *(ulong *)(puVar133 + 4);
                    uVar150 = *(undefined8 *)(puVar133 + lVar129 + 4);
                    auVar724._8_4_ = 0;
                    auVar724._0_8_ = uVar110;
                    auVar724._12_2_ = (short)(uVar110 >> 0x30);
                    auVar724._14_2_ = (short)((ulong)uVar150 >> 0x30);
                    auVar429._12_4_ = auVar724._12_4_;
                    auVar429._8_2_ = 0;
                    auVar429._0_8_ = uVar110;
                    auVar429._10_2_ = (short)((ulong)uVar150 >> 0x20);
                    auVar428._10_6_ = auVar429._10_6_;
                    auVar428._8_2_ = (short)(uVar110 >> 0x20);
                    auVar428._0_8_ = uVar110;
                    auVar98._4_8_ = auVar428._8_8_;
                    auVar98._2_2_ = (short)((ulong)uVar150 >> 0x10);
                    auVar98._0_2_ = (short)(uVar110 >> 0x10);
                    auVar427._0_4_ = CONCAT22((short)uVar150,(short)uVar110);
                    auVar427._4_12_ = auVar98;
                    uVar110 = *(ulong *)(puVar133 + lVar129 * 2 + 4);
                    uVar150 = *(undefined8 *)(puVar133 + local_2d8._0_8_ + 4);
                    auVar710._8_4_ = 0;
                    auVar710._0_8_ = uVar110;
                    auVar710._12_2_ = (short)(uVar110 >> 0x30);
                    auVar710._14_2_ = (short)((ulong)uVar150 >> 0x30);
                    auVar729._12_4_ = auVar710._12_4_;
                    auVar729._8_2_ = 0;
                    auVar729._0_8_ = uVar110;
                    auVar729._10_2_ = (short)((ulong)uVar150 >> 0x20);
                    auVar732._10_6_ = auVar729._10_6_;
                    auVar732._8_2_ = (short)(uVar110 >> 0x20);
                    auVar732._0_8_ = uVar110;
                    auVar99._4_8_ = auVar732._8_8_;
                    auVar99._2_2_ = (short)((ulong)uVar150 >> 0x10);
                    auVar99._0_2_ = (short)(uVar110 >> 0x10);
                    auVar225._6_2_ = (short)uVar150;
                    auVar225._4_2_ = (short)uVar110;
                    auVar430._0_8_ = auVar427._0_8_;
                    auVar430._8_4_ = auVar98._0_4_;
                    auVar430._12_4_ = auVar99._0_4_;
                    auVar225._0_4_ = auVar427._0_4_;
                    lVar130 = lVar129 * 4 + 4;
                    uVar110 = *(ulong *)(puVar133 + lVar129 * 4 + 4);
                    uVar150 = *(undefined8 *)(puVar133 + lVar129 + lVar130);
                    auVar541._8_4_ = 0;
                    auVar541._0_8_ = uVar110;
                    auVar541._12_2_ = (short)(uVar110 >> 0x30);
                    auVar541._14_2_ = (short)((ulong)uVar150 >> 0x30);
                    auVar540._12_4_ = auVar541._12_4_;
                    auVar540._8_2_ = 0;
                    auVar540._0_8_ = uVar110;
                    auVar540._10_2_ = (short)((ulong)uVar150 >> 0x20);
                    auVar539._10_6_ = auVar540._10_6_;
                    auVar539._8_2_ = (short)(uVar110 >> 0x20);
                    auVar539._0_8_ = uVar110;
                    auVar100._4_8_ = auVar539._8_8_;
                    auVar100._2_2_ = (short)((ulong)uVar150 >> 0x10);
                    auVar100._0_2_ = (short)(uVar110 >> 0x10);
                    auVar538._0_4_ = CONCAT22((short)uVar150,(short)uVar110);
                    auVar538._4_12_ = auVar100;
                    uVar110 = *(ulong *)(puVar133 + lVar129 * 2 + lVar130);
                    uVar150 = *(undefined8 *)(puVar133 + local_2d8._0_8_ + lVar130);
                    auVar712._8_4_ = 0;
                    auVar712._0_8_ = uVar110;
                    auVar712._12_2_ = (short)(uVar110 >> 0x30);
                    auVar712._14_2_ = (short)((ulong)uVar150 >> 0x30);
                    auVar719._12_4_ = auVar712._12_4_;
                    auVar719._8_2_ = 0;
                    auVar719._0_8_ = uVar110;
                    auVar719._10_2_ = (short)((ulong)uVar150 >> 0x20);
                    auVar713._10_6_ = auVar719._10_6_;
                    auVar713._8_2_ = (short)(uVar110 >> 0x20);
                    auVar713._0_8_ = uVar110;
                    auVar101._4_8_ = auVar713._8_8_;
                    auVar101._2_2_ = (short)((ulong)uVar150 >> 0x10);
                    auVar101._0_2_ = (short)(uVar110 >> 0x10);
                    auVar225._14_2_ = (short)uVar150;
                    auVar225._12_2_ = (short)uVar110;
                    auVar542._0_8_ = auVar538._0_8_;
                    auVar542._8_4_ = auVar100._0_4_;
                    auVar542._12_4_ = auVar101._0_4_;
                    auVar225._8_4_ = auVar538._0_4_;
                    auVar709._8_8_ = auVar542._8_8_;
                    auVar709._0_8_ = auVar430._8_8_;
                    lVar128 = 0;
                    lVar130 = local_278._0_8_ - (long)(iVar123 * 8);
                    iVar137 = -uVar112;
                    do {
                      uVar110 = *(ulong *)(puVar133 + lVar128 * 2 + 8);
                      lVar139 = lVar129 + lVar128 * 2 + 8;
                      uVar150 = *(undefined8 *)(puVar133 + lVar129 + 8 + lVar128 * 2);
                      auVar546._8_4_ = 0;
                      auVar546._0_8_ = uVar110;
                      auVar546._12_2_ = (short)(uVar110 >> 0x30);
                      auVar546._14_2_ = (short)((ulong)uVar150 >> 0x30);
                      auVar545._12_4_ = auVar546._12_4_;
                      auVar545._8_2_ = 0;
                      auVar545._0_8_ = uVar110;
                      auVar545._10_2_ = (short)((ulong)uVar150 >> 0x20);
                      auVar544._10_6_ = auVar545._10_6_;
                      auVar544._8_2_ = (short)(uVar110 >> 0x20);
                      auVar544._0_8_ = uVar110;
                      auVar102._4_8_ = auVar544._8_8_;
                      auVar102._2_2_ = (short)((ulong)uVar150 >> 0x10);
                      auVar102._0_2_ = (short)(uVar110 >> 0x10);
                      auVar543._0_4_ = CONCAT22((short)uVar150,(short)uVar110);
                      auVar543._4_12_ = auVar102;
                      uVar110 = *(ulong *)(puVar133 + lVar129 + lVar139);
                      lVar139 = lVar129 + lVar139;
                      uVar150 = *(undefined8 *)(puVar133 + lVar129 + lVar139);
                      lVar139 = lVar129 + lVar139;
                      auVar655._8_4_ = 0;
                      auVar655._0_8_ = uVar110;
                      auVar655._12_2_ = (short)(uVar110 >> 0x30);
                      auVar655._14_2_ = (short)((ulong)uVar150 >> 0x30);
                      auVar654._12_4_ = auVar655._12_4_;
                      auVar654._8_2_ = 0;
                      auVar654._0_8_ = uVar110;
                      auVar654._10_2_ = (short)((ulong)uVar150 >> 0x20);
                      auVar653._10_6_ = auVar654._10_6_;
                      auVar653._8_2_ = (short)(uVar110 >> 0x20);
                      auVar653._0_8_ = uVar110;
                      auVar103._4_8_ = auVar653._8_8_;
                      auVar103._2_2_ = (short)((ulong)uVar150 >> 0x10);
                      auVar103._0_2_ = (short)(uVar110 >> 0x10);
                      auVar718._6_2_ = (short)uVar150;
                      auVar718._4_2_ = (short)uVar110;
                      uVar110 = *(ulong *)(puVar133 + lVar129 + lVar139);
                      lVar139 = lVar129 + lVar139;
                      uVar150 = *(undefined8 *)(puVar133 + lVar129 + lVar139);
                      lVar139 = lVar129 + lVar139;
                      auVar701._8_4_ = 0;
                      auVar701._0_8_ = uVar110;
                      auVar701._12_2_ = (short)(uVar110 >> 0x30);
                      auVar701._14_2_ = (short)((ulong)uVar150 >> 0x30);
                      auVar700._12_4_ = auVar701._12_4_;
                      auVar700._8_2_ = 0;
                      auVar700._0_8_ = uVar110;
                      auVar700._10_2_ = (short)((ulong)uVar150 >> 0x20);
                      auVar699._10_6_ = auVar700._10_6_;
                      auVar699._8_2_ = (short)(uVar110 >> 0x20);
                      auVar699._0_8_ = uVar110;
                      auVar104._4_8_ = auVar699._8_8_;
                      auVar104._2_2_ = (short)((ulong)uVar150 >> 0x10);
                      auVar104._0_2_ = (short)(uVar110 >> 0x10);
                      auVar698._0_4_ = CONCAT22((short)uVar150,(short)uVar110);
                      auVar698._4_12_ = auVar104;
                      uVar110 = *(ulong *)(puVar133 + lVar129 + lVar139);
                      uVar150 = *(undefined8 *)(puVar133 + lVar129 * 2 + lVar139);
                      auVar717._8_4_ = 0;
                      auVar717._0_8_ = uVar110;
                      auVar717._12_2_ = (short)(uVar110 >> 0x30);
                      auVar717._14_2_ = (short)((ulong)uVar150 >> 0x30);
                      auVar716._12_4_ = auVar717._12_4_;
                      auVar716._8_2_ = 0;
                      auVar716._0_8_ = uVar110;
                      auVar716._10_2_ = (short)((ulong)uVar150 >> 0x20);
                      auVar715._10_6_ = auVar716._10_6_;
                      auVar715._8_2_ = (short)(uVar110 >> 0x20);
                      auVar715._0_8_ = uVar110;
                      auVar105._4_8_ = auVar715._8_8_;
                      auVar105._2_2_ = (short)((ulong)uVar150 >> 0x10);
                      auVar105._0_2_ = (short)(uVar110 >> 0x10);
                      auVar718._14_2_ = (short)uVar150;
                      auVar718._12_2_ = (short)uVar110;
                      auVar685._0_8_ = auVar543._0_8_;
                      auVar685._8_4_ = auVar102._0_4_;
                      auVar685._12_4_ = auVar103._0_4_;
                      auVar718._0_4_ = auVar543._0_4_;
                      auVar725._0_8_ = auVar698._0_8_;
                      auVar725._8_4_ = auVar104._0_4_;
                      auVar725._12_4_ = auVar105._0_4_;
                      auVar718._8_4_ = auVar698._0_4_;
                      auVar547._0_8_ = CONCAT44(auVar653._8_4_,auVar544._8_4_);
                      auVar547._8_4_ = auVar545._12_4_;
                      auVar547._12_4_ = auVar654._12_4_;
                      auVar702._0_8_ = CONCAT44(auVar715._8_4_,auVar699._8_4_);
                      auVar702._8_4_ = auVar700._12_4_;
                      auVar702._12_4_ = auVar716._12_4_;
                      auVar686._8_8_ = auVar725._8_8_;
                      auVar686._0_8_ = auVar685._8_8_;
                      auVar656._8_8_ = auVar702._0_8_;
                      auVar656._0_8_ = auVar547._0_8_;
                      auVar548._8_8_ = auVar702._8_8_;
                      auVar548._0_8_ = auVar547._8_8_;
                      auVar225 = pmaddubsw(auVar225,auVar153);
                      auVar709 = pmaddubsw(auVar709,auVar207);
                      auVar710 = pmaddubsw(auVar718,auVar208);
                      auVar729 = pmaddubsw(auVar686,auVar166);
                      auVar726._0_2_ = auVar729._0_2_ + auVar709._0_2_;
                      auVar726._2_2_ = auVar729._2_2_ + auVar709._2_2_;
                      auVar726._4_2_ = auVar729._4_2_ + auVar709._4_2_;
                      auVar726._6_2_ = auVar729._6_2_ + auVar709._6_2_;
                      auVar726._8_2_ = auVar729._8_2_ + auVar709._8_2_;
                      auVar726._10_2_ = auVar729._10_2_ + auVar709._10_2_;
                      auVar726._12_2_ = auVar729._12_2_ + auVar709._12_2_;
                      auVar726._14_2_ = auVar729._14_2_ + auVar709._14_2_;
                      auVar331._0_2_ = auVar225._0_2_ + 0x40 + auVar710._0_2_;
                      auVar331._2_2_ = auVar225._2_2_ + 0x40 + auVar710._2_2_;
                      auVar331._4_2_ = auVar225._4_2_ + 0x40 + auVar710._4_2_;
                      auVar331._6_2_ = auVar225._6_2_ + 0x40 + auVar710._6_2_;
                      auVar331._8_2_ = auVar225._8_2_ + 0x40 + auVar710._8_2_;
                      auVar331._10_2_ = auVar225._10_2_ + 0x40 + auVar710._10_2_;
                      auVar331._12_2_ = auVar225._12_2_ + 0x40 + auVar710._12_2_;
                      auVar331._14_2_ = auVar225._14_2_ + 0x40 + auVar710._14_2_;
                      auVar225 = paddsw(auVar331,auVar726);
                      auVar225 = psraw(auVar225,7);
                      sVar30 = auVar225._0_2_;
                      sVar43 = auVar225._2_2_;
                      uVar145 = CONCAT11((0 < sVar43) * (sVar43 < 0x100) * auVar225[2] -
                                         (0xff < sVar43),
                                         (0 < sVar30) * (sVar30 < 0x100) * auVar225[0] -
                                         (0xff < sVar30));
                      sVar31 = auVar225._4_2_;
                      sVar32 = auVar225._6_2_;
                      auVar332._0_4_ =
                           CONCAT13((0 < sVar32) * (sVar32 < 0x100) * auVar225[6] - (0xff < sVar32),
                                    CONCAT12((0 < sVar31) * (sVar31 < 0x100) * auVar225[4] -
                                             (0xff < sVar31),uVar145));
                      sVar33 = auVar225._8_2_;
                      sVar34 = auVar225._10_2_;
                      auVar333._0_6_ =
                           CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar225[10] - (0xff < sVar34)
                                    ,CONCAT14((0 < sVar33) * (sVar33 < 0x100) * auVar225[8] -
                                              (0xff < sVar33),auVar332._0_4_));
                      sVar33 = auVar225._12_2_;
                      sVar34 = auVar225._14_2_;
                      auVar334._0_8_ =
                           CONCAT17((0 < sVar34) * (sVar34 < 0x100) * auVar225[0xe] -
                                    (0xff < sVar34),
                                    CONCAT16((0 < sVar33) * (sVar33 < 0x100) * auVar225[0xc] -
                                             (0xff < sVar33),auVar333._0_6_));
                      auVar335._0_10_ =
                           CONCAT19((0 < sVar43) * (sVar43 < 0x100) * auVar225[2] - (0xff < sVar43),
                                    CONCAT18((0 < sVar30) * (sVar30 < 0x100) * auVar225[0] -
                                             (0xff < sVar30),auVar334._0_8_));
                      auVar336[10] = (0 < sVar31) * (sVar31 < 0x100) * auVar225[4] - (0xff < sVar31)
                      ;
                      auVar336._0_10_ = auVar335._0_10_;
                      auVar336[0xb] =
                           (0 < sVar32) * (sVar32 < 0x100) * auVar225[6] - (0xff < sVar32);
                      auVar729 = pmaddubsw(auVar718,auVar153);
                      auVar709 = pmaddubsw(auVar686,auVar207);
                      auVar710 = pmaddubsw(auVar656,auVar208);
                      auVar225 = pmaddubsw(auVar548,auVar166);
                      auVar549._0_2_ = auVar225._0_2_ + auVar709._0_2_;
                      auVar549._2_2_ = auVar225._2_2_ + auVar709._2_2_;
                      auVar549._4_2_ = auVar225._4_2_ + auVar709._4_2_;
                      auVar549._6_2_ = auVar225._6_2_ + auVar709._6_2_;
                      auVar549._8_2_ = auVar225._8_2_ + auVar709._8_2_;
                      auVar549._10_2_ = auVar225._10_2_ + auVar709._10_2_;
                      auVar549._12_2_ = auVar225._12_2_ + auVar709._12_2_;
                      auVar549._14_2_ = auVar225._14_2_ + auVar709._14_2_;
                      auVar703._0_2_ = auVar710._0_2_ + auVar729._0_2_ + 0x40;
                      auVar703._2_2_ = auVar710._2_2_ + auVar729._2_2_ + 0x40;
                      auVar703._4_2_ = auVar710._4_2_ + auVar729._4_2_ + 0x40;
                      auVar703._6_2_ = auVar710._6_2_ + auVar729._6_2_ + 0x40;
                      auVar703._8_2_ = auVar710._8_2_ + auVar729._8_2_ + 0x40;
                      auVar703._10_2_ = auVar710._10_2_ + auVar729._10_2_ + 0x40;
                      auVar703._12_2_ = auVar710._12_2_ + auVar729._12_2_ + 0x40;
                      auVar703._14_2_ = auVar710._14_2_ + auVar729._14_2_ + 0x40;
                      auVar225 = paddsw(auVar703,auVar549);
                      auVar225 = psraw(auVar225,7);
                      sVar30 = auVar225._0_2_;
                      sVar43 = auVar225._2_2_;
                      uVar177 = CONCAT11((0 < sVar43) * (sVar43 < 0x100) * auVar225[2] -
                                         (0xff < sVar43),
                                         (0 < sVar30) * (sVar30 < 0x100) * auVar225[0] -
                                         (0xff < sVar30));
                      sVar30 = auVar225._4_2_;
                      sVar43 = auVar225._6_2_;
                      uVar148 = CONCAT13((0 < sVar43) * (sVar43 < 0x100) * auVar225[6] -
                                         (0xff < sVar43),
                                         CONCAT12((0 < sVar30) * (sVar30 < 0x100) * auVar225[4] -
                                                  (0xff < sVar30),uVar177));
                      sVar30 = auVar225._8_2_;
                      sVar43 = auVar225._10_2_;
                      uVar149 = CONCAT15((0 < sVar43) * (sVar43 < 0x100) * auVar225[10] -
                                         (0xff < sVar43),
                                         CONCAT14((0 < sVar30) * (sVar30 < 0x100) * auVar225[8] -
                                                  (0xff < sVar30),uVar148));
                      sVar30 = auVar225._12_2_;
                      sVar43 = auVar225._14_2_;
                      auVar336._12_2_ = (short)((ulong)auVar334._0_8_ >> 0x30);
                      auVar336._14_2_ =
                           (short)(CONCAT17((0 < sVar43) * (sVar43 < 0x100) * auVar225[0xe] -
                                            (0xff < sVar43),
                                            CONCAT16((0 < sVar30) * (sVar30 < 0x100) * auVar225[0xc]
                                                     - (0xff < sVar30),uVar149)) >> 0x30);
                      auVar335._12_4_ = auVar336._12_4_;
                      auVar335._10_2_ = (short)((uint6)uVar149 >> 0x20);
                      auVar334._10_6_ = auVar335._10_6_;
                      auVar334._8_2_ = (short)((uint6)auVar333._0_6_ >> 0x20);
                      auVar333._8_8_ = auVar334._8_8_;
                      auVar333._6_2_ = (short)((uint)uVar148 >> 0x10);
                      auVar332._6_10_ = auVar333._6_10_;
                      auVar332._4_2_ = (short)((uint)auVar332._0_4_ >> 0x10);
                      *(uint *)(*pauVar138 + lVar128) = CONCAT22(uVar177,uVar145);
                      *(int *)(*pauVar138 + lVar128 + lVar111) = auVar332._4_4_;
                      *(int *)(*pauVar138 + lVar128 + lVar111 * 2) = auVar334._8_4_;
                      *(undefined4 *)(*pauVar138 + lVar128 + lVar111 * 3) = auVar335._12_4_;
                      lVar128 = lVar128 + 4;
                      lVar130 = lVar130 + -8;
                      iVar137 = iVar137 + 2;
                      auVar225 = auVar656;
                      auVar709 = auVar548;
                    } while (iVar137 != 0);
                    puVar133 = puVar133 + -lVar130;
                    pauVar138 = (undefined1 (*) [16])(*pauVar138 + lVar128 + (int)(uVar112 * 6));
                    iVar137 = local_328._0_4_ + -8;
                    local_328._0_4_ = iVar137;
                  } while (iVar137 != 0);
                  uVar118 = iVar119 + 7U & 0xfffffff8;
                  uVar107 = iVar140 + 1U & 0xfffffffe;
                  pauVar138 = __ptr_00;
                  do {
                    pauVar122 = (undefined1 (*) [16])(*pauVar138 + local_278._0_8_);
                    auVar225 = *pauVar138;
                    auVar709 = *(undefined1 (*) [16])(*pauVar138 + lVar111);
                    iVar123 = -uVar107;
                    do {
                      auVar710 = *pauVar122;
                      puVar106 = *pauVar122;
                      auVar729 = *(undefined1 (*) [16])(*pauVar122 + lVar111 * 2);
                      auVar732 = *(undefined1 (*) [16])(*pauVar122 + lVar111 * 3);
                      pauVar122 = (undefined1 (*) [16])(*pauVar122 + (int)(uVar112 << 3));
                      auVar225 = pmaddubsw(auVar225,auVar153);
                      auVar709 = pmaddubsw(auVar709,auVar207);
                      auVar719 = pmaddubsw(auVar710,auVar208);
                      auVar712 = pmaddubsw(*(undefined1 (*) [16])(puVar106 + lVar111),auVar166);
                      auVar727._0_2_ = auVar712._0_2_ + auVar709._0_2_;
                      auVar727._2_2_ = auVar712._2_2_ + auVar709._2_2_;
                      auVar727._4_2_ = auVar712._4_2_ + auVar709._4_2_;
                      auVar727._6_2_ = auVar712._6_2_ + auVar709._6_2_;
                      auVar727._8_2_ = auVar712._8_2_ + auVar709._8_2_;
                      auVar727._10_2_ = auVar712._10_2_ + auVar709._10_2_;
                      auVar727._12_2_ = auVar712._12_2_ + auVar709._12_2_;
                      auVar727._14_2_ = auVar712._14_2_ + auVar709._14_2_;
                      auVar337._0_2_ = auVar225._0_2_ + 0x40 + auVar719._0_2_;
                      auVar337._2_2_ = auVar225._2_2_ + 0x40 + auVar719._2_2_;
                      auVar337._4_2_ = auVar225._4_2_ + 0x40 + auVar719._4_2_;
                      auVar337._6_2_ = auVar225._6_2_ + 0x40 + auVar719._6_2_;
                      auVar337._8_2_ = auVar225._8_2_ + 0x40 + auVar719._8_2_;
                      auVar337._10_2_ = auVar225._10_2_ + 0x40 + auVar719._10_2_;
                      auVar337._12_2_ = auVar225._12_2_ + 0x40 + auVar719._12_2_;
                      auVar337._14_2_ = auVar225._14_2_ + 0x40 + auVar719._14_2_;
                      auVar225 = paddsw(auVar337,auVar727);
                      auVar225 = psraw(auVar225,7);
                      sVar30 = auVar225._0_2_;
                      sVar43 = auVar225._2_2_;
                      sVar31 = auVar225._4_2_;
                      sVar32 = auVar225._6_2_;
                      sVar33 = auVar225._8_2_;
                      sVar34 = auVar225._10_2_;
                      sVar35 = auVar225._12_2_;
                      sVar36 = auVar225._14_2_;
                      auVar710 = pmaddubsw(auVar710,auVar153);
                      auVar709 = pmaddubsw(*(undefined1 (*) [16])(puVar106 + lVar111),auVar207);
                      *(ulong *)puVar115 =
                           CONCAT17((0 < sVar36) * (sVar36 < 0x100) * auVar225[0xe] -
                                    (0xff < sVar36),
                                    CONCAT16((0 < sVar35) * (sVar35 < 0x100) * auVar225[0xc] -
                                             (0xff < sVar35),
                                             CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar225[10]
                                                      - (0xff < sVar34),
                                                      CONCAT14((0 < sVar33) * (sVar33 < 0x100) *
                                                               auVar225[8] - (0xff < sVar33),
                                                               CONCAT13((0 < sVar32) *
                                                                        (sVar32 < 0x100) *
                                                                        auVar225[6] -
                                                                        (0xff < sVar32),
                                                                        CONCAT12((0 < sVar31) *
                                                                                 (sVar31 < 0x100) *
                                                                                 auVar225[4] -
                                                                                 (0xff < sVar31),
                                                                                 CONCAT11((0 < 
                                                  sVar43) * (sVar43 < 0x100) * auVar225[2] -
                                                  (0xff < sVar43),
                                                  (0 < sVar30) * (sVar30 < 0x100) * auVar225[0] -
                                                  (0xff < sVar30))))))));
                      auVar719 = pmaddubsw(auVar729,auVar208);
                      auVar225 = pmaddubsw(auVar732,auVar166);
                      auVar657._0_2_ = auVar225._0_2_ + auVar709._0_2_;
                      auVar657._2_2_ = auVar225._2_2_ + auVar709._2_2_;
                      auVar657._4_2_ = auVar225._4_2_ + auVar709._4_2_;
                      auVar657._6_2_ = auVar225._6_2_ + auVar709._6_2_;
                      auVar657._8_2_ = auVar225._8_2_ + auVar709._8_2_;
                      auVar657._10_2_ = auVar225._10_2_ + auVar709._10_2_;
                      auVar657._12_2_ = auVar225._12_2_ + auVar709._12_2_;
                      auVar657._14_2_ = auVar225._14_2_ + auVar709._14_2_;
                      auVar687._0_2_ = auVar719._0_2_ + auVar710._0_2_ + 0x40;
                      auVar687._2_2_ = auVar719._2_2_ + auVar710._2_2_ + 0x40;
                      auVar687._4_2_ = auVar719._4_2_ + auVar710._4_2_ + 0x40;
                      auVar687._6_2_ = auVar719._6_2_ + auVar710._6_2_ + 0x40;
                      auVar687._8_2_ = auVar719._8_2_ + auVar710._8_2_ + 0x40;
                      auVar687._10_2_ = auVar719._10_2_ + auVar710._10_2_ + 0x40;
                      auVar687._12_2_ = auVar719._12_2_ + auVar710._12_2_ + 0x40;
                      auVar687._14_2_ = auVar719._14_2_ + auVar710._14_2_ + 0x40;
                      auVar225 = paddsw(auVar687,auVar657);
                      auVar225 = psraw(auVar225,7);
                      sVar30 = auVar225._0_2_;
                      sVar43 = auVar225._2_2_;
                      sVar31 = auVar225._4_2_;
                      sVar32 = auVar225._6_2_;
                      sVar33 = auVar225._8_2_;
                      sVar34 = auVar225._10_2_;
                      sVar35 = auVar225._12_2_;
                      sVar36 = auVar225._14_2_;
                      *(ulong *)(puVar115 + iVar108) =
                           CONCAT17((0 < sVar36) * (sVar36 < 0x100) * auVar225[0xe] -
                                    (0xff < sVar36),
                                    CONCAT16((0 < sVar35) * (sVar35 < 0x100) * auVar225[0xc] -
                                             (0xff < sVar35),
                                             CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar225[10]
                                                      - (0xff < sVar34),
                                                      CONCAT14((0 < sVar33) * (sVar33 < 0x100) *
                                                               auVar225[8] - (0xff < sVar33),
                                                               CONCAT13((0 < sVar32) *
                                                                        (sVar32 < 0x100) *
                                                                        auVar225[6] -
                                                                        (0xff < sVar32),
                                                                        CONCAT12((0 < sVar31) *
                                                                                 (sVar31 < 0x100) *
                                                                                 auVar225[4] -
                                                                                 (0xff < sVar31),
                                                                                 CONCAT11((0 < 
                                                  sVar43) * (sVar43 < 0x100) * auVar225[2] -
                                                  (0xff < sVar43),
                                                  (0 < sVar30) * (sVar30 < 0x100) * auVar225[0] -
                                                  (0xff < sVar30))))))));
                      puVar115 = puVar115 + (long)iVar108 * 2;
                      iVar123 = iVar123 + 2;
                      auVar225 = auVar729;
                      auVar709 = auVar732;
                    } while (iVar123 != 0);
                    pauVar138 = (undefined1 (*) [16])
                                ((long)pauVar122 +
                                (0x10 - (long)(int)((iVar140 * 4 + 4U | 4) * uVar112)));
                    puVar115 = puVar115 + (8 - (long)(int)(iVar108 * uVar107));
                    uVar118 = uVar118 - 8;
                  } while (uVar118 != 0);
                  free(__ptr_00);
                  bVar144 = false;
                }
                goto LAB_003e8648;
              }
              lVar111 = (long)*(int *)((long)src->store_buf_adr +
                                      ((ulong)((uint)bVar144 * 4) - 0x28));
              puVar115 = dst->store_buf_adr[uVar132 - 4];
              iVar123 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar144 * 4) - 0x28));
              uVar107 = iVar119 + 0xfU & 0xfffffff0;
              auVar153 = ZEXT416(CONCAT22((short)((uint)*(int *)(*local_140 + 4) >> 8),
                                          (ushort)(*(int *)(*local_140 + 4) << 8) | (*local_140)[3])
                                );
              auVar153 = pshuflw(auVar153,auVar153,0);
              auVar153._4_4_ = auVar153._0_4_;
              auVar153._8_4_ = auVar153._0_4_;
              auVar153._12_4_ = auVar153._0_4_;
              puVar133 = src->store_buf_adr[uVar132 - 4];
              do {
                puVar127 = puVar133 + (lVar111 - (int)uVar107) * 4;
                lVar129 = 0;
                do {
                  auVar207 = *(undefined1 (*) [16])(puVar133 + lVar129 * 4);
                  auVar208 = *(undefined1 (*) [16])(puVar133 + lVar129 * 4 + 0x10);
                  auVar225 = *(undefined1 (*) [16])(puVar133 + lVar129 * 4 + 0x20);
                  auVar709 = *(undefined1 (*) [16])(puVar133 + lVar129 * 4 + 0x30);
                  puVar4 = puVar133 + lVar129 * 4 + lVar111;
                  puVar121 = puVar133 + lVar129 * 4 + lVar111 + 0x10;
                  puVar5 = puVar133 + lVar129 * 4 + lVar111 + 0x20;
                  puVar117 = puVar133 + lVar129 * 4 + lVar111 + 0x30;
                  auVar691._0_12_ = auVar207._0_12_;
                  auVar691._12_2_ = auVar207._6_2_;
                  auVar691._14_2_ = *(undefined2 *)(puVar4 + 6);
                  auVar690._12_4_ = auVar691._12_4_;
                  auVar690._0_10_ = auVar207._0_10_;
                  auVar690._10_2_ = *(undefined2 *)(puVar4 + 4);
                  auVar689._10_6_ = auVar690._10_6_;
                  auVar689._0_8_ = auVar207._0_8_;
                  auVar689._8_2_ = auVar207._4_2_;
                  uVar688 = CONCAT22(*(undefined2 *)puVar4,auVar207._0_2_);
                  uVar148 = CONCAT22(*(undefined2 *)(puVar4 + 8),auVar207._8_2_);
                  auVar184._14_2_ = *(undefined2 *)(puVar4 + 0xc);
                  auVar184._12_2_ = auVar207._12_2_;
                  auVar707._0_12_ = auVar208._0_12_;
                  auVar707._12_2_ = auVar208._6_2_;
                  auVar707._14_2_ = *(undefined2 *)(puVar121 + 6);
                  auVar706._12_4_ = auVar707._12_4_;
                  auVar706._0_10_ = auVar208._0_10_;
                  auVar706._10_2_ = *(undefined2 *)(puVar121 + 4);
                  auVar705._10_6_ = auVar706._10_6_;
                  auVar705._0_8_ = auVar208._0_8_;
                  auVar705._8_2_ = auVar208._4_2_;
                  uVar704 = CONCAT22(*(undefined2 *)puVar121,auVar208._0_2_);
                  uVar224 = CONCAT22(*(undefined2 *)(puVar121 + 8),auVar208._8_2_);
                  auVar662._14_2_ = *(undefined2 *)(puVar121 + 0xc);
                  auVar662._12_2_ = auVar208._12_2_;
                  auVar434._0_12_ = auVar225._0_12_;
                  auVar434._12_2_ = auVar225._6_2_;
                  auVar434._14_2_ = *(undefined2 *)(puVar5 + 6);
                  auVar433._12_4_ = auVar434._12_4_;
                  auVar433._0_10_ = auVar225._0_10_;
                  auVar433._10_2_ = *(undefined2 *)(puVar5 + 4);
                  auVar432._10_6_ = auVar433._10_6_;
                  auVar432._0_8_ = auVar225._0_8_;
                  auVar432._8_2_ = auVar225._4_2_;
                  uVar431 = CONCAT22(*(undefined2 *)puVar5,auVar225._0_2_);
                  uVar201 = CONCAT22(*(undefined2 *)(puVar5 + 8),auVar225._8_2_);
                  auVar210._14_2_ = *(undefined2 *)(puVar5 + 0xc);
                  auVar210._12_2_ = auVar225._12_2_;
                  auVar553._0_12_ = auVar709._0_12_;
                  auVar553._12_2_ = auVar709._6_2_;
                  auVar553._14_2_ = *(undefined2 *)(puVar117 + 6);
                  auVar552._12_4_ = auVar553._12_4_;
                  auVar552._0_10_ = auVar709._0_10_;
                  auVar552._10_2_ = *(undefined2 *)(puVar117 + 4);
                  auVar551._10_6_ = auVar552._10_6_;
                  auVar551._0_8_ = auVar709._0_8_;
                  auVar551._8_2_ = auVar709._4_2_;
                  uVar550 = CONCAT22(*(undefined2 *)puVar117,auVar709._0_2_);
                  uVar179 = CONCAT22(*(undefined2 *)(puVar117 + 8),auVar709._8_2_);
                  auVar242._14_2_ = *(undefined2 *)(puVar117 + 0xc);
                  auVar242._12_2_ = auVar709._12_2_;
                  auVar184._4_4_ = uVar148;
                  auVar184._0_4_ = uVar688;
                  auVar184._8_4_ = uVar148;
                  auVar207._8_8_ = auVar184._8_8_;
                  auVar207._4_4_ = auVar689._8_4_;
                  auVar207._0_4_ = uVar688;
                  auVar662._4_4_ = uVar224;
                  auVar662._0_4_ = uVar704;
                  auVar662._8_4_ = uVar224;
                  auVar661._8_8_ = auVar662._8_8_;
                  auVar661._4_4_ = auVar705._8_4_;
                  auVar661._0_4_ = uVar704;
                  auVar210._4_4_ = uVar201;
                  auVar210._0_4_ = uVar431;
                  auVar210._8_4_ = uVar201;
                  auVar209._8_8_ = auVar210._8_8_;
                  auVar209._4_4_ = auVar432._8_4_;
                  auVar209._0_4_ = uVar431;
                  auVar242._4_4_ = uVar179;
                  auVar242._0_4_ = uVar550;
                  auVar242._8_4_ = uVar179;
                  auVar241._8_8_ = auVar242._8_8_;
                  auVar241._4_4_ = auVar551._8_4_;
                  auVar241._0_4_ = uVar550;
                  auVar207 = pmaddubsw(auVar207,auVar153);
                  auVar208 = pmaddubsw(auVar661,auVar153);
                  auVar207 = paddsw(auVar207,auVar166);
                  auVar208 = paddsw(auVar208,auVar166);
                  auVar207 = psraw(auVar207,7);
                  auVar225 = psraw(auVar208,7);
                  sVar30 = auVar207._0_2_;
                  sVar43 = auVar207._2_2_;
                  auVar208[1] = (0 < sVar43) * (sVar43 < 0x100) * auVar207[2] - (0xff < sVar43);
                  auVar208[0] = (0 < sVar30) * (sVar30 < 0x100) * auVar207[0] - (0xff < sVar30);
                  sVar30 = auVar207._4_2_;
                  auVar208[2] = (0 < sVar30) * (sVar30 < 0x100) * auVar207[4] - (0xff < sVar30);
                  sVar30 = auVar207._6_2_;
                  auVar208[3] = (0 < sVar30) * (sVar30 < 0x100) * auVar207[6] - (0xff < sVar30);
                  sVar30 = auVar207._8_2_;
                  auVar208[4] = (0 < sVar30) * (sVar30 < 0x100) * auVar207[8] - (0xff < sVar30);
                  sVar30 = auVar207._10_2_;
                  auVar208[5] = (0 < sVar30) * (sVar30 < 0x100) * auVar207[10] - (0xff < sVar30);
                  sVar30 = auVar207._12_2_;
                  auVar208[6] = (0 < sVar30) * (sVar30 < 0x100) * auVar207[0xc] - (0xff < sVar30);
                  sVar30 = auVar207._14_2_;
                  auVar208[7] = (0 < sVar30) * (sVar30 < 0x100) * auVar207[0xe] - (0xff < sVar30);
                  sVar30 = auVar225._0_2_;
                  auVar208[8] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[0] - (0xff < sVar30);
                  sVar30 = auVar225._2_2_;
                  auVar208[9] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[2] - (0xff < sVar30);
                  sVar30 = auVar225._4_2_;
                  auVar208[10] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[4] - (0xff < sVar30);
                  sVar30 = auVar225._6_2_;
                  auVar208[0xb] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[6] - (0xff < sVar30);
                  sVar30 = auVar225._8_2_;
                  auVar208[0xc] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[8] - (0xff < sVar30);
                  sVar30 = auVar225._10_2_;
                  auVar208[0xd] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[10] - (0xff < sVar30);
                  sVar30 = auVar225._12_2_;
                  auVar208[0xe] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[0xc] - (0xff < sVar30);
                  sVar30 = auVar225._14_2_;
                  auVar208[0xf] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[0xe] - (0xff < sVar30);
                  auVar207 = pmaddubsw(auVar209,auVar153);
                  auVar225 = pmaddubsw(auVar241,auVar153);
                  auVar207 = paddsw(auVar207,auVar166);
                  auVar225 = paddsw(auVar225,auVar166);
                  auVar207 = psraw(auVar207,7);
                  auVar225 = psraw(auVar225,7);
                  sVar30 = auVar207._0_2_;
                  sVar43 = auVar207._2_2_;
                  auVar211[1] = (0 < sVar43) * (sVar43 < 0x100) * auVar207[2] - (0xff < sVar43);
                  auVar211[0] = (0 < sVar30) * (sVar30 < 0x100) * auVar207[0] - (0xff < sVar30);
                  sVar30 = auVar207._4_2_;
                  auVar211[2] = (0 < sVar30) * (sVar30 < 0x100) * auVar207[4] - (0xff < sVar30);
                  sVar30 = auVar207._6_2_;
                  auVar211[3] = (0 < sVar30) * (sVar30 < 0x100) * auVar207[6] - (0xff < sVar30);
                  sVar30 = auVar207._8_2_;
                  auVar211[4] = (0 < sVar30) * (sVar30 < 0x100) * auVar207[8] - (0xff < sVar30);
                  sVar30 = auVar207._10_2_;
                  auVar211[5] = (0 < sVar30) * (sVar30 < 0x100) * auVar207[10] - (0xff < sVar30);
                  sVar30 = auVar207._12_2_;
                  auVar211[6] = (0 < sVar30) * (sVar30 < 0x100) * auVar207[0xc] - (0xff < sVar30);
                  sVar30 = auVar207._14_2_;
                  auVar211[7] = (0 < sVar30) * (sVar30 < 0x100) * auVar207[0xe] - (0xff < sVar30);
                  sVar30 = auVar225._0_2_;
                  auVar211[8] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[0] - (0xff < sVar30);
                  sVar30 = auVar225._2_2_;
                  auVar211[9] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[2] - (0xff < sVar30);
                  sVar30 = auVar225._4_2_;
                  auVar211[10] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[4] - (0xff < sVar30);
                  sVar30 = auVar225._6_2_;
                  auVar211[0xb] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[6] - (0xff < sVar30);
                  sVar30 = auVar225._8_2_;
                  auVar211[0xc] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[8] - (0xff < sVar30);
                  sVar30 = auVar225._10_2_;
                  auVar211[0xd] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[10] - (0xff < sVar30);
                  sVar30 = auVar225._12_2_;
                  auVar211[0xe] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[0xc] - (0xff < sVar30);
                  sVar30 = auVar225._14_2_;
                  auVar211[0xf] = (0 < sVar30) * (sVar30 < 0x100) * auVar225[0xe] - (0xff < sVar30);
                  auVar207 = pmaddubsw(auVar208,auVar153);
                  auVar208 = pmaddubsw(auVar211,auVar153);
                  auVar207 = paddsw(auVar207,auVar166);
                  auVar208 = paddsw(auVar208,auVar166);
                  auVar207 = psraw(auVar207,7);
                  auVar208 = psraw(auVar208,7);
                  sVar30 = auVar207._0_2_;
                  sVar43 = auVar207._2_2_;
                  sVar31 = auVar207._4_2_;
                  sVar32 = auVar207._6_2_;
                  sVar33 = auVar207._8_2_;
                  sVar34 = auVar207._10_2_;
                  sVar35 = auVar207._12_2_;
                  sVar36 = auVar207._14_2_;
                  sVar37 = auVar208._0_2_;
                  sVar38 = auVar208._2_2_;
                  sVar39 = auVar208._4_2_;
                  sVar40 = auVar208._6_2_;
                  sVar41 = auVar208._8_2_;
                  sVar42 = auVar208._10_2_;
                  sVar44 = auVar208._12_2_;
                  sVar45 = auVar208._14_2_;
                  puVar117 = puVar115 + lVar129;
                  *puVar117 = (0 < sVar30) * (sVar30 < 0x100) * auVar207[0] - (0xff < sVar30);
                  puVar117[1] = (0 < sVar43) * (sVar43 < 0x100) * auVar207[2] - (0xff < sVar43);
                  puVar117[2] = (0 < sVar31) * (sVar31 < 0x100) * auVar207[4] - (0xff < sVar31);
                  puVar117[3] = (0 < sVar32) * (sVar32 < 0x100) * auVar207[6] - (0xff < sVar32);
                  puVar117[4] = (0 < sVar33) * (sVar33 < 0x100) * auVar207[8] - (0xff < sVar33);
                  puVar117[5] = (0 < sVar34) * (sVar34 < 0x100) * auVar207[10] - (0xff < sVar34);
                  puVar117[6] = (0 < sVar35) * (sVar35 < 0x100) * auVar207[0xc] - (0xff < sVar35);
                  puVar117[7] = (0 < sVar36) * (sVar36 < 0x100) * auVar207[0xe] - (0xff < sVar36);
                  puVar117[8] = (0 < sVar37) * (sVar37 < 0x100) * auVar208[0] - (0xff < sVar37);
                  puVar117[9] = (0 < sVar38) * (sVar38 < 0x100) * auVar208[2] - (0xff < sVar38);
                  puVar117[10] = (0 < sVar39) * (sVar39 < 0x100) * auVar208[4] - (0xff < sVar39);
                  puVar117[0xb] = (0 < sVar40) * (sVar40 < 0x100) * auVar208[6] - (0xff < sVar40);
                  puVar117[0xc] = (0 < sVar41) * (sVar41 < 0x100) * auVar208[8] - (0xff < sVar41);
                  puVar117[0xd] = (0 < sVar42) * (sVar42 < 0x100) * auVar208[10] - (0xff < sVar42);
                  puVar117[0xe] = (0 < sVar44) * (sVar44 < 0x100) * auVar208[0xc] - (0xff < sVar44);
                  puVar117[0xf] = (0 < sVar45) * (sVar45 < 0x100) * auVar208[0xe] - (0xff < sVar45);
                  lVar129 = lVar129 + 0x10;
                  puVar127 = puVar127 + 0x40;
                } while (uVar107 != (uint)lVar129);
                puVar115 = puVar115 + lVar129 + ((long)iVar123 - (long)(int)uVar107);
                iVar140 = iVar140 + -1;
                puVar133 = puVar127;
              } while (iVar140 != 0);
            }
            goto LAB_003e864f;
          }
          if ((iVar119 * 4 == iVar123 * 3) && (uVar107 == local_278._0_4_ * 3)) {
            iVar137 = ((iVar108 + 5) / 6) * 6 + 2;
            uVar112 = iVar108 + 7U & 0xfffffff8;
            iVar123 = (uVar112 - iVar137) * 2;
            if ((int)uVar112 <= iVar137) {
              iVar123 = 0;
            }
            __ptr = (undefined8 *)
                    malloc((long)(int)((((int)uVar114 << 2) / 3 + 0xeU & 0x7ffffff8) * iVar137 +
                                      iVar123));
            uVar110 = local_100;
            if (__ptr == (undefined8 *)0x0) {
              bVar144 = true;
              bVar143 = true;
              auVar166 = _DAT_0050f2b0;
            }
            else {
              piVar10 = pIVar113->filter_ptr;
              iVar123 = *(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar144 * 4) - 0x28));
              lVar130 = (long)iVar123;
              puVar115 = dst->store_buf_adr[uVar132 - 4];
              iVar108 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar144 * 4) - 0x28));
              iVar137 = (iVar119 + 5) / 6;
              iVar109 = iVar137 * 0xc + 4;
              local_238 = (int)uVar107 / 3 + 0xeU & 0xfffffff8;
              puVar141 = (ulong *)(src->store_buf_adr[uVar132 - 4] + (iVar123 * -3 + -3));
              auVar166 = *(undefined1 (*) [16])((long)piVar10 + local_e8);
              local_2d8 = pshufb(auVar166,_DAT_0050f310);
              local_2e8 = pshufb(auVar166,_DAT_0050f330);
              local_308 = pshufb(auVar166,_DAT_0050f370);
              (**(code **)(scale_plane_4_to_3_general_shuffle_filter_func_list + local_100))
                        ((long)piVar10 + local_f0,local_88);
              (**(code **)(scale_plane_4_to_3_general_shuffle_filter_func_list + local_138 * 8))
                        ((long)piVar10 + local_f8,local_d8);
              auVar166 = pshufb(auVar166,_DAT_0050f360);
              local_328[0] = auVar166[0] + -0x40;
              local_328[1] = auVar166[1] + -0x40;
              local_328[2] = auVar166[2] + -0x40;
              local_328[3] = auVar166[3] + -0x40;
              local_328[4] = auVar166[4] + -0x40;
              local_328[5] = auVar166[5] + -0x40;
              local_328[6] = auVar166[6] + -0x40;
              local_328[7] = auVar166[7] + -0x40;
              local_328[8] = auVar166[8] + -0x40;
              local_328[9] = auVar166[9] + -0x40;
              local_328[10] = auVar166[10] + -0x40;
              local_328[0xb] = auVar166[0xb] + -0x40;
              local_328[0xc] = auVar166[0xc] + -0x40;
              local_328[0xd] = auVar166[0xd] + -0x40;
              local_328[0xe] = auVar166[0xe] + -0x40;
              local_328[0xf] = auVar166[0xf] + -0x40;
              *local_108 = *local_108 + -0x40;
              local_108[1] = local_108[1] + -0x40;
              local_108[2] = local_108[2] + -0x40;
              local_108[3] = local_108[3] + -0x40;
              local_108[4] = local_108[4] + -0x40;
              local_108[5] = local_108[5] + -0x40;
              local_108[6] = local_108[6] + -0x40;
              local_108[7] = local_108[7] + -0x40;
              local_108[8] = local_108[8] + -0x40;
              local_108[9] = local_108[9] + -0x40;
              local_108[10] = local_108[10] + -0x40;
              local_108[0xb] = local_108[0xb] + -0x40;
              local_108[0xc] = local_108[0xc] + -0x40;
              local_108[0xd] = local_108[0xd] + -0x40;
              local_108[0xe] = local_108[0xe] + -0x40;
              local_108[0xf] = local_108[0xf] + -0x40;
              *local_110 = *local_110 + -0x40;
              local_110[1] = local_110[1] + -0x40;
              local_110[2] = local_110[2] + -0x40;
              local_110[3] = local_110[3] + -0x40;
              local_110[4] = local_110[4] + -0x40;
              local_110[5] = local_110[5] + -0x40;
              local_110[6] = local_110[6] + -0x40;
              local_110[7] = local_110[7] + -0x40;
              local_110[8] = local_110[8] + -0x40;
              local_110[9] = local_110[9] + -0x40;
              local_110[10] = local_110[10] + -0x40;
              local_110[0xb] = local_110[0xb] + -0x40;
              local_110[0xc] = local_110[0xc] + -0x40;
              local_110[0xd] = local_110[0xd] + -0x40;
              local_110[0xe] = local_110[0xe] + -0x40;
              local_110[0xf] = local_110[0xf] + -0x40;
              iVar137 = (int)((ulong)((long)(iVar137 * 0x18) * 0x55555555) >> 0x20) +
                        iVar137 * -0x18;
              pcVar11 = *(code **)(scale_plane_4_to_3_general_convolve8_func_list + uVar110);
              lVar129 = (long)iVar109;
              local_e0 = lVar129 * 2;
              lVar111 = lVar129 * 3;
              puVar142 = __ptr;
              do {
                uVar110 = *puVar141;
                uVar150 = *(undefined8 *)((long)puVar141 + lVar130);
                local_218 = (undefined2)uVar150;
                uStack_216 = (undefined2)((ulong)uVar150 >> 0x10);
                uStack_214 = (undefined2)((ulong)uVar150 >> 0x20);
                uStack_212 = (undefined2)((ulong)uVar150 >> 0x30);
                uVar114 = *(ulong *)((long)puVar141 + lVar130 * 2);
                uVar150 = *(undefined8 *)((long)puVar141 + lVar130 * 3);
                local_1f8 = (undefined2)uVar150;
                uStack_1f6 = (undefined2)((ulong)uVar150 >> 0x10);
                uStack_1f4 = (undefined2)((ulong)uVar150 >> 0x20);
                uStack_1f2 = (undefined2)((ulong)uVar150 >> 0x30);
                uVar120 = *(ulong *)((long)puVar141 + lVar130 * 4);
                uVar150 = *(undefined8 *)((long)puVar141 + lVar130 * 5);
                local_1d8 = (undefined2)uVar150;
                uStack_1d6 = (undefined2)((ulong)uVar150 >> 0x10);
                uStack_1d4 = (undefined2)((ulong)uVar150 >> 0x20);
                uStack_1d2 = (undefined2)((ulong)uVar150 >> 0x30);
                uVar9 = *(ulong *)((long)puVar141 + lVar130 * 6);
                uVar150 = *(undefined8 *)((long)puVar141 + lVar130 * 7);
                auVar156._8_4_ = 0;
                auVar156._0_8_ = uVar110;
                auVar156._12_2_ = (short)(uVar110 >> 0x30);
                auVar156._14_2_ = uStack_212;
                auVar155._12_4_ = auVar156._12_4_;
                auVar155._8_2_ = 0;
                auVar155._0_8_ = uVar110;
                auVar155._10_2_ = uStack_214;
                auVar166._10_6_ = auVar155._10_6_;
                auVar166._8_2_ = (short)(uVar110 >> 0x20);
                auVar166._0_8_ = uVar110;
                auVar187._8_4_ = 0;
                auVar187._0_8_ = uVar114;
                auVar187._12_2_ = (short)(uVar114 >> 0x30);
                auVar187._14_2_ = uStack_1f2;
                auVar186._12_4_ = auVar187._12_4_;
                auVar186._8_2_ = 0;
                auVar186._0_8_ = uVar114;
                auVar186._10_2_ = uStack_1f4;
                auVar185._10_6_ = auVar186._10_6_;
                auVar185._8_2_ = (short)(uVar114 >> 0x20);
                auVar185._0_8_ = uVar114;
                uStack_214 = (undefined2)(uVar114 >> 0x10);
                auVar215._8_4_ = 0;
                auVar215._0_8_ = uVar120;
                auVar215._12_2_ = (short)(uVar120 >> 0x30);
                auVar215._14_2_ = uStack_1d2;
                auVar214._12_4_ = auVar215._12_4_;
                auVar214._8_2_ = 0;
                auVar214._0_8_ = uVar120;
                auVar214._10_2_ = uStack_1d4;
                auVar213._10_6_ = auVar214._10_6_;
                auVar213._8_2_ = (short)(uVar120 >> 0x20);
                auVar213._0_8_ = uVar120;
                auVar86._4_8_ = auVar213._8_8_;
                auVar86._2_2_ = uStack_1d6;
                auVar86._0_2_ = (short)(uVar120 >> 0x10);
                auVar212._0_4_ = CONCAT22(local_1d8,(short)uVar120);
                auVar212._4_12_ = auVar86;
                auVar229._8_4_ = 0;
                auVar229._0_8_ = uVar9;
                local_1b8._0_2_ = (undefined2)uVar150;
                local_1b8._2_2_ = (undefined2)((ulong)uVar150 >> 0x10);
                local_1b8._4_2_ = (undefined2)((ulong)uVar150 >> 0x20);
                local_1b8._6_2_ = (undefined2)((ulong)uVar150 >> 0x30);
                auVar229._12_2_ = (short)(uVar9 >> 0x30);
                auVar229._14_2_ = local_1b8._6_2_;
                auVar228._12_4_ = auVar229._12_4_;
                auVar228._8_2_ = 0;
                auVar228._0_8_ = uVar9;
                auVar228._10_2_ = local_1b8._4_2_;
                auVar227._10_6_ = auVar228._10_6_;
                auVar227._8_2_ = (short)(uVar9 >> 0x20);
                auVar227._0_8_ = uVar9;
                auVar87._4_8_ = auVar227._8_8_;
                auVar87._2_2_ = local_1b8._2_2_;
                auVar87._0_2_ = (short)(uVar9 >> 0x10);
                local_228[0] = CONCAT44(CONCAT22(local_1f8,(short)uVar114),
                                        CONCAT22(local_218,(short)uVar110));
                auVar340._0_8_ = auVar212._0_8_;
                auVar340._8_4_ = auVar86._0_4_;
                auVar340._12_4_ = auVar87._0_4_;
                uStack_210 = auVar340._8_8_;
                local_228[1] = CONCAT44(CONCAT22((undefined2)local_1b8,(short)uVar9),auVar212._0_4_)
                ;
                local_208[0] = auVar166._8_4_;
                local_208[1] = auVar185._8_4_;
                local_208[2] = auVar213._8_4_;
                local_208[3] = auVar227._8_4_;
                uStack_212 = uStack_1f6;
                local_218 = (short)(uVar110 >> 0x10);
                uStack_1f0 = auVar155._12_4_;
                uStack_1ec = auVar186._12_4_;
                iVar136 = ((iVar119 + 5) % 6 - iVar119) + -5;
                do {
                  uVar110 = puVar141[1];
                  uVar150 = *(undefined8 *)((long)puVar141 + lVar130 + 8);
                  local_1d8 = (undefined2)uVar150;
                  uStack_1d6 = (undefined2)((ulong)uVar150 >> 0x10);
                  uStack_1d4 = (undefined2)((ulong)uVar150 >> 0x20);
                  uStack_1d2 = (undefined2)((ulong)uVar150 >> 0x30);
                  uVar114 = *(ulong *)((long)puVar141 + lVar130 + lVar130 + 8);
                  lVar128 = lVar130 + lVar130 + 8;
                  uVar150 = *(undefined8 *)((long)puVar141 + lVar130 + lVar128);
                  lVar128 = lVar130 + lVar128;
                  uVar120 = *(ulong *)((long)puVar141 + lVar130 + lVar128);
                  lVar128 = lVar130 + lVar128;
                  uStack_1a0 = 0;
                  uVar151 = *(undefined8 *)((long)puVar141 + lVar130 + lVar128);
                  lVar128 = lVar130 + lVar128;
                  uStack_190 = 0;
                  local_188 = *(ulong *)((long)puVar141 + lVar130 + lVar128);
                  uStack_180 = 0;
                  uVar152 = *(undefined8 *)((long)puVar141 + lVar130 * 2 + lVar128);
                  uStack_170 = 0;
                  auVar159._8_4_ = 0;
                  auVar159._0_8_ = uVar110;
                  auVar159._12_2_ = (short)(uVar110 >> 0x30);
                  auVar159._14_2_ = uStack_1d2;
                  auVar158._12_4_ = auVar159._12_4_;
                  auVar158._8_2_ = 0;
                  auVar158._0_8_ = uVar110;
                  auVar158._10_2_ = uStack_1d4;
                  auVar157._10_6_ = auVar158._10_6_;
                  auVar157._8_2_ = (short)(uVar110 >> 0x20);
                  auVar157._0_8_ = uVar110;
                  local_1e8 = CONCAT22(local_1d8,(short)uVar110);
                  auVar190._8_4_ = 0;
                  auVar190._0_8_ = uVar114;
                  local_1b8._0_2_ = (undefined2)uVar150;
                  local_1b8._2_2_ = (undefined2)((ulong)uVar150 >> 0x10);
                  local_1b8._4_2_ = (undefined2)((ulong)uVar150 >> 0x20);
                  local_1b8._6_2_ = (undefined2)((ulong)uVar150 >> 0x30);
                  auVar190._12_2_ = (short)(uVar114 >> 0x30);
                  auVar190._14_2_ = local_1b8._6_2_;
                  auVar189._12_4_ = auVar190._12_4_;
                  auVar189._8_2_ = 0;
                  auVar189._0_8_ = uVar114;
                  auVar189._10_2_ = local_1b8._4_2_;
                  auVar188._10_6_ = auVar189._10_6_;
                  auVar188._8_2_ = (short)(uVar114 >> 0x20);
                  auVar188._0_8_ = uVar114;
                  uStack_1d4 = (undefined2)(uVar114 >> 0x10);
                  uStack_1e4 = CONCAT22((undefined2)local_1b8,(short)uVar114);
                  local_198._0_2_ = (undefined2)uVar151;
                  local_198._2_2_ = (undefined2)((ulong)uVar151 >> 0x10);
                  local_198._4_2_ = (undefined2)((ulong)uVar151 >> 0x20);
                  local_198._6_2_ = (undefined2)((ulong)uVar151 >> 0x30);
                  auVar219._8_4_ = 0;
                  auVar219._0_8_ = uVar120;
                  auVar219._12_2_ = (short)(uVar120 >> 0x30);
                  auVar219._14_2_ = local_198._6_2_;
                  auVar218._12_4_ = auVar219._12_4_;
                  auVar218._8_2_ = 0;
                  auVar218._0_8_ = uVar120;
                  auVar218._10_2_ = local_198._4_2_;
                  auVar217._10_6_ = auVar218._10_6_;
                  auVar217._8_2_ = (short)(uVar120 >> 0x20);
                  auVar217._0_8_ = uVar120;
                  auVar88._4_8_ = auVar217._8_8_;
                  auVar88._2_2_ = local_198._2_2_;
                  auVar88._0_2_ = (short)(uVar120 >> 0x10);
                  auVar216._0_4_ = CONCAT22((undefined2)local_198,(short)uVar120);
                  auVar216._4_12_ = auVar88;
                  local_178._0_2_ = (undefined2)uVar152;
                  local_178._2_2_ = (undefined2)((ulong)uVar152 >> 0x10);
                  local_178._4_2_ = (undefined2)((ulong)uVar152 >> 0x20);
                  local_178._6_2_ = (undefined2)((ulong)uVar152 >> 0x30);
                  auVar232._8_4_ = 0;
                  auVar232._0_8_ = local_188;
                  auVar232._12_2_ = (short)(local_188 >> 0x30);
                  auVar232._14_2_ = local_178._6_2_;
                  auVar231._12_4_ = auVar232._12_4_;
                  auVar231._8_2_ = 0;
                  auVar231._0_8_ = local_188;
                  auVar231._10_2_ = local_178._4_2_;
                  auVar230._10_6_ = auVar231._10_6_;
                  auVar230._8_2_ = (short)(local_188 >> 0x20);
                  auVar230._0_8_ = local_188;
                  auVar89._4_8_ = auVar230._8_8_;
                  auVar89._2_2_ = local_178._2_2_;
                  auVar89._0_2_ = (short)(local_188 >> 0x10);
                  local_1c8 = auVar157._8_4_;
                  uStack_1c4 = auVar188._8_4_;
                  auVar341._0_8_ = auVar216._0_8_;
                  auVar341._8_4_ = auVar88._0_4_;
                  auVar341._12_4_ = auVar89._0_4_;
                  uStack_1d0 = auVar341._8_8_;
                  uStack_1e0 = CONCAT44(CONCAT22((undefined2)local_178,(short)local_188),
                                        auVar216._0_4_);
                  uStack_1c0 = auVar217._8_4_;
                  uStack_1bc = auVar230._8_4_;
                  uStack_1d2 = local_1b8._2_2_;
                  auVar70._8_8_ = local_228[1];
                  auVar70._0_8_ = local_228[0];
                  auVar72._2_2_ = uStack_216;
                  auVar72._0_2_ = local_218;
                  auVar72._4_2_ = uStack_214;
                  auVar72._6_2_ = uStack_212;
                  auVar72._8_8_ = uStack_210;
                  auVar74._4_4_ = local_208[1];
                  auVar74._0_4_ = local_208[0];
                  auVar74._8_4_ = local_208[2];
                  auVar74._12_4_ = local_208[3];
                  auVar78._2_2_ = uStack_1f6;
                  auVar78._0_2_ = local_1f8;
                  auVar78._4_2_ = uStack_1f4;
                  auVar78._6_2_ = uStack_1f2;
                  auVar78._8_4_ = uStack_1f0;
                  auVar78._12_4_ = uStack_1ec;
                  puVar141 = puVar141 + 1;
                  auVar166 = pmaddubsw(auVar70,local_2d8);
                  auVar153 = pmaddubsw(auVar74,local_2e8);
                  auVar208 = pmaddubsw(auVar72,local_328);
                  auVar207 = pmaddubsw(auVar78,local_308);
                  auVar166 = paddsw(auVar207,auVar166);
                  auVar166 = paddsw(auVar166,auVar208);
                  auVar166 = paddsw(auVar166,auVar153);
                  auVar153 = pmaddubsw(auVar72,_DAT_004c9fd0);
                  auVar166 = paddsw(auVar153,auVar166);
                  auVar166 = paddsw(auVar166,_DAT_0050f2b0);
                  auVar225 = psraw(auVar166,7);
                  local_1d8 = (short)(uVar110 >> 0x10);
                  local_1b8 = uVar150;
                  local_1a8 = auVar218._12_4_;
                  uStack_1a4 = auVar231._12_4_;
                  local_198 = uVar151;
                  local_178 = uVar152;
                  uStack_1b0._0_4_ = auVar158._12_4_;
                  uStack_1b0._4_4_ = auVar189._12_4_;
                  uVar150 = (*pcVar11)(local_118,local_88);
                  pcVar12 = *(code **)(scale_plane_4_to_3_general_convolve8_func_list +
                                      local_138 * 8);
                  local_158 = (uint8_t *)(*pcVar12)(local_128,local_d8);
                  auVar75._4_4_ = local_208[1];
                  auVar75._0_4_ = local_208[0];
                  auVar75._8_4_ = local_208[2];
                  auVar75._12_4_ = local_208[3];
                  auVar79._2_2_ = uStack_1f6;
                  auVar79._0_2_ = local_1f8;
                  auVar79._4_2_ = uStack_1f4;
                  auVar79._6_2_ = uStack_1f2;
                  auVar79._8_4_ = uStack_1f0;
                  auVar79._12_4_ = uStack_1ec;
                  auVar82._4_4_ = uStack_1e4;
                  auVar82._0_4_ = local_1e8;
                  auVar82._8_8_ = uStack_1e0;
                  auVar84._2_2_ = uStack_1d6;
                  auVar84._0_2_ = local_1d8;
                  auVar84._4_2_ = uStack_1d4;
                  auVar84._6_2_ = uStack_1d2;
                  auVar84._8_8_ = uStack_1d0;
                  auVar166 = pmaddubsw(auVar75,local_2d8);
                  auVar208 = pmaddubsw(auVar79,local_328);
                  auVar153 = pmaddubsw(auVar82,local_2e8);
                  auVar207 = pmaddubsw(auVar84,local_308);
                  auVar166 = paddsw(auVar207,auVar166);
                  auVar166 = paddsw(auVar166,auVar208);
                  auVar166 = paddsw(auVar166,auVar153);
                  auVar153 = pmaddubsw(auVar79,_DAT_004c9fd0);
                  auVar166 = paddsw(auVar153,auVar166);
                  auVar166 = paddsw(auVar166,_DAT_0050f2b0);
                  local_168 = psraw(auVar166,7);
                  uStack_150 = extraout_XMM0_Qb_00;
                  uVar151 = (*pcVar11)(local_120,local_88);
                  uVar152 = (*pcVar12)(local_130,local_d8);
                  local_278._0_2_ = auVar225._0_2_;
                  local_278._2_2_ = auVar225._2_2_;
                  local_278._4_2_ = auVar225._4_2_;
                  local_278._6_2_ = auVar225._6_2_;
                  local_278._8_2_ = auVar225._8_2_;
                  local_278._10_2_ = auVar225._10_2_;
                  local_278._12_2_ = auVar225._12_2_;
                  local_278._14_2_ = auVar225._14_2_;
                  uVar200 = CONCAT11((0 < (short)local_278._2_2_) * ((short)local_278._2_2_ < 0x100)
                                     * auVar225[2] - (0xff < (short)local_278._2_2_),
                                     (0 < (short)local_278._0_2_) * ((short)local_278._0_2_ < 0x100)
                                     * auVar225[0] - (0xff < (short)local_278._0_2_));
                  uVar201 = CONCAT13((0 < (short)local_278._6_2_) * ((short)local_278._6_2_ < 0x100)
                                     * auVar225[6] - (0xff < (short)local_278._6_2_),
                                     CONCAT12((0 < (short)local_278._4_2_) *
                                              ((short)local_278._4_2_ < 0x100) * auVar225[4] -
                                              (0xff < (short)local_278._4_2_),uVar200));
                  uVar202 = CONCAT15((0 < (short)local_278._10_2_) *
                                     ((short)local_278._10_2_ < 0x100) * auVar225[10] -
                                     (0xff < (short)local_278._10_2_),
                                     CONCAT14((0 < (short)local_278._8_2_) *
                                              ((short)local_278._8_2_ < 0x100) * auVar225[8] -
                                              (0xff < (short)local_278._8_2_),uVar201));
                  uVar203 = CONCAT17((0 < (short)local_278._14_2_) *
                                     ((short)local_278._14_2_ < 0x100) * auVar225[0xe] -
                                     (0xff < (short)local_278._14_2_),
                                     CONCAT16((0 < (short)local_278._12_2_) *
                                              ((short)local_278._12_2_ < 0x100) * auVar225[0xc] -
                                              (0xff < (short)local_278._12_2_),uVar202));
                  auVar204._0_10_ =
                       CONCAT19((0 < local_158._2_2_) * (local_158._2_2_ < 0x100) *
                                (char)((ulong)local_158 >> 0x10) - (0xff < local_158._2_2_),
                                CONCAT18((0 < (short)local_158) * ((short)local_158 < 0x100) *
                                         (char)local_158 - (0xff < (short)local_158),uVar203));
                  auVar204[10] = (0 < local_158._4_2_) * (local_158._4_2_ < 0x100) *
                                 (char)((ulong)local_158 >> 0x20) - (0xff < local_158._4_2_);
                  auVar204[0xb] =
                       (0 < local_158._6_2_) * (local_158._6_2_ < 0x100) *
                       (char)((ulong)local_158 >> 0x30) - (0xff < local_158._6_2_);
                  auVar206[0xc] =
                       (0 < (short)uStack_150) * ((short)uStack_150 < 0x100) * (char)uStack_150 -
                       (0xff < (short)uStack_150);
                  auVar206._0_12_ = auVar204;
                  auVar206[0xd] =
                       (0 < uStack_150._2_2_) * (uStack_150._2_2_ < 0x100) *
                       (char)((ulong)uStack_150 >> 0x10) - (0xff < uStack_150._2_2_);
                  auVar220[0xe] =
                       (0 < uStack_150._4_2_) * (uStack_150._4_2_ < 0x100) *
                       (char)((ulong)uStack_150 >> 0x20) - (0xff < uStack_150._4_2_);
                  auVar220._0_14_ = auVar206;
                  auVar220[0xf] =
                       (0 < uStack_150._6_2_) * (uStack_150._6_2_ < 0x100) *
                       (char)((ulong)uStack_150 >> 0x30) - (0xff < uStack_150._6_2_);
                  local_288._0_2_ = (short)uVar150;
                  local_288._2_2_ = (short)((ulong)uVar150 >> 0x10);
                  local_288._4_2_ = (short)((ulong)uVar150 >> 0x20);
                  local_288._6_2_ = (short)((ulong)uVar150 >> 0x30);
                  sStack_280 = (short)extraout_XMM0_Qb;
                  sStack_27e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
                  sStack_27c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
                  sStack_27a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
                  uVar177 = CONCAT11((0 < local_288._2_2_) * (local_288._2_2_ < 0x100) *
                                     (char)((ulong)uVar150 >> 0x10) - (0xff < local_288._2_2_),
                                     (0 < (short)local_288) * ((short)local_288 < 0x100) *
                                     (char)uVar150 - (0xff < (short)local_288));
                  uVar179 = CONCAT13((0 < local_288._6_2_) * (local_288._6_2_ < 0x100) *
                                     (char)((ulong)uVar150 >> 0x30) - (0xff < local_288._6_2_),
                                     CONCAT12((0 < local_288._4_2_) * (local_288._4_2_ < 0x100) *
                                              (char)((ulong)uVar150 >> 0x20) -
                                              (0xff < local_288._4_2_),uVar177));
                  uVar180 = CONCAT15((0 < sStack_27e) * (sStack_27e < 0x100) *
                                     (char)((ulong)extraout_XMM0_Qb >> 0x10) - (0xff < sStack_27e),
                                     CONCAT14((0 < sStack_280) * (sStack_280 < 0x100) *
                                              (char)extraout_XMM0_Qb - (0xff < sStack_280),uVar179))
                  ;
                  uVar150 = CONCAT17((0 < sStack_27a) * (sStack_27a < 0x100) *
                                     (char)((ulong)extraout_XMM0_Qb >> 0x30) - (0xff < sStack_27a),
                                     CONCAT16((0 < sStack_27c) * (sStack_27c < 0x100) *
                                              (char)((ulong)extraout_XMM0_Qb >> 0x20) -
                                              (0xff < sStack_27c),uVar180));
                  auVar181._0_10_ =
                       CONCAT19((0 < (short)local_168._2_2_) * ((short)local_168._2_2_ < 0x100) *
                                local_168[2] - (0xff < (short)local_168._2_2_),
                                CONCAT18((0 < (short)local_168._0_2_) *
                                         ((short)local_168._0_2_ < 0x100) * local_168[0] -
                                         (0xff < (short)local_168._0_2_),uVar150));
                  auVar181[10] = (0 < (short)local_168._4_2_) * ((short)local_168._4_2_ < 0x100) *
                                 local_168[4] - (0xff < (short)local_168._4_2_);
                  auVar181[0xb] =
                       (0 < (short)local_168._6_2_) * ((short)local_168._6_2_ < 0x100) *
                       local_168[6] - (0xff < (short)local_168._6_2_);
                  auVar182[0xc] =
                       (0 < (short)local_168._8_2_) * ((short)local_168._8_2_ < 0x100) *
                       local_168[8] - (0xff < (short)local_168._8_2_);
                  auVar182._0_12_ = auVar181;
                  auVar182[0xd] =
                       (0 < (short)local_168._10_2_) * ((short)local_168._10_2_ < 0x100) *
                       local_168[10] - (0xff < (short)local_168._10_2_);
                  auVar191[0xe] =
                       (0 < (short)local_168._12_2_) * ((short)local_168._12_2_ < 0x100) *
                       local_168[0xc] - (0xff < (short)local_168._12_2_);
                  auVar191._0_14_ = auVar182;
                  auVar191[0xf] =
                       (0 < (short)local_168._14_2_) * ((short)local_168._14_2_ < 0x100) *
                       local_168[0xe] - (0xff < (short)local_168._14_2_);
                  local_2c8 = (short)uVar151;
                  sStack_2c6 = (short)((ulong)uVar151 >> 0x10);
                  sStack_2c4 = (short)((ulong)uVar151 >> 0x20);
                  sStack_2c2 = (short)((ulong)uVar151 >> 0x30);
                  sStack_2c0 = (short)extraout_XMM0_Qb_01;
                  sStack_2be = (short)((ulong)extraout_XMM0_Qb_01 >> 0x10);
                  sStack_2bc = (short)((ulong)extraout_XMM0_Qb_01 >> 0x20);
                  sStack_2ba = (short)((ulong)extraout_XMM0_Qb_01 >> 0x30);
                  cVar13 = (char)((ulong)uVar151 >> 0x10);
                  uVar222 = CONCAT11((0 < sStack_2c6) * (sStack_2c6 < 0x100) * cVar13 -
                                     (0xff < sStack_2c6),
                                     (0 < local_2c8) * (local_2c8 < 0x100) * (char)uVar151 -
                                     (0xff < local_2c8));
                  cVar61 = (char)((ulong)uVar151 >> 0x20);
                  cVar62 = (char)((ulong)uVar151 >> 0x30);
                  auVar233._0_4_ =
                       CONCAT13((0 < sStack_2c2) * (sStack_2c2 < 0x100) * cVar62 -
                                (0xff < sStack_2c2),
                                CONCAT12((0 < sStack_2c4) * (sStack_2c4 < 0x100) * cVar61 -
                                         (0xff < sStack_2c4),uVar222));
                  auVar234._0_6_ =
                       CONCAT15((0 < sStack_2be) * (sStack_2be < 0x100) *
                                (char)((ulong)extraout_XMM0_Qb_01 >> 0x10) - (0xff < sStack_2be),
                                CONCAT14((0 < sStack_2c0) * (sStack_2c0 < 0x100) *
                                         (char)extraout_XMM0_Qb_01 - (0xff < sStack_2c0),
                                         auVar233._0_4_));
                  auVar235._0_8_ =
                       CONCAT17((0 < sStack_2ba) * (sStack_2ba < 0x100) *
                                (char)((ulong)extraout_XMM0_Qb_01 >> 0x30) - (0xff < sStack_2ba),
                                CONCAT16((0 < sStack_2bc) * (sStack_2bc < 0x100) *
                                         (char)((ulong)extraout_XMM0_Qb_01 >> 0x20) -
                                         (0xff < sStack_2bc),auVar234._0_6_));
                  auVar236._0_10_ =
                       CONCAT19((0 < sStack_2c6) * (sStack_2c6 < 0x100) * cVar13 -
                                (0xff < sStack_2c6),
                                CONCAT18((0 < local_2c8) * (local_2c8 < 0x100) * (char)uVar151 -
                                         (0xff < local_2c8),auVar235._0_8_));
                  auVar237[10] = (0 < sStack_2c4) * (sStack_2c4 < 0x100) * cVar61 -
                                 (0xff < sStack_2c4);
                  auVar237._0_10_ = auVar236._0_10_;
                  auVar237[0xb] =
                       (0 < sStack_2c2) * (sStack_2c2 < 0x100) * cVar62 - (0xff < sStack_2c2);
                  sVar30 = (short)uVar152;
                  sVar43 = (short)((ulong)uVar152 >> 0x10);
                  uVar145 = CONCAT11((0 < sVar43) * (sVar43 < 0x100) *
                                     (char)((ulong)uVar152 >> 0x10) - (0xff < sVar43),
                                     (0 < sVar30) * (sVar30 < 0x100) * (char)uVar152 -
                                     (0xff < sVar30));
                  sVar30 = (short)((ulong)uVar152 >> 0x20);
                  sVar43 = (short)((ulong)uVar152 >> 0x30);
                  uVar148 = CONCAT13((0 < sVar43) * (sVar43 < 0x100) *
                                     (char)((ulong)uVar152 >> 0x30) - (0xff < sVar43),
                                     CONCAT12((0 < sVar30) * (sVar30 < 0x100) *
                                              (char)((ulong)uVar152 >> 0x20) - (0xff < sVar30),
                                              uVar145));
                  sVar30 = (short)extraout_XMM0_Qb_02;
                  sVar43 = (short)((ulong)extraout_XMM0_Qb_02 >> 0x10);
                  uVar149 = CONCAT15((0 < sVar43) * (sVar43 < 0x100) *
                                     (char)((ulong)extraout_XMM0_Qb_02 >> 0x10) - (0xff < sVar43),
                                     CONCAT14((0 < sVar30) * (sVar30 < 0x100) *
                                              (char)extraout_XMM0_Qb_02 - (0xff < sVar30),uVar148));
                  sVar30 = (short)((ulong)extraout_XMM0_Qb_02 >> 0x20);
                  sVar43 = (short)((ulong)extraout_XMM0_Qb_02 >> 0x30);
                  auVar237._12_2_ = (short)((ulong)auVar235._0_8_ >> 0x30);
                  auVar237._14_2_ =
                       (short)(CONCAT17((0 < sVar43) * (sVar43 < 0x100) *
                                        (char)((ulong)extraout_XMM0_Qb_02 >> 0x30) - (0xff < sVar43)
                                        ,CONCAT16((0 < sVar30) * (sVar30 < 0x100) *
                                                  (char)((ulong)extraout_XMM0_Qb_02 >> 0x20) -
                                                  (0xff < sVar30),uVar149)) >> 0x30);
                  auVar236._12_4_ = auVar237._12_4_;
                  auVar236._10_2_ = (short)((uint6)uVar149 >> 0x20);
                  auVar235._10_6_ = auVar236._10_6_;
                  auVar235._8_2_ = (short)((uint6)auVar234._0_6_ >> 0x20);
                  auVar234._8_8_ = auVar235._8_8_;
                  auVar234._6_2_ = (short)((uint)uVar148 >> 0x10);
                  auVar233._6_10_ = auVar234._6_10_;
                  auVar233._4_2_ = (short)((uint)auVar233._0_4_ >> 0x10);
                  uVar224 = CONCAT22(uVar145,uVar222);
                  auVar165._12_2_ = (short)((ulong)uVar203 >> 0x30);
                  auVar165._0_12_ = auVar204;
                  auVar165._14_2_ = (short)((ulong)uVar150 >> 0x30);
                  auVar164._12_4_ = auVar165._12_4_;
                  auVar164._10_2_ = (short)((uint6)uVar180 >> 0x20);
                  auVar164._0_10_ = auVar204._0_10_;
                  auVar163._10_6_ = auVar164._10_6_;
                  auVar163._8_2_ = (short)((uint6)uVar202 >> 0x20);
                  auVar163._0_8_ = uVar203;
                  auVar162._8_8_ = auVar163._8_8_;
                  auVar162._6_2_ = (short)((uint)uVar179 >> 0x10);
                  auVar162._0_6_ = uVar202;
                  auVar161._6_10_ = auVar162._6_10_;
                  auVar161._4_2_ = (short)((uint)uVar201 >> 0x10);
                  auVar161._0_4_ = uVar201;
                  auVar160._4_12_ = auVar161._4_12_;
                  auVar160._0_4_ = CONCAT22(uVar177,uVar200);
                  uVar148 = CONCAT22((short)((unkuint10)auVar181._0_10_ >> 0x40),
                                     (short)((unkuint10)auVar204._0_10_ >> 0x40));
                  auVar205._0_8_ = CONCAT26(auVar181._10_2_,CONCAT24(auVar204._10_2_,uVar148));
                  auVar205._8_2_ = auVar206._12_2_;
                  auVar205._10_2_ = auVar182._12_2_;
                  auVar221._12_2_ = auVar220._14_2_;
                  auVar221._0_12_ = auVar205;
                  auVar221._14_2_ = auVar191._14_2_;
                  auVar192._0_8_ = auVar160._0_8_;
                  auVar192._8_4_ = auVar161._4_4_;
                  auVar192._12_4_ = (int)((ulong)auVar205._0_8_ >> 0x20);
                  *puVar142 = CONCAT44(uVar148,auVar160._0_4_);
                  *(undefined4 *)(puVar142 + 1) = uVar224;
                  *(undefined4 *)((long)puVar142 + 0xc) = uVar224;
                  puVar1 = (undefined8 *)((long)puVar142 + lVar129);
                  *puVar1 = auVar192._8_8_;
                  *(int *)(puVar1 + 2) = auVar233._4_4_;
                  *(int *)((long)puVar1 + 0x14) = auVar233._4_4_;
                  puVar2 = (undefined4 *)((long)puVar142 + lVar129 * 2);
                  *puVar2 = auVar163._8_4_;
                  puVar2[1] = auVar205._8_4_;
                  puVar2[2] = auVar235._8_4_;
                  puVar2[3] = auVar235._8_4_;
                  *(undefined4 *)((long)puVar142 + lVar111 + 8) = auVar164._12_4_;
                  *(int *)((long)puVar142 + lVar111 + 0xc) = auVar221._12_4_;
                  *(undefined4 *)((long)puVar142 + lVar111 + 0x10) = auVar236._12_4_;
                  *(undefined4 *)((long)puVar142 + lVar111 + 0x14) = auVar236._12_4_;
                  local_228[0] = CONCAT44(uStack_1e4,local_1e8);
                  local_228[1] = uStack_1e0;
                  local_218 = local_1d8;
                  uStack_216 = uStack_1d6;
                  uStack_214 = uStack_1d4;
                  uStack_212 = uStack_1d2;
                  uStack_210 = uStack_1d0;
                  local_208[0] = local_1c8;
                  local_208[1] = uStack_1c4;
                  local_208[2] = uStack_1c0;
                  local_208[3] = uStack_1bc;
                  local_1f8 = (undefined2)local_1b8;
                  uStack_1f6 = (undefined2)((ulong)local_1b8 >> 0x10);
                  uStack_1f4 = (undefined2)((ulong)local_1b8 >> 0x20);
                  uStack_1f2 = (undefined2)((ulong)local_1b8 >> 0x30);
                  uStack_1f0 = (undefined4)uStack_1b0;
                  uStack_1ec = uStack_1b0._4_4_;
                  puVar142 = (undefined8 *)((long)puVar142 + 0xc);
                  iVar136 = iVar136 + 6;
                } while (iVar136 != 0);
                puVar141 = (ulong *)((long)puVar141 +
                                    (long)(((iVar137 >> 1) - (iVar137 >> 0x1f)) + iVar123 * 8));
                puVar142 = (undefined8 *)((long)puVar142 + (long)(iVar109 * 3) + 4);
                local_238 = local_238 - 8;
              } while (local_238 != 0);
              iVar123 = ((iVar140 + 5) / 6) * 6;
              uVar107 = iVar119 + 7U & 0xfffffff8;
              iVar109 = iVar109 * iVar123;
              iVar119 = (int)((ulong)((long)(iVar109 * 2) * 0x55555555) >> 0x20) + iVar109 * -2;
              lVar130 = local_e0 + lVar129 * 4;
              puVar142 = __ptr;
              do {
                local_228[0] = *puVar142;
                local_228[1] = puVar142[1];
                uVar150 = *(undefined8 *)((long)puVar142 + lVar129);
                uStack_210 = ((undefined8 *)((long)puVar142 + lVar129))[1];
                local_218 = (undefined2)uVar150;
                uStack_216 = (undefined2)((ulong)uVar150 >> 0x10);
                uStack_214 = (undefined2)((ulong)uVar150 >> 0x20);
                uStack_212 = (undefined2)((ulong)uVar150 >> 0x30);
                puVar1 = (undefined8 *)((long)puVar142 + lVar129 * 2);
                uVar150 = *puVar1;
                uVar151 = puVar1[1];
                local_208[0] = (undefined4)uVar150;
                local_208[1] = (undefined4)((ulong)uVar150 >> 0x20);
                local_208[2] = (undefined4)uVar151;
                local_208[3] = (undefined4)((ulong)uVar151 >> 0x20);
                uVar150 = *(undefined8 *)((long)puVar142 + lVar111);
                uVar151 = ((undefined8 *)((long)puVar142 + lVar111))[1];
                local_1f8 = (undefined2)uVar150;
                uStack_1f6 = (undefined2)((ulong)uVar150 >> 0x10);
                uStack_1f4 = (undefined2)((ulong)uVar150 >> 0x20);
                uStack_1f2 = (undefined2)((ulong)uVar150 >> 0x30);
                uStack_1f0 = (undefined4)uVar151;
                uStack_1ec = (undefined4)((ulong)uVar151 >> 0x20);
                iVar137 = ((iVar140 + 5) % 6 - iVar140) + -5;
                do {
                  puVar1 = (undefined8 *)((long)puVar142 + lVar129 * 4);
                  uVar150 = *puVar1;
                  uStack_1e0 = puVar1[1];
                  puVar1 = (undefined8 *)((long)puVar142 + lVar129 * 5);
                  uVar151 = *puVar1;
                  uStack_1d0 = puVar1[1];
                  puVar1 = (undefined8 *)((long)puVar142 + lVar130);
                  uVar152 = *puVar1;
                  uVar203 = puVar1[1];
                  puVar1 = (undefined8 *)((long)puVar142 + lVar129 * 7);
                  local_1b8 = *puVar1;
                  uStack_1b0 = puVar1[1];
                  puVar142 = (undefined8 *)((long)puVar142 + lVar129 * 4);
                  local_1e8 = (undefined4)uVar150;
                  uStack_1e4 = (undefined4)((ulong)uVar150 >> 0x20);
                  local_1d8 = (undefined2)uVar151;
                  uStack_1d6 = (undefined2)((ulong)uVar151 >> 0x10);
                  uStack_1d4 = (undefined2)((ulong)uVar151 >> 0x20);
                  uStack_1d2 = (undefined2)((ulong)uVar151 >> 0x30);
                  local_1c8 = (undefined4)uVar152;
                  uStack_1c4 = (undefined4)((ulong)uVar152 >> 0x20);
                  uStack_1c0 = (undefined4)uVar203;
                  uStack_1bc = (undefined4)((ulong)uVar203 >> 0x20);
                  auVar71._8_8_ = local_228[1];
                  auVar71._0_8_ = local_228[0];
                  auVar73._2_2_ = uStack_216;
                  auVar73._0_2_ = local_218;
                  auVar73._4_2_ = uStack_214;
                  auVar73._6_2_ = uStack_212;
                  auVar73._8_8_ = uStack_210;
                  auVar76._4_4_ = local_208[1];
                  auVar76._0_4_ = local_208[0];
                  auVar76._8_4_ = local_208[2];
                  auVar76._12_4_ = local_208[3];
                  auVar80._2_2_ = uStack_1f6;
                  auVar80._0_2_ = local_1f8;
                  auVar80._4_2_ = uStack_1f4;
                  auVar80._6_2_ = uStack_1f2;
                  auVar80._8_4_ = uStack_1f0;
                  auVar80._12_4_ = uStack_1ec;
                  auVar166 = pmaddubsw(auVar71,local_2d8);
                  auVar208 = pmaddubsw(auVar73,local_328);
                  auVar153 = pmaddubsw(auVar76,local_2e8);
                  auVar207 = pmaddubsw(auVar80,local_308);
                  auVar166 = paddsw(auVar207,auVar166);
                  auVar166 = paddsw(auVar166,auVar208);
                  auVar166 = paddsw(auVar166,auVar153);
                  auVar153 = pmaddubsw(auVar73,_DAT_004c9fd0);
                  auVar166 = paddsw(auVar153,auVar166);
                  auVar166 = paddsw(auVar166,_DAT_0050f2b0);
                  auVar166 = psraw(auVar166,7);
                  sVar30 = auVar166._0_2_;
                  sVar43 = auVar166._2_2_;
                  sVar31 = auVar166._4_2_;
                  sVar32 = auVar166._6_2_;
                  sVar33 = auVar166._8_2_;
                  sVar34 = auVar166._10_2_;
                  sVar35 = auVar166._12_2_;
                  sVar36 = auVar166._14_2_;
                  local_278[1] = (0 < sVar43) * (sVar43 < 0x100) * auVar166[2] - (0xff < sVar43);
                  local_278[0] = (0 < sVar30) * (sVar30 < 0x100) * auVar166[0] - (0xff < sVar30);
                  local_278[2] = (0 < sVar31) * (sVar31 < 0x100) * auVar166[4] - (0xff < sVar31);
                  local_278[3] = (0 < sVar32) * (sVar32 < 0x100) * auVar166[6] - (0xff < sVar32);
                  local_278[4] = (0 < sVar33) * (sVar33 < 0x100) * auVar166[8] - (0xff < sVar33);
                  local_278[5] = (0 < sVar34) * (sVar34 < 0x100) * auVar166[10] - (0xff < sVar34);
                  local_278[6] = (0 < sVar35) * (sVar35 < 0x100) * auVar166[0xc] - (0xff < sVar35);
                  local_278[7] = (0 < sVar36) * (sVar36 < 0x100) * auVar166[0xe] - (0xff < sVar36);
                  local_278[8] = (0 < sVar30) * (sVar30 < 0x100) * auVar166[0] - (0xff < sVar30);
                  local_278[9] = (0 < sVar43) * (sVar43 < 0x100) * auVar166[2] - (0xff < sVar43);
                  local_278[10] = (0 < sVar31) * (sVar31 < 0x100) * auVar166[4] - (0xff < sVar31);
                  local_278[0xb] = (0 < sVar32) * (sVar32 < 0x100) * auVar166[6] - (0xff < sVar32);
                  local_278[0xc] = (0 < sVar33) * (sVar33 < 0x100) * auVar166[8] - (0xff < sVar33);
                  local_278[0xd] = (0 < sVar34) * (sVar34 < 0x100) * auVar166[10] - (0xff < sVar34);
                  local_278[0xe] = (0 < sVar35) * (sVar35 < 0x100) * auVar166[0xc] - (0xff < sVar35)
                  ;
                  local_278[0xf] = (0 < sVar36) * (sVar36 < 0x100) * auVar166[0xe] - (0xff < sVar36)
                  ;
                  uVar150 = (*pcVar11)(local_118,local_88);
                  local_158 = (uint8_t *)(*pcVar12)(local_128,local_d8);
                  auVar77._4_4_ = local_208[1];
                  auVar77._0_4_ = local_208[0];
                  auVar77._8_4_ = local_208[2];
                  auVar77._12_4_ = local_208[3];
                  auVar81._2_2_ = uStack_1f6;
                  auVar81._0_2_ = local_1f8;
                  auVar81._4_2_ = uStack_1f4;
                  auVar81._6_2_ = uStack_1f2;
                  auVar81._8_4_ = uStack_1f0;
                  auVar81._12_4_ = uStack_1ec;
                  auVar83._4_4_ = uStack_1e4;
                  auVar83._0_4_ = local_1e8;
                  auVar83._8_8_ = uStack_1e0;
                  auVar85._2_2_ = uStack_1d6;
                  auVar85._0_2_ = local_1d8;
                  auVar85._4_2_ = uStack_1d4;
                  auVar85._6_2_ = uStack_1d2;
                  auVar85._8_8_ = uStack_1d0;
                  auVar166 = pmaddubsw(auVar77,local_2d8);
                  auVar208 = pmaddubsw(auVar81,local_328);
                  auVar153 = pmaddubsw(auVar83,local_2e8);
                  auVar207 = pmaddubsw(auVar85,local_308);
                  auVar166 = paddsw(auVar207,auVar166);
                  auVar166 = paddsw(auVar166,auVar208);
                  auVar166 = paddsw(auVar166,auVar153);
                  auVar153 = pmaddubsw(auVar81,_DAT_004c9fd0);
                  auVar166 = paddsw(auVar153,auVar166);
                  auVar166 = paddsw(auVar166,_DAT_0050f2b0);
                  auVar166 = psraw(auVar166,7);
                  sVar30 = auVar166._0_2_;
                  sVar43 = auVar166._2_2_;
                  sVar31 = auVar166._4_2_;
                  sVar32 = auVar166._6_2_;
                  sVar33 = auVar166._8_2_;
                  sVar34 = auVar166._10_2_;
                  sVar35 = auVar166._12_2_;
                  sVar36 = auVar166._14_2_;
                  local_168[1] = (0 < sVar43) * (sVar43 < 0x100) * auVar166[2] - (0xff < sVar43);
                  local_168[0] = (0 < sVar30) * (sVar30 < 0x100) * auVar166[0] - (0xff < sVar30);
                  local_168[2] = (0 < sVar31) * (sVar31 < 0x100) * auVar166[4] - (0xff < sVar31);
                  local_168[3] = (0 < sVar32) * (sVar32 < 0x100) * auVar166[6] - (0xff < sVar32);
                  local_168[4] = (0 < sVar33) * (sVar33 < 0x100) * auVar166[8] - (0xff < sVar33);
                  local_168[5] = (0 < sVar34) * (sVar34 < 0x100) * auVar166[10] - (0xff < sVar34);
                  local_168[6] = (0 < sVar35) * (sVar35 < 0x100) * auVar166[0xc] - (0xff < sVar35);
                  local_168[7] = (0 < sVar36) * (sVar36 < 0x100) * auVar166[0xe] - (0xff < sVar36);
                  local_168[8] = (0 < sVar30) * (sVar30 < 0x100) * auVar166[0] - (0xff < sVar30);
                  local_168[9] = (0 < sVar43) * (sVar43 < 0x100) * auVar166[2] - (0xff < sVar43);
                  local_168[10] = (0 < sVar31) * (sVar31 < 0x100) * auVar166[4] - (0xff < sVar31);
                  local_168[0xb] = (0 < sVar32) * (sVar32 < 0x100) * auVar166[6] - (0xff < sVar32);
                  local_168[0xc] = (0 < sVar33) * (sVar33 < 0x100) * auVar166[8] - (0xff < sVar33);
                  local_168[0xd] = (0 < sVar34) * (sVar34 < 0x100) * auVar166[10] - (0xff < sVar34);
                  local_168[0xe] = (0 < sVar35) * (sVar35 < 0x100) * auVar166[0xc] - (0xff < sVar35)
                  ;
                  local_168[0xf] = (0 < sVar36) * (sVar36 < 0x100) * auVar166[0xe] - (0xff < sVar36)
                  ;
                  uStack_150 = extraout_XMM0_Qb_04;
                  uVar151 = (*pcVar11)(local_120,local_88);
                  uVar152 = (*pcVar12)(local_130,local_d8);
                  local_2c8 = (short)uVar151;
                  sStack_2c6 = (short)((ulong)uVar151 >> 0x10);
                  sStack_2c4 = (short)((ulong)uVar151 >> 0x20);
                  sStack_2c2 = (short)((ulong)uVar151 >> 0x30);
                  sStack_2c0 = (short)extraout_XMM0_Qb_05;
                  sStack_2be = (short)((ulong)extraout_XMM0_Qb_05 >> 0x10);
                  sStack_2bc = (short)((ulong)extraout_XMM0_Qb_05 >> 0x20);
                  sStack_2ba = (short)((ulong)extraout_XMM0_Qb_05 >> 0x30);
                  *(undefined8 *)puVar115 = local_278._0_8_;
                  local_288._0_2_ = (short)uVar150;
                  local_288._2_2_ = (short)((ulong)uVar150 >> 0x10);
                  local_288._4_2_ = (short)((ulong)uVar150 >> 0x20);
                  local_288._6_2_ = (short)((ulong)uVar150 >> 0x30);
                  sStack_280 = (short)extraout_XMM0_Qb_03;
                  sStack_27e = (short)((ulong)extraout_XMM0_Qb_03 >> 0x10);
                  sStack_27c = (short)((ulong)extraout_XMM0_Qb_03 >> 0x20);
                  sStack_27a = (short)((ulong)extraout_XMM0_Qb_03 >> 0x30);
                  *(ulong *)(puVar115 + iVar108) =
                       CONCAT17((0 < sStack_27a) * (sStack_27a < 0x100) *
                                (char)((ulong)extraout_XMM0_Qb_03 >> 0x30) - (0xff < sStack_27a),
                                CONCAT16((0 < sStack_27c) * (sStack_27c < 0x100) *
                                         (char)((ulong)extraout_XMM0_Qb_03 >> 0x20) -
                                         (0xff < sStack_27c),
                                         CONCAT15((0 < sStack_27e) * (sStack_27e < 0x100) *
                                                  (char)((ulong)extraout_XMM0_Qb_03 >> 0x10) -
                                                  (0xff < sStack_27e),
                                                  CONCAT14((0 < sStack_280) * (sStack_280 < 0x100) *
                                                           (char)extraout_XMM0_Qb_03 -
                                                           (0xff < sStack_280),
                                                           CONCAT13((0 < local_288._6_2_) *
                                                                    (local_288._6_2_ < 0x100) *
                                                                    (char)((ulong)uVar150 >> 0x30) -
                                                                    (0xff < local_288._6_2_),
                                                                    CONCAT12((0 < local_288._4_2_) *
                                                                             (local_288._4_2_ <
                                                                             0x100) * (char)((ulong)
                                                  uVar150 >> 0x20) - (0xff < local_288._4_2_),
                                                  CONCAT11((0 < local_288._2_2_) *
                                                           (local_288._2_2_ < 0x100) *
                                                           (char)((ulong)uVar150 >> 0x10) -
                                                           (0xff < local_288._2_2_),
                                                           (0 < (short)local_288) *
                                                           ((short)local_288 < 0x100) *
                                                           (char)uVar150 - (0xff < (short)local_288)
                                                          )))))));
                  *(ulong *)(puVar115 + iVar108 * 2) =
                       CONCAT17((0 < uStack_150._6_2_) * (uStack_150._6_2_ < 0x100) *
                                (char)((ulong)uStack_150 >> 0x30) - (0xff < uStack_150._6_2_),
                                CONCAT16((0 < uStack_150._4_2_) * (uStack_150._4_2_ < 0x100) *
                                         (char)((ulong)uStack_150 >> 0x20) -
                                         (0xff < uStack_150._4_2_),
                                         CONCAT15((0 < uStack_150._2_2_) *
                                                  (uStack_150._2_2_ < 0x100) *
                                                  (char)((ulong)uStack_150 >> 0x10) -
                                                  (0xff < uStack_150._2_2_),
                                                  CONCAT14((0 < (short)uStack_150) *
                                                           ((short)uStack_150 < 0x100) *
                                                           (char)uStack_150 -
                                                           (0xff < (short)uStack_150),
                                                           CONCAT13((0 < local_158._6_2_) *
                                                                    (local_158._6_2_ < 0x100) *
                                                                    (char)((ulong)local_158 >> 0x30)
                                                                    - (0xff < local_158._6_2_),
                                                                    CONCAT12((0 < local_158._4_2_) *
                                                                             (local_158._4_2_ <
                                                                             0x100) * (char)((ulong)
                                                  local_158 >> 0x20) - (0xff < local_158._4_2_),
                                                  CONCAT11((0 < local_158._2_2_) *
                                                           (local_158._2_2_ < 0x100) *
                                                           (char)((ulong)local_158 >> 0x10) -
                                                           (0xff < local_158._2_2_),
                                                           (0 < (short)local_158) *
                                                           ((short)local_158 < 0x100) *
                                                           (char)local_158 -
                                                           (0xff < (short)local_158))))))));
                  *(undefined8 *)(puVar115 + iVar108 * 3) = local_168._0_8_;
                  *(ulong *)(puVar115 + iVar108 * 4) =
                       CONCAT17((0 < sStack_2ba) * (sStack_2ba < 0x100) *
                                (char)((ulong)extraout_XMM0_Qb_05 >> 0x30) - (0xff < sStack_2ba),
                                CONCAT16((0 < sStack_2bc) * (sStack_2bc < 0x100) *
                                         (char)((ulong)extraout_XMM0_Qb_05 >> 0x20) -
                                         (0xff < sStack_2bc),
                                         CONCAT15((0 < sStack_2be) * (sStack_2be < 0x100) *
                                                  (char)((ulong)extraout_XMM0_Qb_05 >> 0x10) -
                                                  (0xff < sStack_2be),
                                                  CONCAT14((0 < sStack_2c0) * (sStack_2c0 < 0x100) *
                                                           (char)extraout_XMM0_Qb_05 -
                                                           (0xff < sStack_2c0),
                                                           CONCAT13((0 < sStack_2c2) *
                                                                    (sStack_2c2 < 0x100) *
                                                                    (char)((ulong)uVar151 >> 0x30) -
                                                                    (0xff < sStack_2c2),
                                                                    CONCAT12((0 < sStack_2c4) *
                                                                             (sStack_2c4 < 0x100) *
                                                                             (char)((ulong)uVar151
                                                                                   >> 0x20) -
                                                                             (0xff < sStack_2c4),
                                                                             CONCAT11((0 < 
                                                  sStack_2c6) * (sStack_2c6 < 0x100) *
                                                  (char)((ulong)uVar151 >> 0x10) -
                                                  (0xff < sStack_2c6),
                                                  (0 < local_2c8) * (local_2c8 < 0x100) *
                                                  (char)uVar151 - (0xff < local_2c8))))))));
                  sVar30 = (short)uVar152;
                  sVar43 = (short)((ulong)uVar152 >> 0x10);
                  sVar31 = (short)((ulong)uVar152 >> 0x20);
                  sVar32 = (short)((ulong)uVar152 >> 0x30);
                  sVar33 = (short)extraout_XMM0_Qb_06;
                  sVar34 = (short)((ulong)extraout_XMM0_Qb_06 >> 0x10);
                  sVar35 = (short)((ulong)extraout_XMM0_Qb_06 >> 0x20);
                  sVar36 = (short)((ulong)extraout_XMM0_Qb_06 >> 0x30);
                  *(ulong *)(puVar115 + iVar108 * 5) =
                       CONCAT17((0 < sVar36) * (sVar36 < 0x100) *
                                (char)((ulong)extraout_XMM0_Qb_06 >> 0x30) - (0xff < sVar36),
                                CONCAT16((0 < sVar35) * (sVar35 < 0x100) *
                                         (char)((ulong)extraout_XMM0_Qb_06 >> 0x20) -
                                         (0xff < sVar35),
                                         CONCAT15((0 < sVar34) * (sVar34 < 0x100) *
                                                  (char)((ulong)extraout_XMM0_Qb_06 >> 0x10) -
                                                  (0xff < sVar34),
                                                  CONCAT14((0 < sVar33) * (sVar33 < 0x100) *
                                                           (char)extraout_XMM0_Qb_06 -
                                                           (0xff < sVar33),
                                                           CONCAT13((0 < sVar32) * (sVar32 < 0x100)
                                                                    * (char)((ulong)uVar152 >> 0x30)
                                                                    - (0xff < sVar32),
                                                                    CONCAT12((0 < sVar31) *
                                                                             (sVar31 < 0x100) *
                                                                             (char)((ulong)uVar152
                                                                                   >> 0x20) -
                                                                             (0xff < sVar31),
                                                                             CONCAT11((0 < sVar43) *
                                                                                      (sVar43 < 
                                                  0x100) * (char)((ulong)uVar152 >> 0x10) -
                                                  (0xff < sVar43),
                                                  (0 < sVar30) * (sVar30 < 0x100) * (char)uVar152 -
                                                  (0xff < sVar30))))))));
                  local_228[0] = CONCAT44(uStack_1e4,local_1e8);
                  local_228[1] = uStack_1e0;
                  local_218 = local_1d8;
                  uStack_216 = uStack_1d6;
                  uStack_214 = uStack_1d4;
                  uStack_212 = uStack_1d2;
                  uStack_210 = uStack_1d0;
                  local_208[0] = local_1c8;
                  local_208[1] = uStack_1c4;
                  local_208[2] = uStack_1c0;
                  local_208[3] = uStack_1bc;
                  local_1f8 = (undefined2)local_1b8;
                  uStack_1f6 = (undefined2)((ulong)local_1b8 >> 0x10);
                  uStack_1f4 = (undefined2)((ulong)local_1b8 >> 0x20);
                  uStack_1f2 = (undefined2)((ulong)local_1b8 >> 0x30);
                  uStack_1f0 = (undefined4)uStack_1b0;
                  uStack_1ec = (undefined4)((ulong)uStack_1b0 >> 0x20);
                  puVar115 = puVar115 + (long)iVar108 * 6;
                  iVar137 = iVar137 + 6;
                } while (iVar137 != 0);
                puVar142 = (undefined8 *)
                           ((long)puVar142 + (long)((iVar119 >> 1) - (iVar119 >> 0x1f)) + 0x10);
                puVar115 = puVar115 + (8 - (long)(iVar123 * iVar108));
                uVar107 = uVar107 - 8;
              } while (uVar107 != 0);
              free(__ptr);
              bVar144 = false;
              auVar166 = _DAT_0050f2b0;
            }
          }
          else {
            __ptr = (undefined8 *)
                    malloc((long)(int)(((src->field_2).field_0.y_crop_width * 8 + 8U & 0xfffffff0) +
                                       0x38 & 0xffffffc0));
            if (__ptr == (undefined8 *)0x0) {
              bVar144 = true;
              bVar143 = true;
              auVar166 = _DAT_0050f2b0;
            }
            else {
              puVar115 = src->store_buf_adr[uVar132 - 4];
              lVar129 = (long)*(int *)((long)src->store_buf_adr +
                                      ((ulong)((uint)bVar144 * 4) - 0x28));
              local_340 = dst->store_buf_adr[uVar132 - 4];
              lVar111 = (long)*(int *)((long)dst->store_buf_adr +
                                      ((ulong)((uint)bVar144 * 4) - 0x28));
              uVar107 = iVar123 + 7U & 0xfffffff8;
              auVar166 = *(undefined1 (*) [16])(pIVar113->filter_ptr + 0x40);
              auVar153 = pshufb(auVar166,_DAT_0050f310);
              auVar207 = pshufb(auVar166,_DAT_0050f360);
              auVar208 = pshufb(auVar166,_DAT_0050f330);
              auVar166 = pshufb(auVar166,_DAT_0050f370);
              local_288 = puVar115 + lVar129 * -3;
              lVar130 = 0;
              do {
                uVar110 = *(ulong *)(local_288 + lVar130 + -3);
                uVar150 = *(undefined8 *)(local_288 + lVar130 + -2);
                auVar257._8_6_ = 0;
                auVar257._0_8_ = uVar110;
                auVar257[0xe] = (char)(uVar110 >> 0x38);
                auVar257[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar256._14_2_ = auVar257._14_2_;
                auVar256._8_5_ = 0;
                auVar256._0_8_ = uVar110;
                auVar256[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar255._13_3_ = auVar256._13_3_;
                auVar255._8_4_ = 0;
                auVar255._0_8_ = uVar110;
                auVar255[0xc] = (char)(uVar110 >> 0x30);
                auVar254._12_4_ = auVar255._12_4_;
                auVar254._8_3_ = 0;
                auVar254._0_8_ = uVar110;
                auVar254[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar253._11_5_ = auVar254._11_5_;
                auVar253._8_2_ = 0;
                auVar253._0_8_ = uVar110;
                auVar253[10] = (char)(uVar110 >> 0x28);
                auVar252._10_6_ = auVar253._10_6_;
                auVar252[8] = 0;
                auVar252._0_8_ = uVar110;
                auVar252[9] = (char)((ulong)uVar150 >> 0x20);
                auVar251._9_7_ = auVar252._9_7_;
                auVar251[8] = (char)(uVar110 >> 0x20);
                auVar251._0_8_ = uVar110;
                auVar250._8_8_ = auVar251._8_8_;
                auVar250[7] = (char)((ulong)uVar150 >> 0x18);
                auVar250[6] = (char)(uVar110 >> 0x18);
                auVar250[5] = (char)((ulong)uVar150 >> 0x10);
                auVar250[4] = (char)(uVar110 >> 0x10);
                auVar250[3] = (char)((ulong)uVar150 >> 8);
                auVar250[2] = (char)(uVar110 >> 8);
                auVar250[0] = (undefined1)uVar110;
                auVar250[1] = (char)uVar150;
                uVar110 = *(ulong *)(local_288 + lVar130 + -1);
                uVar150 = *(undefined8 *)(local_288 + lVar130);
                auVar354._8_6_ = 0;
                auVar354._0_8_ = uVar110;
                auVar354[0xe] = (char)(uVar110 >> 0x38);
                auVar354[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar353._14_2_ = auVar354._14_2_;
                auVar353._8_5_ = 0;
                auVar353._0_8_ = uVar110;
                auVar353[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar352._13_3_ = auVar353._13_3_;
                auVar352._8_4_ = 0;
                auVar352._0_8_ = uVar110;
                auVar352[0xc] = (char)(uVar110 >> 0x30);
                auVar351._12_4_ = auVar352._12_4_;
                auVar351._8_3_ = 0;
                auVar351._0_8_ = uVar110;
                auVar351[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar350._11_5_ = auVar351._11_5_;
                auVar350._8_2_ = 0;
                auVar350._0_8_ = uVar110;
                auVar350[10] = (char)(uVar110 >> 0x28);
                auVar349._10_6_ = auVar350._10_6_;
                auVar349[8] = 0;
                auVar349._0_8_ = uVar110;
                auVar349[9] = (char)((ulong)uVar150 >> 0x20);
                auVar348._9_7_ = auVar349._9_7_;
                auVar348[8] = (char)(uVar110 >> 0x20);
                auVar348._0_8_ = uVar110;
                auVar347._8_8_ = auVar348._8_8_;
                auVar347[7] = (char)((ulong)uVar150 >> 0x18);
                auVar347[6] = (char)(uVar110 >> 0x18);
                auVar347[5] = (char)((ulong)uVar150 >> 0x10);
                auVar347[4] = (char)(uVar110 >> 0x10);
                auVar347[3] = (char)((ulong)uVar150 >> 8);
                auVar347[2] = (char)(uVar110 >> 8);
                auVar347[0] = (undefined1)uVar110;
                auVar347[1] = (char)uVar150;
                uVar110 = *(ulong *)(local_288 + lVar130 + 1);
                uVar150 = *(undefined8 *)(local_288 + lVar130 + 2);
                auVar457._8_6_ = 0;
                auVar457._0_8_ = uVar110;
                auVar457[0xe] = (char)(uVar110 >> 0x38);
                auVar457[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar456._14_2_ = auVar457._14_2_;
                auVar456._8_5_ = 0;
                auVar456._0_8_ = uVar110;
                auVar456[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar455._13_3_ = auVar456._13_3_;
                auVar455._8_4_ = 0;
                auVar455._0_8_ = uVar110;
                auVar455[0xc] = (char)(uVar110 >> 0x30);
                auVar454._12_4_ = auVar455._12_4_;
                auVar454._8_3_ = 0;
                auVar454._0_8_ = uVar110;
                auVar454[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar453._11_5_ = auVar454._11_5_;
                auVar453._8_2_ = 0;
                auVar453._0_8_ = uVar110;
                auVar453[10] = (char)(uVar110 >> 0x28);
                auVar452._10_6_ = auVar453._10_6_;
                auVar452[8] = 0;
                auVar452._0_8_ = uVar110;
                auVar452[9] = (char)((ulong)uVar150 >> 0x20);
                auVar451._9_7_ = auVar452._9_7_;
                auVar451[8] = (char)(uVar110 >> 0x20);
                auVar451._0_8_ = uVar110;
                auVar450._8_8_ = auVar451._8_8_;
                auVar450[7] = (char)((ulong)uVar150 >> 0x18);
                auVar450[6] = (char)(uVar110 >> 0x18);
                auVar450[5] = (char)((ulong)uVar150 >> 0x10);
                auVar450[4] = (char)(uVar110 >> 0x10);
                auVar450[3] = (char)((ulong)uVar150 >> 8);
                auVar450[2] = (char)(uVar110 >> 8);
                auVar450[0] = (undefined1)uVar110;
                auVar450[1] = (char)uVar150;
                uVar110 = *(ulong *)(local_288 + lVar130 + 3);
                uVar150 = *(undefined8 *)(local_288 + lVar130 + 4);
                auVar570._8_6_ = 0;
                auVar570._0_8_ = uVar110;
                auVar570[0xe] = (char)(uVar110 >> 0x38);
                auVar570[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar569._14_2_ = auVar570._14_2_;
                auVar569._8_5_ = 0;
                auVar569._0_8_ = uVar110;
                auVar569[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar568._13_3_ = auVar569._13_3_;
                auVar568._8_4_ = 0;
                auVar568._0_8_ = uVar110;
                auVar568[0xc] = (char)(uVar110 >> 0x30);
                auVar567._12_4_ = auVar568._12_4_;
                auVar567._8_3_ = 0;
                auVar567._0_8_ = uVar110;
                auVar567[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar566._11_5_ = auVar567._11_5_;
                auVar566._8_2_ = 0;
                auVar566._0_8_ = uVar110;
                auVar566[10] = (char)(uVar110 >> 0x28);
                auVar565._10_6_ = auVar566._10_6_;
                auVar565[8] = 0;
                auVar565._0_8_ = uVar110;
                auVar565[9] = (char)((ulong)uVar150 >> 0x20);
                auVar564._9_7_ = auVar565._9_7_;
                auVar564[8] = (char)(uVar110 >> 0x20);
                auVar564._0_8_ = uVar110;
                auVar563._8_8_ = auVar564._8_8_;
                auVar563[7] = (char)((ulong)uVar150 >> 0x18);
                auVar563[6] = (char)(uVar110 >> 0x18);
                auVar563[5] = (char)((ulong)uVar150 >> 0x10);
                auVar563[4] = (char)(uVar110 >> 0x10);
                auVar563[3] = (char)((ulong)uVar150 >> 8);
                auVar563[2] = (char)(uVar110 >> 8);
                auVar563[0] = (undefined1)uVar110;
                auVar563[1] = (char)uVar150;
                auVar225 = pmaddubsw(auVar250,auVar153);
                auVar709 = pmaddubsw(auVar347,auVar207);
                auVar710 = pmaddubsw(auVar450,auVar208);
                auVar729 = pmaddubsw(auVar563,auVar166);
                auVar571._0_2_ = auVar729._0_2_ + auVar709._0_2_;
                auVar571._2_2_ = auVar729._2_2_ + auVar709._2_2_;
                auVar571._4_2_ = auVar729._4_2_ + auVar709._4_2_;
                auVar571._6_2_ = auVar729._6_2_ + auVar709._6_2_;
                auVar571._8_2_ = auVar729._8_2_ + auVar709._8_2_;
                auVar571._10_2_ = auVar729._10_2_ + auVar709._10_2_;
                auVar571._12_2_ = auVar729._12_2_ + auVar709._12_2_;
                auVar571._14_2_ = auVar729._14_2_ + auVar709._14_2_;
                auVar458._0_2_ = auVar710._0_2_ + auVar225._0_2_ + 0x40;
                auVar458._2_2_ = auVar710._2_2_ + auVar225._2_2_ + 0x40;
                auVar458._4_2_ = auVar710._4_2_ + auVar225._4_2_ + 0x40;
                auVar458._6_2_ = auVar710._6_2_ + auVar225._6_2_ + 0x40;
                auVar458._8_2_ = auVar710._8_2_ + auVar225._8_2_ + 0x40;
                auVar458._10_2_ = auVar710._10_2_ + auVar225._10_2_ + 0x40;
                auVar458._12_2_ = auVar710._12_2_ + auVar225._12_2_ + 0x40;
                auVar458._14_2_ = auVar710._14_2_ + auVar225._14_2_ + 0x40;
                auVar225 = paddsw(auVar458,auVar571);
                auVar225 = psraw(auVar225,7);
                sVar30 = auVar225._0_2_;
                sVar43 = auVar225._2_2_;
                sVar31 = auVar225._4_2_;
                sVar32 = auVar225._6_2_;
                sVar33 = auVar225._8_2_;
                sVar34 = auVar225._10_2_;
                sVar35 = auVar225._12_2_;
                sVar36 = auVar225._14_2_;
                *(ulong *)((long)__ptr + lVar130) =
                     CONCAT17((0 < sVar36) * (sVar36 < 0x100) * auVar225[0xe] - (0xff < sVar36),
                              CONCAT16((0 < sVar35) * (sVar35 < 0x100) * auVar225[0xc] -
                                       (0xff < sVar35),
                                       CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar225[10] -
                                                (0xff < sVar34),
                                                CONCAT14((0 < sVar33) * (sVar33 < 0x100) *
                                                         auVar225[8] - (0xff < sVar33),
                                                         CONCAT13((0 < sVar32) * (sVar32 < 0x100) *
                                                                  auVar225[6] - (0xff < sVar32),
                                                                  CONCAT12((0 < sVar31) *
                                                                           (sVar31 < 0x100) *
                                                                           auVar225[4] -
                                                                           (0xff < sVar31),
                                                                           CONCAT11((0 < sVar43) *
                                                                                    (sVar43 < 0x100)
                                                                                    * auVar225[2] -
                                                                                    (0xff < sVar43),
                                                                                    (0 < sVar30) *
                                                                                    (sVar30 < 0x100)
                                                                                    * auVar225[0] -
                                                                                    (0xff < sVar30))
                                                                          ))))));
                lVar130 = lVar130 + 8;
              } while (uVar107 != (uint)lVar130);
              local_2d8._0_8_ = (long)__ptr + (long)(int)uVar107;
              lVar130 = (long)(int)(uVar107 * 4) + (long)__ptr;
              puVar133 = puVar115 + lVar129 * -2;
              lVar128 = 0;
              do {
                uVar110 = *(ulong *)(puVar133 + lVar128 + -3);
                uVar150 = *(undefined8 *)(puVar133 + lVar128 + -2);
                auVar265._8_6_ = 0;
                auVar265._0_8_ = uVar110;
                auVar265[0xe] = (char)(uVar110 >> 0x38);
                auVar265[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar264._14_2_ = auVar265._14_2_;
                auVar264._8_5_ = 0;
                auVar264._0_8_ = uVar110;
                auVar264[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar263._13_3_ = auVar264._13_3_;
                auVar263._8_4_ = 0;
                auVar263._0_8_ = uVar110;
                auVar263[0xc] = (char)(uVar110 >> 0x30);
                auVar262._12_4_ = auVar263._12_4_;
                auVar262._8_3_ = 0;
                auVar262._0_8_ = uVar110;
                auVar262[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar261._11_5_ = auVar262._11_5_;
                auVar261._8_2_ = 0;
                auVar261._0_8_ = uVar110;
                auVar261[10] = (char)(uVar110 >> 0x28);
                auVar260._10_6_ = auVar261._10_6_;
                auVar260[8] = 0;
                auVar260._0_8_ = uVar110;
                auVar260[9] = (char)((ulong)uVar150 >> 0x20);
                auVar259._9_7_ = auVar260._9_7_;
                auVar259[8] = (char)(uVar110 >> 0x20);
                auVar259._0_8_ = uVar110;
                auVar258._8_8_ = auVar259._8_8_;
                auVar258[7] = (char)((ulong)uVar150 >> 0x18);
                auVar258[6] = (char)(uVar110 >> 0x18);
                auVar258[5] = (char)((ulong)uVar150 >> 0x10);
                auVar258[4] = (char)(uVar110 >> 0x10);
                auVar258[3] = (char)((ulong)uVar150 >> 8);
                auVar258[2] = (char)(uVar110 >> 8);
                auVar258[0] = (undefined1)uVar110;
                auVar258[1] = (char)uVar150;
                uVar110 = *(ulong *)(puVar133 + lVar128 + -1);
                uVar150 = *(undefined8 *)(puVar133 + lVar128);
                auVar362._8_6_ = 0;
                auVar362._0_8_ = uVar110;
                auVar362[0xe] = (char)(uVar110 >> 0x38);
                auVar362[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar361._14_2_ = auVar362._14_2_;
                auVar361._8_5_ = 0;
                auVar361._0_8_ = uVar110;
                auVar361[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar360._13_3_ = auVar361._13_3_;
                auVar360._8_4_ = 0;
                auVar360._0_8_ = uVar110;
                auVar360[0xc] = (char)(uVar110 >> 0x30);
                auVar359._12_4_ = auVar360._12_4_;
                auVar359._8_3_ = 0;
                auVar359._0_8_ = uVar110;
                auVar359[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar358._11_5_ = auVar359._11_5_;
                auVar358._8_2_ = 0;
                auVar358._0_8_ = uVar110;
                auVar358[10] = (char)(uVar110 >> 0x28);
                auVar357._10_6_ = auVar358._10_6_;
                auVar357[8] = 0;
                auVar357._0_8_ = uVar110;
                auVar357[9] = (char)((ulong)uVar150 >> 0x20);
                auVar356._9_7_ = auVar357._9_7_;
                auVar356[8] = (char)(uVar110 >> 0x20);
                auVar356._0_8_ = uVar110;
                auVar355._8_8_ = auVar356._8_8_;
                auVar355[7] = (char)((ulong)uVar150 >> 0x18);
                auVar355[6] = (char)(uVar110 >> 0x18);
                auVar355[5] = (char)((ulong)uVar150 >> 0x10);
                auVar355[4] = (char)(uVar110 >> 0x10);
                auVar355[3] = (char)((ulong)uVar150 >> 8);
                auVar355[2] = (char)(uVar110 >> 8);
                auVar355[0] = (undefined1)uVar110;
                auVar355[1] = (char)uVar150;
                uVar110 = *(ulong *)(puVar133 + lVar128 + 1);
                uVar150 = *(undefined8 *)(puVar133 + lVar128 + 2);
                auVar466._8_6_ = 0;
                auVar466._0_8_ = uVar110;
                auVar466[0xe] = (char)(uVar110 >> 0x38);
                auVar466[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar465._14_2_ = auVar466._14_2_;
                auVar465._8_5_ = 0;
                auVar465._0_8_ = uVar110;
                auVar465[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar464._13_3_ = auVar465._13_3_;
                auVar464._8_4_ = 0;
                auVar464._0_8_ = uVar110;
                auVar464[0xc] = (char)(uVar110 >> 0x30);
                auVar463._12_4_ = auVar464._12_4_;
                auVar463._8_3_ = 0;
                auVar463._0_8_ = uVar110;
                auVar463[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar462._11_5_ = auVar463._11_5_;
                auVar462._8_2_ = 0;
                auVar462._0_8_ = uVar110;
                auVar462[10] = (char)(uVar110 >> 0x28);
                auVar461._10_6_ = auVar462._10_6_;
                auVar461[8] = 0;
                auVar461._0_8_ = uVar110;
                auVar461[9] = (char)((ulong)uVar150 >> 0x20);
                auVar460._9_7_ = auVar461._9_7_;
                auVar460[8] = (char)(uVar110 >> 0x20);
                auVar460._0_8_ = uVar110;
                auVar459._8_8_ = auVar460._8_8_;
                auVar459[7] = (char)((ulong)uVar150 >> 0x18);
                auVar459[6] = (char)(uVar110 >> 0x18);
                auVar459[5] = (char)((ulong)uVar150 >> 0x10);
                auVar459[4] = (char)(uVar110 >> 0x10);
                auVar459[3] = (char)((ulong)uVar150 >> 8);
                auVar459[2] = (char)(uVar110 >> 8);
                auVar459[0] = (undefined1)uVar110;
                auVar459[1] = (char)uVar150;
                uVar110 = *(ulong *)(puVar133 + lVar128 + 3);
                uVar150 = *(undefined8 *)(puVar133 + lVar128 + 4);
                auVar579._8_6_ = 0;
                auVar579._0_8_ = uVar110;
                auVar579[0xe] = (char)(uVar110 >> 0x38);
                auVar579[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar578._14_2_ = auVar579._14_2_;
                auVar578._8_5_ = 0;
                auVar578._0_8_ = uVar110;
                auVar578[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar577._13_3_ = auVar578._13_3_;
                auVar577._8_4_ = 0;
                auVar577._0_8_ = uVar110;
                auVar577[0xc] = (char)(uVar110 >> 0x30);
                auVar576._12_4_ = auVar577._12_4_;
                auVar576._8_3_ = 0;
                auVar576._0_8_ = uVar110;
                auVar576[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar575._11_5_ = auVar576._11_5_;
                auVar575._8_2_ = 0;
                auVar575._0_8_ = uVar110;
                auVar575[10] = (char)(uVar110 >> 0x28);
                auVar574._10_6_ = auVar575._10_6_;
                auVar574[8] = 0;
                auVar574._0_8_ = uVar110;
                auVar574[9] = (char)((ulong)uVar150 >> 0x20);
                auVar573._9_7_ = auVar574._9_7_;
                auVar573[8] = (char)(uVar110 >> 0x20);
                auVar573._0_8_ = uVar110;
                auVar572._8_8_ = auVar573._8_8_;
                auVar572[7] = (char)((ulong)uVar150 >> 0x18);
                auVar572[6] = (char)(uVar110 >> 0x18);
                auVar572[5] = (char)((ulong)uVar150 >> 0x10);
                auVar572[4] = (char)(uVar110 >> 0x10);
                auVar572[3] = (char)((ulong)uVar150 >> 8);
                auVar572[2] = (char)(uVar110 >> 8);
                auVar572[0] = (undefined1)uVar110;
                auVar572[1] = (char)uVar150;
                auVar225 = pmaddubsw(auVar258,auVar153);
                auVar709 = pmaddubsw(auVar355,auVar207);
                auVar710 = pmaddubsw(auVar459,auVar208);
                auVar729 = pmaddubsw(auVar572,auVar166);
                auVar580._0_2_ = auVar729._0_2_ + auVar709._0_2_;
                auVar580._2_2_ = auVar729._2_2_ + auVar709._2_2_;
                auVar580._4_2_ = auVar729._4_2_ + auVar709._4_2_;
                auVar580._6_2_ = auVar729._6_2_ + auVar709._6_2_;
                auVar580._8_2_ = auVar729._8_2_ + auVar709._8_2_;
                auVar580._10_2_ = auVar729._10_2_ + auVar709._10_2_;
                auVar580._12_2_ = auVar729._12_2_ + auVar709._12_2_;
                auVar580._14_2_ = auVar729._14_2_ + auVar709._14_2_;
                auVar467._0_2_ = auVar710._0_2_ + auVar225._0_2_ + 0x40;
                auVar467._2_2_ = auVar710._2_2_ + auVar225._2_2_ + 0x40;
                auVar467._4_2_ = auVar710._4_2_ + auVar225._4_2_ + 0x40;
                auVar467._6_2_ = auVar710._6_2_ + auVar225._6_2_ + 0x40;
                auVar467._8_2_ = auVar710._8_2_ + auVar225._8_2_ + 0x40;
                auVar467._10_2_ = auVar710._10_2_ + auVar225._10_2_ + 0x40;
                auVar467._12_2_ = auVar710._12_2_ + auVar225._12_2_ + 0x40;
                auVar467._14_2_ = auVar710._14_2_ + auVar225._14_2_ + 0x40;
                auVar225 = paddsw(auVar467,auVar580);
                auVar225 = psraw(auVar225,7);
                sVar30 = auVar225._0_2_;
                sVar43 = auVar225._2_2_;
                sVar31 = auVar225._4_2_;
                sVar32 = auVar225._6_2_;
                sVar33 = auVar225._8_2_;
                sVar34 = auVar225._10_2_;
                sVar35 = auVar225._12_2_;
                sVar36 = auVar225._14_2_;
                *(ulong *)(local_2d8._0_8_ + lVar128) =
                     CONCAT17((0 < sVar36) * (sVar36 < 0x100) * auVar225[0xe] - (0xff < sVar36),
                              CONCAT16((0 < sVar35) * (sVar35 < 0x100) * auVar225[0xc] -
                                       (0xff < sVar35),
                                       CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar225[10] -
                                                (0xff < sVar34),
                                                CONCAT14((0 < sVar33) * (sVar33 < 0x100) *
                                                         auVar225[8] - (0xff < sVar33),
                                                         CONCAT13((0 < sVar32) * (sVar32 < 0x100) *
                                                                  auVar225[6] - (0xff < sVar32),
                                                                  CONCAT12((0 < sVar31) *
                                                                           (sVar31 < 0x100) *
                                                                           auVar225[4] -
                                                                           (0xff < sVar31),
                                                                           CONCAT11((0 < sVar43) *
                                                                                    (sVar43 < 0x100)
                                                                                    * auVar225[2] -
                                                                                    (0xff < sVar43),
                                                                                    (0 < sVar30) *
                                                                                    (sVar30 < 0x100)
                                                                                    * auVar225[0] -
                                                                                    (0xff < sVar30))
                                                                          ))))));
                lVar128 = lVar128 + 8;
              } while (uVar107 != (uint)lVar128);
              lVar128 = (long)(int)(uVar107 * 2) + (long)__ptr;
              lVar139 = (long)(int)(uVar107 * 6) + (long)__ptr;
              lVar131 = (long)puVar115 - lVar129;
              lVar125 = 0;
              do {
                uVar110 = *(ulong *)(lVar131 + -3 + lVar125);
                uVar150 = *(undefined8 *)(lVar131 + -2 + lVar125);
                auVar273._8_6_ = 0;
                auVar273._0_8_ = uVar110;
                auVar273[0xe] = (char)(uVar110 >> 0x38);
                auVar273[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar272._14_2_ = auVar273._14_2_;
                auVar272._8_5_ = 0;
                auVar272._0_8_ = uVar110;
                auVar272[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar271._13_3_ = auVar272._13_3_;
                auVar271._8_4_ = 0;
                auVar271._0_8_ = uVar110;
                auVar271[0xc] = (char)(uVar110 >> 0x30);
                auVar270._12_4_ = auVar271._12_4_;
                auVar270._8_3_ = 0;
                auVar270._0_8_ = uVar110;
                auVar270[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar269._11_5_ = auVar270._11_5_;
                auVar269._8_2_ = 0;
                auVar269._0_8_ = uVar110;
                auVar269[10] = (char)(uVar110 >> 0x28);
                auVar268._10_6_ = auVar269._10_6_;
                auVar268[8] = 0;
                auVar268._0_8_ = uVar110;
                auVar268[9] = (char)((ulong)uVar150 >> 0x20);
                auVar267._9_7_ = auVar268._9_7_;
                auVar267[8] = (char)(uVar110 >> 0x20);
                auVar267._0_8_ = uVar110;
                auVar266._8_8_ = auVar267._8_8_;
                auVar266[7] = (char)((ulong)uVar150 >> 0x18);
                auVar266[6] = (char)(uVar110 >> 0x18);
                auVar266[5] = (char)((ulong)uVar150 >> 0x10);
                auVar266[4] = (char)(uVar110 >> 0x10);
                auVar266[3] = (char)((ulong)uVar150 >> 8);
                auVar266[2] = (char)(uVar110 >> 8);
                auVar266[0] = (undefined1)uVar110;
                auVar266[1] = (char)uVar150;
                uVar110 = *(ulong *)(lVar131 + -1 + lVar125);
                uVar150 = *(undefined8 *)(lVar131 + lVar125);
                auVar370._8_6_ = 0;
                auVar370._0_8_ = uVar110;
                auVar370[0xe] = (char)(uVar110 >> 0x38);
                auVar370[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar369._14_2_ = auVar370._14_2_;
                auVar369._8_5_ = 0;
                auVar369._0_8_ = uVar110;
                auVar369[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar368._13_3_ = auVar369._13_3_;
                auVar368._8_4_ = 0;
                auVar368._0_8_ = uVar110;
                auVar368[0xc] = (char)(uVar110 >> 0x30);
                auVar367._12_4_ = auVar368._12_4_;
                auVar367._8_3_ = 0;
                auVar367._0_8_ = uVar110;
                auVar367[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar366._11_5_ = auVar367._11_5_;
                auVar366._8_2_ = 0;
                auVar366._0_8_ = uVar110;
                auVar366[10] = (char)(uVar110 >> 0x28);
                auVar365._10_6_ = auVar366._10_6_;
                auVar365[8] = 0;
                auVar365._0_8_ = uVar110;
                auVar365[9] = (char)((ulong)uVar150 >> 0x20);
                auVar364._9_7_ = auVar365._9_7_;
                auVar364[8] = (char)(uVar110 >> 0x20);
                auVar364._0_8_ = uVar110;
                auVar363._8_8_ = auVar364._8_8_;
                auVar363[7] = (char)((ulong)uVar150 >> 0x18);
                auVar363[6] = (char)(uVar110 >> 0x18);
                auVar363[5] = (char)((ulong)uVar150 >> 0x10);
                auVar363[4] = (char)(uVar110 >> 0x10);
                auVar363[3] = (char)((ulong)uVar150 >> 8);
                auVar363[2] = (char)(uVar110 >> 8);
                auVar363[0] = (undefined1)uVar110;
                auVar363[1] = (char)uVar150;
                uVar110 = *(ulong *)(lVar131 + 1 + lVar125);
                uVar150 = *(undefined8 *)(lVar131 + 2 + lVar125);
                auVar475._8_6_ = 0;
                auVar475._0_8_ = uVar110;
                auVar475[0xe] = (char)(uVar110 >> 0x38);
                auVar475[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar474._14_2_ = auVar475._14_2_;
                auVar474._8_5_ = 0;
                auVar474._0_8_ = uVar110;
                auVar474[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar473._13_3_ = auVar474._13_3_;
                auVar473._8_4_ = 0;
                auVar473._0_8_ = uVar110;
                auVar473[0xc] = (char)(uVar110 >> 0x30);
                auVar472._12_4_ = auVar473._12_4_;
                auVar472._8_3_ = 0;
                auVar472._0_8_ = uVar110;
                auVar472[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar471._11_5_ = auVar472._11_5_;
                auVar471._8_2_ = 0;
                auVar471._0_8_ = uVar110;
                auVar471[10] = (char)(uVar110 >> 0x28);
                auVar470._10_6_ = auVar471._10_6_;
                auVar470[8] = 0;
                auVar470._0_8_ = uVar110;
                auVar470[9] = (char)((ulong)uVar150 >> 0x20);
                auVar469._9_7_ = auVar470._9_7_;
                auVar469[8] = (char)(uVar110 >> 0x20);
                auVar469._0_8_ = uVar110;
                auVar468._8_8_ = auVar469._8_8_;
                auVar468[7] = (char)((ulong)uVar150 >> 0x18);
                auVar468[6] = (char)(uVar110 >> 0x18);
                auVar468[5] = (char)((ulong)uVar150 >> 0x10);
                auVar468[4] = (char)(uVar110 >> 0x10);
                auVar468[3] = (char)((ulong)uVar150 >> 8);
                auVar468[2] = (char)(uVar110 >> 8);
                auVar468[0] = (undefined1)uVar110;
                auVar468[1] = (char)uVar150;
                uVar110 = *(ulong *)(lVar131 + 3 + lVar125);
                uVar150 = *(undefined8 *)(lVar131 + 4 + lVar125);
                auVar588._8_6_ = 0;
                auVar588._0_8_ = uVar110;
                auVar588[0xe] = (char)(uVar110 >> 0x38);
                auVar588[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar587._14_2_ = auVar588._14_2_;
                auVar587._8_5_ = 0;
                auVar587._0_8_ = uVar110;
                auVar587[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar586._13_3_ = auVar587._13_3_;
                auVar586._8_4_ = 0;
                auVar586._0_8_ = uVar110;
                auVar586[0xc] = (char)(uVar110 >> 0x30);
                auVar585._12_4_ = auVar586._12_4_;
                auVar585._8_3_ = 0;
                auVar585._0_8_ = uVar110;
                auVar585[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar584._11_5_ = auVar585._11_5_;
                auVar584._8_2_ = 0;
                auVar584._0_8_ = uVar110;
                auVar584[10] = (char)(uVar110 >> 0x28);
                auVar583._10_6_ = auVar584._10_6_;
                auVar583[8] = 0;
                auVar583._0_8_ = uVar110;
                auVar583[9] = (char)((ulong)uVar150 >> 0x20);
                auVar582._9_7_ = auVar583._9_7_;
                auVar582[8] = (char)(uVar110 >> 0x20);
                auVar582._0_8_ = uVar110;
                auVar581._8_8_ = auVar582._8_8_;
                auVar581[7] = (char)((ulong)uVar150 >> 0x18);
                auVar581[6] = (char)(uVar110 >> 0x18);
                auVar581[5] = (char)((ulong)uVar150 >> 0x10);
                auVar581[4] = (char)(uVar110 >> 0x10);
                auVar581[3] = (char)((ulong)uVar150 >> 8);
                auVar581[2] = (char)(uVar110 >> 8);
                auVar581[0] = (undefined1)uVar110;
                auVar581[1] = (char)uVar150;
                auVar225 = pmaddubsw(auVar266,auVar153);
                auVar709 = pmaddubsw(auVar363,auVar207);
                auVar710 = pmaddubsw(auVar468,auVar208);
                auVar729 = pmaddubsw(auVar581,auVar166);
                auVar589._0_2_ = auVar729._0_2_ + auVar709._0_2_;
                auVar589._2_2_ = auVar729._2_2_ + auVar709._2_2_;
                auVar589._4_2_ = auVar729._4_2_ + auVar709._4_2_;
                auVar589._6_2_ = auVar729._6_2_ + auVar709._6_2_;
                auVar589._8_2_ = auVar729._8_2_ + auVar709._8_2_;
                auVar589._10_2_ = auVar729._10_2_ + auVar709._10_2_;
                auVar589._12_2_ = auVar729._12_2_ + auVar709._12_2_;
                auVar589._14_2_ = auVar729._14_2_ + auVar709._14_2_;
                auVar476._0_2_ = auVar710._0_2_ + auVar225._0_2_ + 0x40;
                auVar476._2_2_ = auVar710._2_2_ + auVar225._2_2_ + 0x40;
                auVar476._4_2_ = auVar710._4_2_ + auVar225._4_2_ + 0x40;
                auVar476._6_2_ = auVar710._6_2_ + auVar225._6_2_ + 0x40;
                auVar476._8_2_ = auVar710._8_2_ + auVar225._8_2_ + 0x40;
                auVar476._10_2_ = auVar710._10_2_ + auVar225._10_2_ + 0x40;
                auVar476._12_2_ = auVar710._12_2_ + auVar225._12_2_ + 0x40;
                auVar476._14_2_ = auVar710._14_2_ + auVar225._14_2_ + 0x40;
                auVar225 = paddsw(auVar476,auVar589);
                auVar225 = psraw(auVar225,7);
                sVar30 = auVar225._0_2_;
                sVar43 = auVar225._2_2_;
                sVar31 = auVar225._4_2_;
                sVar32 = auVar225._6_2_;
                sVar33 = auVar225._8_2_;
                sVar34 = auVar225._10_2_;
                sVar35 = auVar225._12_2_;
                sVar36 = auVar225._14_2_;
                *(ulong *)(lVar128 + lVar125) =
                     CONCAT17((0 < sVar36) * (sVar36 < 0x100) * auVar225[0xe] - (0xff < sVar36),
                              CONCAT16((0 < sVar35) * (sVar35 < 0x100) * auVar225[0xc] -
                                       (0xff < sVar35),
                                       CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar225[10] -
                                                (0xff < sVar34),
                                                CONCAT14((0 < sVar33) * (sVar33 < 0x100) *
                                                         auVar225[8] - (0xff < sVar33),
                                                         CONCAT13((0 < sVar32) * (sVar32 < 0x100) *
                                                                  auVar225[6] - (0xff < sVar32),
                                                                  CONCAT12((0 < sVar31) *
                                                                           (sVar31 < 0x100) *
                                                                           auVar225[4] -
                                                                           (0xff < sVar31),
                                                                           CONCAT11((0 < sVar43) *
                                                                                    (sVar43 < 0x100)
                                                                                    * auVar225[2] -
                                                                                    (0xff < sVar43),
                                                                                    (0 < sVar30) *
                                                                                    (sVar30 < 0x100)
                                                                                    * auVar225[0] -
                                                                                    (0xff < sVar30))
                                                                          ))))));
                lVar125 = lVar125 + 8;
              } while (uVar107 != (uint)lVar125);
              local_2e8._0_8_ = (long)(int)(uVar107 * 3) + (long)__ptr;
              lVar125 = 0;
              do {
                uVar110 = *(ulong *)(puVar115 + lVar125 + -3);
                uVar150 = *(undefined8 *)(puVar115 + lVar125 + -2);
                auVar281._8_6_ = 0;
                auVar281._0_8_ = uVar110;
                auVar281[0xe] = (char)(uVar110 >> 0x38);
                auVar281[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar280._14_2_ = auVar281._14_2_;
                auVar280._8_5_ = 0;
                auVar280._0_8_ = uVar110;
                auVar280[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar279._13_3_ = auVar280._13_3_;
                auVar279._8_4_ = 0;
                auVar279._0_8_ = uVar110;
                auVar279[0xc] = (char)(uVar110 >> 0x30);
                auVar278._12_4_ = auVar279._12_4_;
                auVar278._8_3_ = 0;
                auVar278._0_8_ = uVar110;
                auVar278[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar277._11_5_ = auVar278._11_5_;
                auVar277._8_2_ = 0;
                auVar277._0_8_ = uVar110;
                auVar277[10] = (char)(uVar110 >> 0x28);
                auVar276._10_6_ = auVar277._10_6_;
                auVar276[8] = 0;
                auVar276._0_8_ = uVar110;
                auVar276[9] = (char)((ulong)uVar150 >> 0x20);
                auVar275._9_7_ = auVar276._9_7_;
                auVar275[8] = (char)(uVar110 >> 0x20);
                auVar275._0_8_ = uVar110;
                auVar274._8_8_ = auVar275._8_8_;
                auVar274[7] = (char)((ulong)uVar150 >> 0x18);
                auVar274[6] = (char)(uVar110 >> 0x18);
                auVar274[5] = (char)((ulong)uVar150 >> 0x10);
                auVar274[4] = (char)(uVar110 >> 0x10);
                auVar274[3] = (char)((ulong)uVar150 >> 8);
                auVar274[2] = (char)(uVar110 >> 8);
                auVar274[0] = (undefined1)uVar110;
                auVar274[1] = (char)uVar150;
                uVar110 = *(ulong *)(puVar115 + lVar125 + -1);
                uVar150 = *(undefined8 *)(puVar115 + lVar125);
                auVar378._8_6_ = 0;
                auVar378._0_8_ = uVar110;
                auVar378[0xe] = (char)(uVar110 >> 0x38);
                auVar378[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar377._14_2_ = auVar378._14_2_;
                auVar377._8_5_ = 0;
                auVar377._0_8_ = uVar110;
                auVar377[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar376._13_3_ = auVar377._13_3_;
                auVar376._8_4_ = 0;
                auVar376._0_8_ = uVar110;
                auVar376[0xc] = (char)(uVar110 >> 0x30);
                auVar375._12_4_ = auVar376._12_4_;
                auVar375._8_3_ = 0;
                auVar375._0_8_ = uVar110;
                auVar375[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar374._11_5_ = auVar375._11_5_;
                auVar374._8_2_ = 0;
                auVar374._0_8_ = uVar110;
                auVar374[10] = (char)(uVar110 >> 0x28);
                auVar373._10_6_ = auVar374._10_6_;
                auVar373[8] = 0;
                auVar373._0_8_ = uVar110;
                auVar373[9] = (char)((ulong)uVar150 >> 0x20);
                auVar372._9_7_ = auVar373._9_7_;
                auVar372[8] = (char)(uVar110 >> 0x20);
                auVar372._0_8_ = uVar110;
                auVar371._8_8_ = auVar372._8_8_;
                auVar371[7] = (char)((ulong)uVar150 >> 0x18);
                auVar371[6] = (char)(uVar110 >> 0x18);
                auVar371[5] = (char)((ulong)uVar150 >> 0x10);
                auVar371[4] = (char)(uVar110 >> 0x10);
                auVar371[3] = (char)((ulong)uVar150 >> 8);
                auVar371[2] = (char)(uVar110 >> 8);
                auVar371[0] = (undefined1)uVar110;
                auVar371[1] = (char)uVar150;
                uVar110 = *(ulong *)(puVar115 + lVar125 + 1);
                uVar150 = *(undefined8 *)(puVar115 + lVar125 + 2);
                auVar484._8_6_ = 0;
                auVar484._0_8_ = uVar110;
                auVar484[0xe] = (char)(uVar110 >> 0x38);
                auVar484[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar483._14_2_ = auVar484._14_2_;
                auVar483._8_5_ = 0;
                auVar483._0_8_ = uVar110;
                auVar483[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar482._13_3_ = auVar483._13_3_;
                auVar482._8_4_ = 0;
                auVar482._0_8_ = uVar110;
                auVar482[0xc] = (char)(uVar110 >> 0x30);
                auVar481._12_4_ = auVar482._12_4_;
                auVar481._8_3_ = 0;
                auVar481._0_8_ = uVar110;
                auVar481[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar480._11_5_ = auVar481._11_5_;
                auVar480._8_2_ = 0;
                auVar480._0_8_ = uVar110;
                auVar480[10] = (char)(uVar110 >> 0x28);
                auVar479._10_6_ = auVar480._10_6_;
                auVar479[8] = 0;
                auVar479._0_8_ = uVar110;
                auVar479[9] = (char)((ulong)uVar150 >> 0x20);
                auVar478._9_7_ = auVar479._9_7_;
                auVar478[8] = (char)(uVar110 >> 0x20);
                auVar478._0_8_ = uVar110;
                auVar477._8_8_ = auVar478._8_8_;
                auVar477[7] = (char)((ulong)uVar150 >> 0x18);
                auVar477[6] = (char)(uVar110 >> 0x18);
                auVar477[5] = (char)((ulong)uVar150 >> 0x10);
                auVar477[4] = (char)(uVar110 >> 0x10);
                auVar477[3] = (char)((ulong)uVar150 >> 8);
                auVar477[2] = (char)(uVar110 >> 8);
                auVar477[0] = (undefined1)uVar110;
                auVar477[1] = (char)uVar150;
                uVar110 = *(ulong *)(puVar115 + lVar125 + 3);
                uVar150 = *(undefined8 *)(puVar115 + lVar125 + 4);
                auVar597._8_6_ = 0;
                auVar597._0_8_ = uVar110;
                auVar597[0xe] = (char)(uVar110 >> 0x38);
                auVar597[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar596._14_2_ = auVar597._14_2_;
                auVar596._8_5_ = 0;
                auVar596._0_8_ = uVar110;
                auVar596[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar595._13_3_ = auVar596._13_3_;
                auVar595._8_4_ = 0;
                auVar595._0_8_ = uVar110;
                auVar595[0xc] = (char)(uVar110 >> 0x30);
                auVar594._12_4_ = auVar595._12_4_;
                auVar594._8_3_ = 0;
                auVar594._0_8_ = uVar110;
                auVar594[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar593._11_5_ = auVar594._11_5_;
                auVar593._8_2_ = 0;
                auVar593._0_8_ = uVar110;
                auVar593[10] = (char)(uVar110 >> 0x28);
                auVar592._10_6_ = auVar593._10_6_;
                auVar592[8] = 0;
                auVar592._0_8_ = uVar110;
                auVar592[9] = (char)((ulong)uVar150 >> 0x20);
                auVar591._9_7_ = auVar592._9_7_;
                auVar591[8] = (char)(uVar110 >> 0x20);
                auVar591._0_8_ = uVar110;
                auVar590._8_8_ = auVar591._8_8_;
                auVar590[7] = (char)((ulong)uVar150 >> 0x18);
                auVar590[6] = (char)(uVar110 >> 0x18);
                auVar590[5] = (char)((ulong)uVar150 >> 0x10);
                auVar590[4] = (char)(uVar110 >> 0x10);
                auVar590[3] = (char)((ulong)uVar150 >> 8);
                auVar590[2] = (char)(uVar110 >> 8);
                auVar590[0] = (undefined1)uVar110;
                auVar590[1] = (char)uVar150;
                auVar225 = pmaddubsw(auVar274,auVar153);
                auVar709 = pmaddubsw(auVar371,auVar207);
                auVar710 = pmaddubsw(auVar477,auVar208);
                auVar729 = pmaddubsw(auVar590,auVar166);
                auVar598._0_2_ = auVar729._0_2_ + auVar709._0_2_;
                auVar598._2_2_ = auVar729._2_2_ + auVar709._2_2_;
                auVar598._4_2_ = auVar729._4_2_ + auVar709._4_2_;
                auVar598._6_2_ = auVar729._6_2_ + auVar709._6_2_;
                auVar598._8_2_ = auVar729._8_2_ + auVar709._8_2_;
                auVar598._10_2_ = auVar729._10_2_ + auVar709._10_2_;
                auVar598._12_2_ = auVar729._12_2_ + auVar709._12_2_;
                auVar598._14_2_ = auVar729._14_2_ + auVar709._14_2_;
                auVar485._0_2_ = auVar710._0_2_ + auVar225._0_2_ + 0x40;
                auVar485._2_2_ = auVar710._2_2_ + auVar225._2_2_ + 0x40;
                auVar485._4_2_ = auVar710._4_2_ + auVar225._4_2_ + 0x40;
                auVar485._6_2_ = auVar710._6_2_ + auVar225._6_2_ + 0x40;
                auVar485._8_2_ = auVar710._8_2_ + auVar225._8_2_ + 0x40;
                auVar485._10_2_ = auVar710._10_2_ + auVar225._10_2_ + 0x40;
                auVar485._12_2_ = auVar710._12_2_ + auVar225._12_2_ + 0x40;
                auVar485._14_2_ = auVar710._14_2_ + auVar225._14_2_ + 0x40;
                auVar225 = paddsw(auVar485,auVar598);
                auVar225 = psraw(auVar225,7);
                sVar30 = auVar225._0_2_;
                sVar43 = auVar225._2_2_;
                sVar31 = auVar225._4_2_;
                sVar32 = auVar225._6_2_;
                sVar33 = auVar225._8_2_;
                sVar34 = auVar225._10_2_;
                sVar35 = auVar225._12_2_;
                sVar36 = auVar225._14_2_;
                *(ulong *)(local_2e8._0_8_ + lVar125) =
                     CONCAT17((0 < sVar36) * (sVar36 < 0x100) * auVar225[0xe] - (0xff < sVar36),
                              CONCAT16((0 < sVar35) * (sVar35 < 0x100) * auVar225[0xc] -
                                       (0xff < sVar35),
                                       CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar225[10] -
                                                (0xff < sVar34),
                                                CONCAT14((0 < sVar33) * (sVar33 < 0x100) *
                                                         auVar225[8] - (0xff < sVar33),
                                                         CONCAT13((0 < sVar32) * (sVar32 < 0x100) *
                                                                  auVar225[6] - (0xff < sVar32),
                                                                  CONCAT12((0 < sVar31) *
                                                                           (sVar31 < 0x100) *
                                                                           auVar225[4] -
                                                                           (0xff < sVar31),
                                                                           CONCAT11((0 < sVar43) *
                                                                                    (sVar43 < 0x100)
                                                                                    * auVar225[2] -
                                                                                    (0xff < sVar43),
                                                                                    (0 < sVar30) *
                                                                                    (sVar30 < 0x100)
                                                                                    * auVar225[0] -
                                                                                    (0xff < sVar30))
                                                                          ))))));
                lVar125 = lVar125 + 8;
              } while (uVar107 != (uint)lVar125);
              local_350 = puVar115 + lVar129;
              lVar125 = 0;
              do {
                uVar110 = *(ulong *)(local_350 + lVar125 + -3);
                uVar150 = *(undefined8 *)(local_350 + lVar125 + -2);
                auVar289._8_6_ = 0;
                auVar289._0_8_ = uVar110;
                auVar289[0xe] = (char)(uVar110 >> 0x38);
                auVar289[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar288._14_2_ = auVar289._14_2_;
                auVar288._8_5_ = 0;
                auVar288._0_8_ = uVar110;
                auVar288[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar287._13_3_ = auVar288._13_3_;
                auVar287._8_4_ = 0;
                auVar287._0_8_ = uVar110;
                auVar287[0xc] = (char)(uVar110 >> 0x30);
                auVar286._12_4_ = auVar287._12_4_;
                auVar286._8_3_ = 0;
                auVar286._0_8_ = uVar110;
                auVar286[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar285._11_5_ = auVar286._11_5_;
                auVar285._8_2_ = 0;
                auVar285._0_8_ = uVar110;
                auVar285[10] = (char)(uVar110 >> 0x28);
                auVar284._10_6_ = auVar285._10_6_;
                auVar284[8] = 0;
                auVar284._0_8_ = uVar110;
                auVar284[9] = (char)((ulong)uVar150 >> 0x20);
                auVar283._9_7_ = auVar284._9_7_;
                auVar283[8] = (char)(uVar110 >> 0x20);
                auVar283._0_8_ = uVar110;
                auVar282._8_8_ = auVar283._8_8_;
                auVar282[7] = (char)((ulong)uVar150 >> 0x18);
                auVar282[6] = (char)(uVar110 >> 0x18);
                auVar282[5] = (char)((ulong)uVar150 >> 0x10);
                auVar282[4] = (char)(uVar110 >> 0x10);
                auVar282[3] = (char)((ulong)uVar150 >> 8);
                auVar282[2] = (char)(uVar110 >> 8);
                auVar282[0] = (undefined1)uVar110;
                auVar282[1] = (char)uVar150;
                uVar110 = *(ulong *)(local_350 + lVar125 + -1);
                uVar150 = *(undefined8 *)(local_350 + lVar125);
                auVar386._8_6_ = 0;
                auVar386._0_8_ = uVar110;
                auVar386[0xe] = (char)(uVar110 >> 0x38);
                auVar386[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar385._14_2_ = auVar386._14_2_;
                auVar385._8_5_ = 0;
                auVar385._0_8_ = uVar110;
                auVar385[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar384._13_3_ = auVar385._13_3_;
                auVar384._8_4_ = 0;
                auVar384._0_8_ = uVar110;
                auVar384[0xc] = (char)(uVar110 >> 0x30);
                auVar383._12_4_ = auVar384._12_4_;
                auVar383._8_3_ = 0;
                auVar383._0_8_ = uVar110;
                auVar383[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar382._11_5_ = auVar383._11_5_;
                auVar382._8_2_ = 0;
                auVar382._0_8_ = uVar110;
                auVar382[10] = (char)(uVar110 >> 0x28);
                auVar381._10_6_ = auVar382._10_6_;
                auVar381[8] = 0;
                auVar381._0_8_ = uVar110;
                auVar381[9] = (char)((ulong)uVar150 >> 0x20);
                auVar380._9_7_ = auVar381._9_7_;
                auVar380[8] = (char)(uVar110 >> 0x20);
                auVar380._0_8_ = uVar110;
                auVar379._8_8_ = auVar380._8_8_;
                auVar379[7] = (char)((ulong)uVar150 >> 0x18);
                auVar379[6] = (char)(uVar110 >> 0x18);
                auVar379[5] = (char)((ulong)uVar150 >> 0x10);
                auVar379[4] = (char)(uVar110 >> 0x10);
                auVar379[3] = (char)((ulong)uVar150 >> 8);
                auVar379[2] = (char)(uVar110 >> 8);
                auVar379[0] = (undefined1)uVar110;
                auVar379[1] = (char)uVar150;
                uVar110 = *(ulong *)(local_350 + lVar125 + 1);
                uVar150 = *(undefined8 *)(local_350 + lVar125 + 2);
                auVar493._8_6_ = 0;
                auVar493._0_8_ = uVar110;
                auVar493[0xe] = (char)(uVar110 >> 0x38);
                auVar493[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar492._14_2_ = auVar493._14_2_;
                auVar492._8_5_ = 0;
                auVar492._0_8_ = uVar110;
                auVar492[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar491._13_3_ = auVar492._13_3_;
                auVar491._8_4_ = 0;
                auVar491._0_8_ = uVar110;
                auVar491[0xc] = (char)(uVar110 >> 0x30);
                auVar490._12_4_ = auVar491._12_4_;
                auVar490._8_3_ = 0;
                auVar490._0_8_ = uVar110;
                auVar490[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar489._11_5_ = auVar490._11_5_;
                auVar489._8_2_ = 0;
                auVar489._0_8_ = uVar110;
                auVar489[10] = (char)(uVar110 >> 0x28);
                auVar488._10_6_ = auVar489._10_6_;
                auVar488[8] = 0;
                auVar488._0_8_ = uVar110;
                auVar488[9] = (char)((ulong)uVar150 >> 0x20);
                auVar487._9_7_ = auVar488._9_7_;
                auVar487[8] = (char)(uVar110 >> 0x20);
                auVar487._0_8_ = uVar110;
                auVar486._8_8_ = auVar487._8_8_;
                auVar486[7] = (char)((ulong)uVar150 >> 0x18);
                auVar486[6] = (char)(uVar110 >> 0x18);
                auVar486[5] = (char)((ulong)uVar150 >> 0x10);
                auVar486[4] = (char)(uVar110 >> 0x10);
                auVar486[3] = (char)((ulong)uVar150 >> 8);
                auVar486[2] = (char)(uVar110 >> 8);
                auVar486[0] = (undefined1)uVar110;
                auVar486[1] = (char)uVar150;
                uVar110 = *(ulong *)(local_350 + lVar125 + 3);
                uVar150 = *(undefined8 *)(local_350 + lVar125 + 4);
                auVar606._8_6_ = 0;
                auVar606._0_8_ = uVar110;
                auVar606[0xe] = (char)(uVar110 >> 0x38);
                auVar606[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar605._14_2_ = auVar606._14_2_;
                auVar605._8_5_ = 0;
                auVar605._0_8_ = uVar110;
                auVar605[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar604._13_3_ = auVar605._13_3_;
                auVar604._8_4_ = 0;
                auVar604._0_8_ = uVar110;
                auVar604[0xc] = (char)(uVar110 >> 0x30);
                auVar603._12_4_ = auVar604._12_4_;
                auVar603._8_3_ = 0;
                auVar603._0_8_ = uVar110;
                auVar603[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar602._11_5_ = auVar603._11_5_;
                auVar602._8_2_ = 0;
                auVar602._0_8_ = uVar110;
                auVar602[10] = (char)(uVar110 >> 0x28);
                auVar601._10_6_ = auVar602._10_6_;
                auVar601[8] = 0;
                auVar601._0_8_ = uVar110;
                auVar601[9] = (char)((ulong)uVar150 >> 0x20);
                auVar600._9_7_ = auVar601._9_7_;
                auVar600[8] = (char)(uVar110 >> 0x20);
                auVar600._0_8_ = uVar110;
                auVar599._8_8_ = auVar600._8_8_;
                auVar599[7] = (char)((ulong)uVar150 >> 0x18);
                auVar599[6] = (char)(uVar110 >> 0x18);
                auVar599[5] = (char)((ulong)uVar150 >> 0x10);
                auVar599[4] = (char)(uVar110 >> 0x10);
                auVar599[3] = (char)((ulong)uVar150 >> 8);
                auVar599[2] = (char)(uVar110 >> 8);
                auVar599[0] = (undefined1)uVar110;
                auVar599[1] = (char)uVar150;
                auVar225 = pmaddubsw(auVar282,auVar153);
                auVar709 = pmaddubsw(auVar379,auVar207);
                auVar710 = pmaddubsw(auVar486,auVar208);
                auVar729 = pmaddubsw(auVar599,auVar166);
                auVar607._0_2_ = auVar729._0_2_ + auVar709._0_2_;
                auVar607._2_2_ = auVar729._2_2_ + auVar709._2_2_;
                auVar607._4_2_ = auVar729._4_2_ + auVar709._4_2_;
                auVar607._6_2_ = auVar729._6_2_ + auVar709._6_2_;
                auVar607._8_2_ = auVar729._8_2_ + auVar709._8_2_;
                auVar607._10_2_ = auVar729._10_2_ + auVar709._10_2_;
                auVar607._12_2_ = auVar729._12_2_ + auVar709._12_2_;
                auVar607._14_2_ = auVar729._14_2_ + auVar709._14_2_;
                auVar494._0_2_ = auVar710._0_2_ + auVar225._0_2_ + 0x40;
                auVar494._2_2_ = auVar710._2_2_ + auVar225._2_2_ + 0x40;
                auVar494._4_2_ = auVar710._4_2_ + auVar225._4_2_ + 0x40;
                auVar494._6_2_ = auVar710._6_2_ + auVar225._6_2_ + 0x40;
                auVar494._8_2_ = auVar710._8_2_ + auVar225._8_2_ + 0x40;
                auVar494._10_2_ = auVar710._10_2_ + auVar225._10_2_ + 0x40;
                auVar494._12_2_ = auVar710._12_2_ + auVar225._12_2_ + 0x40;
                auVar494._14_2_ = auVar710._14_2_ + auVar225._14_2_ + 0x40;
                auVar225 = paddsw(auVar494,auVar607);
                auVar225 = psraw(auVar225,7);
                sVar30 = auVar225._0_2_;
                sVar43 = auVar225._2_2_;
                sVar31 = auVar225._4_2_;
                sVar32 = auVar225._6_2_;
                sVar33 = auVar225._8_2_;
                sVar34 = auVar225._10_2_;
                sVar35 = auVar225._12_2_;
                sVar36 = auVar225._14_2_;
                *(ulong *)(lVar130 + lVar125) =
                     CONCAT17((0 < sVar36) * (sVar36 < 0x100) * auVar225[0xe] - (0xff < sVar36),
                              CONCAT16((0 < sVar35) * (sVar35 < 0x100) * auVar225[0xc] -
                                       (0xff < sVar35),
                                       CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar225[10] -
                                                (0xff < sVar34),
                                                CONCAT14((0 < sVar33) * (sVar33 < 0x100) *
                                                         auVar225[8] - (0xff < sVar33),
                                                         CONCAT13((0 < sVar32) * (sVar32 < 0x100) *
                                                                  auVar225[6] - (0xff < sVar32),
                                                                  CONCAT12((0 < sVar31) *
                                                                           (sVar31 < 0x100) *
                                                                           auVar225[4] -
                                                                           (0xff < sVar31),
                                                                           CONCAT11((0 < sVar43) *
                                                                                    (sVar43 < 0x100)
                                                                                    * auVar225[2] -
                                                                                    (0xff < sVar43),
                                                                                    (0 < sVar30) *
                                                                                    (sVar30 < 0x100)
                                                                                    * auVar225[0] -
                                                                                    (0xff < sVar30))
                                                                          ))))));
                lVar125 = lVar125 + 8;
              } while (uVar107 != (uint)lVar125);
              lVar125 = (long)(int)(uVar107 * 5) + (long)__ptr;
              puVar127 = puVar115 + lVar129 * 2;
              lVar116 = 0;
              do {
                uVar110 = *(ulong *)(puVar127 + lVar116 + -3);
                uVar150 = *(undefined8 *)(puVar127 + lVar116 + -2);
                auVar297._8_6_ = 0;
                auVar297._0_8_ = uVar110;
                auVar297[0xe] = (char)(uVar110 >> 0x38);
                auVar297[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar296._14_2_ = auVar297._14_2_;
                auVar296._8_5_ = 0;
                auVar296._0_8_ = uVar110;
                auVar296[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar295._13_3_ = auVar296._13_3_;
                auVar295._8_4_ = 0;
                auVar295._0_8_ = uVar110;
                auVar295[0xc] = (char)(uVar110 >> 0x30);
                auVar294._12_4_ = auVar295._12_4_;
                auVar294._8_3_ = 0;
                auVar294._0_8_ = uVar110;
                auVar294[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar293._11_5_ = auVar294._11_5_;
                auVar293._8_2_ = 0;
                auVar293._0_8_ = uVar110;
                auVar293[10] = (char)(uVar110 >> 0x28);
                auVar292._10_6_ = auVar293._10_6_;
                auVar292[8] = 0;
                auVar292._0_8_ = uVar110;
                auVar292[9] = (char)((ulong)uVar150 >> 0x20);
                auVar291._9_7_ = auVar292._9_7_;
                auVar291[8] = (char)(uVar110 >> 0x20);
                auVar291._0_8_ = uVar110;
                auVar290._8_8_ = auVar291._8_8_;
                auVar290[7] = (char)((ulong)uVar150 >> 0x18);
                auVar290[6] = (char)(uVar110 >> 0x18);
                auVar290[5] = (char)((ulong)uVar150 >> 0x10);
                auVar290[4] = (char)(uVar110 >> 0x10);
                auVar290[3] = (char)((ulong)uVar150 >> 8);
                auVar290[2] = (char)(uVar110 >> 8);
                auVar290[0] = (undefined1)uVar110;
                auVar290[1] = (char)uVar150;
                uVar110 = *(ulong *)(puVar127 + lVar116 + -1);
                uVar150 = *(undefined8 *)(puVar127 + lVar116);
                auVar394._8_6_ = 0;
                auVar394._0_8_ = uVar110;
                auVar394[0xe] = (char)(uVar110 >> 0x38);
                auVar394[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar393._14_2_ = auVar394._14_2_;
                auVar393._8_5_ = 0;
                auVar393._0_8_ = uVar110;
                auVar393[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar392._13_3_ = auVar393._13_3_;
                auVar392._8_4_ = 0;
                auVar392._0_8_ = uVar110;
                auVar392[0xc] = (char)(uVar110 >> 0x30);
                auVar391._12_4_ = auVar392._12_4_;
                auVar391._8_3_ = 0;
                auVar391._0_8_ = uVar110;
                auVar391[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar390._11_5_ = auVar391._11_5_;
                auVar390._8_2_ = 0;
                auVar390._0_8_ = uVar110;
                auVar390[10] = (char)(uVar110 >> 0x28);
                auVar389._10_6_ = auVar390._10_6_;
                auVar389[8] = 0;
                auVar389._0_8_ = uVar110;
                auVar389[9] = (char)((ulong)uVar150 >> 0x20);
                auVar388._9_7_ = auVar389._9_7_;
                auVar388[8] = (char)(uVar110 >> 0x20);
                auVar388._0_8_ = uVar110;
                auVar387._8_8_ = auVar388._8_8_;
                auVar387[7] = (char)((ulong)uVar150 >> 0x18);
                auVar387[6] = (char)(uVar110 >> 0x18);
                auVar387[5] = (char)((ulong)uVar150 >> 0x10);
                auVar387[4] = (char)(uVar110 >> 0x10);
                auVar387[3] = (char)((ulong)uVar150 >> 8);
                auVar387[2] = (char)(uVar110 >> 8);
                auVar387[0] = (undefined1)uVar110;
                auVar387[1] = (char)uVar150;
                uVar110 = *(ulong *)(puVar127 + lVar116 + 1);
                uVar150 = *(undefined8 *)(puVar127 + lVar116 + 2);
                auVar502._8_6_ = 0;
                auVar502._0_8_ = uVar110;
                auVar502[0xe] = (char)(uVar110 >> 0x38);
                auVar502[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar501._14_2_ = auVar502._14_2_;
                auVar501._8_5_ = 0;
                auVar501._0_8_ = uVar110;
                auVar501[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar500._13_3_ = auVar501._13_3_;
                auVar500._8_4_ = 0;
                auVar500._0_8_ = uVar110;
                auVar500[0xc] = (char)(uVar110 >> 0x30);
                auVar499._12_4_ = auVar500._12_4_;
                auVar499._8_3_ = 0;
                auVar499._0_8_ = uVar110;
                auVar499[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar498._11_5_ = auVar499._11_5_;
                auVar498._8_2_ = 0;
                auVar498._0_8_ = uVar110;
                auVar498[10] = (char)(uVar110 >> 0x28);
                auVar497._10_6_ = auVar498._10_6_;
                auVar497[8] = 0;
                auVar497._0_8_ = uVar110;
                auVar497[9] = (char)((ulong)uVar150 >> 0x20);
                auVar496._9_7_ = auVar497._9_7_;
                auVar496[8] = (char)(uVar110 >> 0x20);
                auVar496._0_8_ = uVar110;
                auVar495._8_8_ = auVar496._8_8_;
                auVar495[7] = (char)((ulong)uVar150 >> 0x18);
                auVar495[6] = (char)(uVar110 >> 0x18);
                auVar495[5] = (char)((ulong)uVar150 >> 0x10);
                auVar495[4] = (char)(uVar110 >> 0x10);
                auVar495[3] = (char)((ulong)uVar150 >> 8);
                auVar495[2] = (char)(uVar110 >> 8);
                auVar495[0] = (undefined1)uVar110;
                auVar495[1] = (char)uVar150;
                uVar110 = *(ulong *)(puVar127 + lVar116 + 3);
                uVar150 = *(undefined8 *)(puVar127 + lVar116 + 4);
                auVar615._8_6_ = 0;
                auVar615._0_8_ = uVar110;
                auVar615[0xe] = (char)(uVar110 >> 0x38);
                auVar615[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar614._14_2_ = auVar615._14_2_;
                auVar614._8_5_ = 0;
                auVar614._0_8_ = uVar110;
                auVar614[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar613._13_3_ = auVar614._13_3_;
                auVar613._8_4_ = 0;
                auVar613._0_8_ = uVar110;
                auVar613[0xc] = (char)(uVar110 >> 0x30);
                auVar612._12_4_ = auVar613._12_4_;
                auVar612._8_3_ = 0;
                auVar612._0_8_ = uVar110;
                auVar612[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar611._11_5_ = auVar612._11_5_;
                auVar611._8_2_ = 0;
                auVar611._0_8_ = uVar110;
                auVar611[10] = (char)(uVar110 >> 0x28);
                auVar610._10_6_ = auVar611._10_6_;
                auVar610[8] = 0;
                auVar610._0_8_ = uVar110;
                auVar610[9] = (char)((ulong)uVar150 >> 0x20);
                auVar609._9_7_ = auVar610._9_7_;
                auVar609[8] = (char)(uVar110 >> 0x20);
                auVar609._0_8_ = uVar110;
                auVar608._8_8_ = auVar609._8_8_;
                auVar608[7] = (char)((ulong)uVar150 >> 0x18);
                auVar608[6] = (char)(uVar110 >> 0x18);
                auVar608[5] = (char)((ulong)uVar150 >> 0x10);
                auVar608[4] = (char)(uVar110 >> 0x10);
                auVar608[3] = (char)((ulong)uVar150 >> 8);
                auVar608[2] = (char)(uVar110 >> 8);
                auVar608[0] = (undefined1)uVar110;
                auVar608[1] = (char)uVar150;
                auVar225 = pmaddubsw(auVar290,auVar153);
                auVar709 = pmaddubsw(auVar387,auVar207);
                auVar710 = pmaddubsw(auVar495,auVar208);
                auVar729 = pmaddubsw(auVar608,auVar166);
                auVar616._0_2_ = auVar729._0_2_ + auVar709._0_2_;
                auVar616._2_2_ = auVar729._2_2_ + auVar709._2_2_;
                auVar616._4_2_ = auVar729._4_2_ + auVar709._4_2_;
                auVar616._6_2_ = auVar729._6_2_ + auVar709._6_2_;
                auVar616._8_2_ = auVar729._8_2_ + auVar709._8_2_;
                auVar616._10_2_ = auVar729._10_2_ + auVar709._10_2_;
                auVar616._12_2_ = auVar729._12_2_ + auVar709._12_2_;
                auVar616._14_2_ = auVar729._14_2_ + auVar709._14_2_;
                auVar503._0_2_ = auVar710._0_2_ + auVar225._0_2_ + 0x40;
                auVar503._2_2_ = auVar710._2_2_ + auVar225._2_2_ + 0x40;
                auVar503._4_2_ = auVar710._4_2_ + auVar225._4_2_ + 0x40;
                auVar503._6_2_ = auVar710._6_2_ + auVar225._6_2_ + 0x40;
                auVar503._8_2_ = auVar710._8_2_ + auVar225._8_2_ + 0x40;
                auVar503._10_2_ = auVar710._10_2_ + auVar225._10_2_ + 0x40;
                auVar503._12_2_ = auVar710._12_2_ + auVar225._12_2_ + 0x40;
                auVar503._14_2_ = auVar710._14_2_ + auVar225._14_2_ + 0x40;
                auVar225 = paddsw(auVar503,auVar616);
                auVar225 = psraw(auVar225,7);
                sVar30 = auVar225._0_2_;
                sVar43 = auVar225._2_2_;
                sVar31 = auVar225._4_2_;
                sVar32 = auVar225._6_2_;
                sVar33 = auVar225._8_2_;
                sVar34 = auVar225._10_2_;
                sVar35 = auVar225._12_2_;
                sVar36 = auVar225._14_2_;
                *(ulong *)(lVar125 + lVar116) =
                     CONCAT17((0 < sVar36) * (sVar36 < 0x100) * auVar225[0xe] - (0xff < sVar36),
                              CONCAT16((0 < sVar35) * (sVar35 < 0x100) * auVar225[0xc] -
                                       (0xff < sVar35),
                                       CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar225[10] -
                                                (0xff < sVar34),
                                                CONCAT14((0 < sVar33) * (sVar33 < 0x100) *
                                                         auVar225[8] - (0xff < sVar33),
                                                         CONCAT13((0 < sVar32) * (sVar32 < 0x100) *
                                                                  auVar225[6] - (0xff < sVar32),
                                                                  CONCAT12((0 < sVar31) *
                                                                           (sVar31 < 0x100) *
                                                                           auVar225[4] -
                                                                           (0xff < sVar31),
                                                                           CONCAT11((0 < sVar43) *
                                                                                    (sVar43 < 0x100)
                                                                                    * auVar225[2] -
                                                                                    (0xff < sVar43),
                                                                                    (0 < sVar30) *
                                                                                    (sVar30 < 0x100)
                                                                                    * auVar225[0] -
                                                                                    (0xff < sVar30))
                                                                          ))))));
                lVar116 = lVar116 + 8;
              } while (uVar107 != (uint)lVar116);
              local_328._0_8_ = puVar115 + lVar129 * 3;
              lVar116 = 0;
              do {
                uVar110 = *(ulong *)(local_328._0_8_ + lVar116 + -3);
                uVar150 = *(undefined8 *)(local_328._0_8_ + lVar116 + -2);
                auVar305._8_6_ = 0;
                auVar305._0_8_ = uVar110;
                auVar305[0xe] = (char)(uVar110 >> 0x38);
                auVar305[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar304._14_2_ = auVar305._14_2_;
                auVar304._8_5_ = 0;
                auVar304._0_8_ = uVar110;
                auVar304[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar303._13_3_ = auVar304._13_3_;
                auVar303._8_4_ = 0;
                auVar303._0_8_ = uVar110;
                auVar303[0xc] = (char)(uVar110 >> 0x30);
                auVar302._12_4_ = auVar303._12_4_;
                auVar302._8_3_ = 0;
                auVar302._0_8_ = uVar110;
                auVar302[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar301._11_5_ = auVar302._11_5_;
                auVar301._8_2_ = 0;
                auVar301._0_8_ = uVar110;
                auVar301[10] = (char)(uVar110 >> 0x28);
                auVar300._10_6_ = auVar301._10_6_;
                auVar300[8] = 0;
                auVar300._0_8_ = uVar110;
                auVar300[9] = (char)((ulong)uVar150 >> 0x20);
                auVar299._9_7_ = auVar300._9_7_;
                auVar299[8] = (char)(uVar110 >> 0x20);
                auVar299._0_8_ = uVar110;
                auVar298._8_8_ = auVar299._8_8_;
                auVar298[7] = (char)((ulong)uVar150 >> 0x18);
                auVar298[6] = (char)(uVar110 >> 0x18);
                auVar298[5] = (char)((ulong)uVar150 >> 0x10);
                auVar298[4] = (char)(uVar110 >> 0x10);
                auVar298[3] = (char)((ulong)uVar150 >> 8);
                auVar298[2] = (char)(uVar110 >> 8);
                auVar298[0] = (undefined1)uVar110;
                auVar298[1] = (char)uVar150;
                uVar110 = *(ulong *)(local_328._0_8_ + lVar116 + -1);
                uVar150 = *(undefined8 *)(local_328._0_8_ + lVar116);
                auVar402._8_6_ = 0;
                auVar402._0_8_ = uVar110;
                auVar402[0xe] = (char)(uVar110 >> 0x38);
                auVar402[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar401._14_2_ = auVar402._14_2_;
                auVar401._8_5_ = 0;
                auVar401._0_8_ = uVar110;
                auVar401[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar400._13_3_ = auVar401._13_3_;
                auVar400._8_4_ = 0;
                auVar400._0_8_ = uVar110;
                auVar400[0xc] = (char)(uVar110 >> 0x30);
                auVar399._12_4_ = auVar400._12_4_;
                auVar399._8_3_ = 0;
                auVar399._0_8_ = uVar110;
                auVar399[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar398._11_5_ = auVar399._11_5_;
                auVar398._8_2_ = 0;
                auVar398._0_8_ = uVar110;
                auVar398[10] = (char)(uVar110 >> 0x28);
                auVar397._10_6_ = auVar398._10_6_;
                auVar397[8] = 0;
                auVar397._0_8_ = uVar110;
                auVar397[9] = (char)((ulong)uVar150 >> 0x20);
                auVar396._9_7_ = auVar397._9_7_;
                auVar396[8] = (char)(uVar110 >> 0x20);
                auVar396._0_8_ = uVar110;
                auVar395._8_8_ = auVar396._8_8_;
                auVar395[7] = (char)((ulong)uVar150 >> 0x18);
                auVar395[6] = (char)(uVar110 >> 0x18);
                auVar395[5] = (char)((ulong)uVar150 >> 0x10);
                auVar395[4] = (char)(uVar110 >> 0x10);
                auVar395[3] = (char)((ulong)uVar150 >> 8);
                auVar395[2] = (char)(uVar110 >> 8);
                auVar395[0] = (undefined1)uVar110;
                auVar395[1] = (char)uVar150;
                uVar110 = *(ulong *)(local_328._0_8_ + lVar116 + 1);
                uVar150 = *(undefined8 *)(local_328._0_8_ + lVar116 + 2);
                auVar511._8_6_ = 0;
                auVar511._0_8_ = uVar110;
                auVar511[0xe] = (char)(uVar110 >> 0x38);
                auVar511[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar510._14_2_ = auVar511._14_2_;
                auVar510._8_5_ = 0;
                auVar510._0_8_ = uVar110;
                auVar510[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar509._13_3_ = auVar510._13_3_;
                auVar509._8_4_ = 0;
                auVar509._0_8_ = uVar110;
                auVar509[0xc] = (char)(uVar110 >> 0x30);
                auVar508._12_4_ = auVar509._12_4_;
                auVar508._8_3_ = 0;
                auVar508._0_8_ = uVar110;
                auVar508[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar507._11_5_ = auVar508._11_5_;
                auVar507._8_2_ = 0;
                auVar507._0_8_ = uVar110;
                auVar507[10] = (char)(uVar110 >> 0x28);
                auVar506._10_6_ = auVar507._10_6_;
                auVar506[8] = 0;
                auVar506._0_8_ = uVar110;
                auVar506[9] = (char)((ulong)uVar150 >> 0x20);
                auVar505._9_7_ = auVar506._9_7_;
                auVar505[8] = (char)(uVar110 >> 0x20);
                auVar505._0_8_ = uVar110;
                auVar504._8_8_ = auVar505._8_8_;
                auVar504[7] = (char)((ulong)uVar150 >> 0x18);
                auVar504[6] = (char)(uVar110 >> 0x18);
                auVar504[5] = (char)((ulong)uVar150 >> 0x10);
                auVar504[4] = (char)(uVar110 >> 0x10);
                auVar504[3] = (char)((ulong)uVar150 >> 8);
                auVar504[2] = (char)(uVar110 >> 8);
                auVar504[0] = (undefined1)uVar110;
                auVar504[1] = (char)uVar150;
                uVar110 = *(ulong *)(local_328._0_8_ + lVar116 + 3);
                uVar150 = *(undefined8 *)(local_328._0_8_ + lVar116 + 4);
                auVar624._8_6_ = 0;
                auVar624._0_8_ = uVar110;
                auVar624[0xe] = (char)(uVar110 >> 0x38);
                auVar624[0xf] = (char)((ulong)uVar150 >> 0x38);
                auVar623._14_2_ = auVar624._14_2_;
                auVar623._8_5_ = 0;
                auVar623._0_8_ = uVar110;
                auVar623[0xd] = (char)((ulong)uVar150 >> 0x30);
                auVar622._13_3_ = auVar623._13_3_;
                auVar622._8_4_ = 0;
                auVar622._0_8_ = uVar110;
                auVar622[0xc] = (char)(uVar110 >> 0x30);
                auVar621._12_4_ = auVar622._12_4_;
                auVar621._8_3_ = 0;
                auVar621._0_8_ = uVar110;
                auVar621[0xb] = (char)((ulong)uVar150 >> 0x28);
                auVar620._11_5_ = auVar621._11_5_;
                auVar620._8_2_ = 0;
                auVar620._0_8_ = uVar110;
                auVar620[10] = (char)(uVar110 >> 0x28);
                auVar619._10_6_ = auVar620._10_6_;
                auVar619[8] = 0;
                auVar619._0_8_ = uVar110;
                auVar619[9] = (char)((ulong)uVar150 >> 0x20);
                auVar618._9_7_ = auVar619._9_7_;
                auVar618[8] = (char)(uVar110 >> 0x20);
                auVar618._0_8_ = uVar110;
                auVar617._8_8_ = auVar618._8_8_;
                auVar617[7] = (char)((ulong)uVar150 >> 0x18);
                auVar617[6] = (char)(uVar110 >> 0x18);
                auVar617[5] = (char)((ulong)uVar150 >> 0x10);
                auVar617[4] = (char)(uVar110 >> 0x10);
                auVar617[3] = (char)((ulong)uVar150 >> 8);
                auVar617[2] = (char)(uVar110 >> 8);
                auVar617[0] = (undefined1)uVar110;
                auVar617[1] = (char)uVar150;
                auVar225 = pmaddubsw(auVar298,auVar153);
                auVar709 = pmaddubsw(auVar395,auVar207);
                auVar710 = pmaddubsw(auVar504,auVar208);
                auVar729 = pmaddubsw(auVar617,auVar166);
                auVar625._0_2_ = auVar729._0_2_ + auVar709._0_2_;
                auVar625._2_2_ = auVar729._2_2_ + auVar709._2_2_;
                auVar625._4_2_ = auVar729._4_2_ + auVar709._4_2_;
                auVar625._6_2_ = auVar729._6_2_ + auVar709._6_2_;
                auVar625._8_2_ = auVar729._8_2_ + auVar709._8_2_;
                auVar625._10_2_ = auVar729._10_2_ + auVar709._10_2_;
                auVar625._12_2_ = auVar729._12_2_ + auVar709._12_2_;
                auVar625._14_2_ = auVar729._14_2_ + auVar709._14_2_;
                auVar512._0_2_ = auVar710._0_2_ + auVar225._0_2_ + 0x40;
                auVar512._2_2_ = auVar710._2_2_ + auVar225._2_2_ + 0x40;
                auVar512._4_2_ = auVar710._4_2_ + auVar225._4_2_ + 0x40;
                auVar512._6_2_ = auVar710._6_2_ + auVar225._6_2_ + 0x40;
                auVar512._8_2_ = auVar710._8_2_ + auVar225._8_2_ + 0x40;
                auVar512._10_2_ = auVar710._10_2_ + auVar225._10_2_ + 0x40;
                auVar512._12_2_ = auVar710._12_2_ + auVar225._12_2_ + 0x40;
                auVar512._14_2_ = auVar710._14_2_ + auVar225._14_2_ + 0x40;
                auVar225 = paddsw(auVar512,auVar625);
                auVar225 = psraw(auVar225,7);
                sVar30 = auVar225._0_2_;
                sVar43 = auVar225._2_2_;
                sVar31 = auVar225._4_2_;
                sVar32 = auVar225._6_2_;
                sVar33 = auVar225._8_2_;
                sVar34 = auVar225._10_2_;
                sVar35 = auVar225._12_2_;
                sVar36 = auVar225._14_2_;
                *(ulong *)(lVar139 + lVar116) =
                     CONCAT17((0 < sVar36) * (sVar36 < 0x100) * auVar225[0xe] - (0xff < sVar36),
                              CONCAT16((0 < sVar35) * (sVar35 < 0x100) * auVar225[0xc] -
                                       (0xff < sVar35),
                                       CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar225[10] -
                                                (0xff < sVar34),
                                                CONCAT14((0 < sVar33) * (sVar33 < 0x100) *
                                                         auVar225[8] - (0xff < sVar33),
                                                         CONCAT13((0 < sVar32) * (sVar32 < 0x100) *
                                                                  auVar225[6] - (0xff < sVar32),
                                                                  CONCAT12((0 < sVar31) *
                                                                           (sVar31 < 0x100) *
                                                                           auVar225[4] -
                                                                           (0xff < sVar31),
                                                                           CONCAT11((0 < sVar43) *
                                                                                    (sVar43 < 0x100)
                                                                                    * auVar225[2] -
                                                                                    (0xff < sVar43),
                                                                                    (0 < sVar30) *
                                                                                    (sVar30 < 0x100)
                                                                                    * auVar225[0] -
                                                                                    (0xff < sVar30))
                                                                          ))))));
                lVar116 = lVar116 + 8;
              } while (uVar107 != (uint)lVar116);
              puVar121 = puVar115 + lVar129 * 4 + -3;
              lVar116 = lVar111 * 2;
              puVar117 = puVar115 + lVar129 * 4;
              local_308._0_8_ = __ptr;
              puVar4 = local_340 + lVar111;
              lVar111 = (long)(int)(uVar107 * 7) + (long)__ptr;
              do {
                lVar135 = lVar111;
                local_158 = puVar4;
                auVar225 = local_278;
                local_168._0_8_ = puVar117;
                lVar111 = local_308._0_8_;
                uVar151 = local_2d8._0_8_;
                local_308._0_8_ = local_2d8._0_8_;
                local_2d8._0_8_ = lVar128;
                uVar150 = local_2e8._0_8_;
                local_2e8._0_8_ = lVar130;
                lVar126 = 0;
                do {
                  uVar110 = *(ulong *)(puVar121 + lVar126);
                  uVar152 = *(undefined8 *)(puVar121 + lVar126 + 1);
                  auVar313._8_6_ = 0;
                  auVar313._0_8_ = uVar110;
                  auVar313[0xe] = (char)(uVar110 >> 0x38);
                  auVar313[0xf] = (char)((ulong)uVar152 >> 0x38);
                  auVar312._14_2_ = auVar313._14_2_;
                  auVar312._8_5_ = 0;
                  auVar312._0_8_ = uVar110;
                  auVar312[0xd] = (char)((ulong)uVar152 >> 0x30);
                  auVar311._13_3_ = auVar312._13_3_;
                  auVar311._8_4_ = 0;
                  auVar311._0_8_ = uVar110;
                  auVar311[0xc] = (char)(uVar110 >> 0x30);
                  auVar310._12_4_ = auVar311._12_4_;
                  auVar310._8_3_ = 0;
                  auVar310._0_8_ = uVar110;
                  auVar310[0xb] = (char)((ulong)uVar152 >> 0x28);
                  auVar309._11_5_ = auVar310._11_5_;
                  auVar309._8_2_ = 0;
                  auVar309._0_8_ = uVar110;
                  auVar309[10] = (char)(uVar110 >> 0x28);
                  auVar308._10_6_ = auVar309._10_6_;
                  auVar308[8] = 0;
                  auVar308._0_8_ = uVar110;
                  auVar308[9] = (char)((ulong)uVar152 >> 0x20);
                  auVar307._9_7_ = auVar308._9_7_;
                  auVar307[8] = (char)(uVar110 >> 0x20);
                  auVar307._0_8_ = uVar110;
                  auVar306._8_8_ = auVar307._8_8_;
                  auVar306[7] = (char)((ulong)uVar152 >> 0x18);
                  auVar306[6] = (char)(uVar110 >> 0x18);
                  auVar306[5] = (char)((ulong)uVar152 >> 0x10);
                  auVar306[4] = (char)(uVar110 >> 0x10);
                  auVar306[3] = (char)((ulong)uVar152 >> 8);
                  auVar306[2] = (char)(uVar110 >> 8);
                  auVar306[0] = (undefined1)uVar110;
                  auVar306[1] = (char)uVar152;
                  uVar110 = *(ulong *)(puVar121 + lVar126 + 2);
                  uVar152 = *(undefined8 *)(puVar121 + lVar126 + 3);
                  auVar410._8_6_ = 0;
                  auVar410._0_8_ = uVar110;
                  auVar410[0xe] = (char)(uVar110 >> 0x38);
                  auVar410[0xf] = (char)((ulong)uVar152 >> 0x38);
                  auVar409._14_2_ = auVar410._14_2_;
                  auVar409._8_5_ = 0;
                  auVar409._0_8_ = uVar110;
                  auVar409[0xd] = (char)((ulong)uVar152 >> 0x30);
                  auVar408._13_3_ = auVar409._13_3_;
                  auVar408._8_4_ = 0;
                  auVar408._0_8_ = uVar110;
                  auVar408[0xc] = (char)(uVar110 >> 0x30);
                  auVar407._12_4_ = auVar408._12_4_;
                  auVar407._8_3_ = 0;
                  auVar407._0_8_ = uVar110;
                  auVar407[0xb] = (char)((ulong)uVar152 >> 0x28);
                  auVar406._11_5_ = auVar407._11_5_;
                  auVar406._8_2_ = 0;
                  auVar406._0_8_ = uVar110;
                  auVar406[10] = (char)(uVar110 >> 0x28);
                  auVar405._10_6_ = auVar406._10_6_;
                  auVar405[8] = 0;
                  auVar405._0_8_ = uVar110;
                  auVar405[9] = (char)((ulong)uVar152 >> 0x20);
                  auVar404._9_7_ = auVar405._9_7_;
                  auVar404[8] = (char)(uVar110 >> 0x20);
                  auVar404._0_8_ = uVar110;
                  auVar403._8_8_ = auVar404._8_8_;
                  auVar403[7] = (char)((ulong)uVar152 >> 0x18);
                  auVar403[6] = (char)(uVar110 >> 0x18);
                  auVar403[5] = (char)((ulong)uVar152 >> 0x10);
                  auVar403[4] = (char)(uVar110 >> 0x10);
                  auVar403[3] = (char)((ulong)uVar152 >> 8);
                  auVar403[2] = (char)(uVar110 >> 8);
                  auVar403[0] = (undefined1)uVar110;
                  auVar403[1] = (char)uVar152;
                  uVar110 = *(ulong *)(puVar121 + lVar126 + 4);
                  uVar152 = *(undefined8 *)(puVar121 + lVar126 + 5);
                  auVar520._8_6_ = 0;
                  auVar520._0_8_ = uVar110;
                  auVar520[0xe] = (char)(uVar110 >> 0x38);
                  auVar520[0xf] = (char)((ulong)uVar152 >> 0x38);
                  auVar519._14_2_ = auVar520._14_2_;
                  auVar519._8_5_ = 0;
                  auVar519._0_8_ = uVar110;
                  auVar519[0xd] = (char)((ulong)uVar152 >> 0x30);
                  auVar518._13_3_ = auVar519._13_3_;
                  auVar518._8_4_ = 0;
                  auVar518._0_8_ = uVar110;
                  auVar518[0xc] = (char)(uVar110 >> 0x30);
                  auVar517._12_4_ = auVar518._12_4_;
                  auVar517._8_3_ = 0;
                  auVar517._0_8_ = uVar110;
                  auVar517[0xb] = (char)((ulong)uVar152 >> 0x28);
                  auVar516._11_5_ = auVar517._11_5_;
                  auVar516._8_2_ = 0;
                  auVar516._0_8_ = uVar110;
                  auVar516[10] = (char)(uVar110 >> 0x28);
                  auVar515._10_6_ = auVar516._10_6_;
                  auVar515[8] = 0;
                  auVar515._0_8_ = uVar110;
                  auVar515[9] = (char)((ulong)uVar152 >> 0x20);
                  auVar514._9_7_ = auVar515._9_7_;
                  auVar514[8] = (char)(uVar110 >> 0x20);
                  auVar514._0_8_ = uVar110;
                  auVar513._8_8_ = auVar514._8_8_;
                  auVar513[7] = (char)((ulong)uVar152 >> 0x18);
                  auVar513[6] = (char)(uVar110 >> 0x18);
                  auVar513[5] = (char)((ulong)uVar152 >> 0x10);
                  auVar513[4] = (char)(uVar110 >> 0x10);
                  auVar513[3] = (char)((ulong)uVar152 >> 8);
                  auVar513[2] = (char)(uVar110 >> 8);
                  auVar513[0] = (undefined1)uVar110;
                  auVar513[1] = (char)uVar152;
                  uVar110 = *(ulong *)(puVar121 + lVar126 + 6);
                  uVar152 = *(undefined8 *)(puVar121 + lVar126 + 7);
                  auVar633._8_6_ = 0;
                  auVar633._0_8_ = uVar110;
                  auVar633[0xe] = (char)(uVar110 >> 0x38);
                  auVar633[0xf] = (char)((ulong)uVar152 >> 0x38);
                  auVar632._14_2_ = auVar633._14_2_;
                  auVar632._8_5_ = 0;
                  auVar632._0_8_ = uVar110;
                  auVar632[0xd] = (char)((ulong)uVar152 >> 0x30);
                  auVar631._13_3_ = auVar632._13_3_;
                  auVar631._8_4_ = 0;
                  auVar631._0_8_ = uVar110;
                  auVar631[0xc] = (char)(uVar110 >> 0x30);
                  auVar630._12_4_ = auVar631._12_4_;
                  auVar630._8_3_ = 0;
                  auVar630._0_8_ = uVar110;
                  auVar630[0xb] = (char)((ulong)uVar152 >> 0x28);
                  auVar629._11_5_ = auVar630._11_5_;
                  auVar629._8_2_ = 0;
                  auVar629._0_8_ = uVar110;
                  auVar629[10] = (char)(uVar110 >> 0x28);
                  auVar628._10_6_ = auVar629._10_6_;
                  auVar628[8] = 0;
                  auVar628._0_8_ = uVar110;
                  auVar628[9] = (char)((ulong)uVar152 >> 0x20);
                  auVar627._9_7_ = auVar628._9_7_;
                  auVar627[8] = (char)(uVar110 >> 0x20);
                  auVar627._0_8_ = uVar110;
                  auVar626._8_8_ = auVar627._8_8_;
                  auVar626[7] = (char)((ulong)uVar152 >> 0x18);
                  auVar626[6] = (char)(uVar110 >> 0x18);
                  auVar626[5] = (char)((ulong)uVar152 >> 0x10);
                  auVar626[4] = (char)(uVar110 >> 0x10);
                  auVar626[3] = (char)((ulong)uVar152 >> 8);
                  auVar626[2] = (char)(uVar110 >> 8);
                  auVar626[0] = (undefined1)uVar110;
                  auVar626[1] = (char)uVar152;
                  auVar709 = pmaddubsw(auVar306,auVar153);
                  auVar710 = pmaddubsw(auVar403,auVar207);
                  auVar729 = pmaddubsw(auVar513,auVar208);
                  auVar732 = pmaddubsw(auVar626,auVar166);
                  auVar634._0_2_ = auVar732._0_2_ + auVar710._0_2_;
                  auVar634._2_2_ = auVar732._2_2_ + auVar710._2_2_;
                  auVar634._4_2_ = auVar732._4_2_ + auVar710._4_2_;
                  auVar634._6_2_ = auVar732._6_2_ + auVar710._6_2_;
                  auVar634._8_2_ = auVar732._8_2_ + auVar710._8_2_;
                  auVar634._10_2_ = auVar732._10_2_ + auVar710._10_2_;
                  auVar634._12_2_ = auVar732._12_2_ + auVar710._12_2_;
                  auVar634._14_2_ = auVar732._14_2_ + auVar710._14_2_;
                  auVar521._0_2_ = auVar729._0_2_ + auVar709._0_2_ + 0x40;
                  auVar521._2_2_ = auVar729._2_2_ + auVar709._2_2_ + 0x40;
                  auVar521._4_2_ = auVar729._4_2_ + auVar709._4_2_ + 0x40;
                  auVar521._6_2_ = auVar729._6_2_ + auVar709._6_2_ + 0x40;
                  auVar521._8_2_ = auVar729._8_2_ + auVar709._8_2_ + 0x40;
                  auVar521._10_2_ = auVar729._10_2_ + auVar709._10_2_ + 0x40;
                  auVar521._12_2_ = auVar729._12_2_ + auVar709._12_2_ + 0x40;
                  auVar521._14_2_ = auVar729._14_2_ + auVar709._14_2_ + 0x40;
                  auVar709 = paddsw(auVar521,auVar634);
                  auVar709 = psraw(auVar709,7);
                  sVar30 = auVar709._0_2_;
                  sVar43 = auVar709._2_2_;
                  sVar31 = auVar709._4_2_;
                  sVar32 = auVar709._6_2_;
                  sVar33 = auVar709._8_2_;
                  sVar34 = auVar709._10_2_;
                  sVar35 = auVar709._12_2_;
                  sVar36 = auVar709._14_2_;
                  *(ulong *)(lVar135 + lVar126) =
                       CONCAT17((0 < sVar36) * (sVar36 < 0x100) * auVar709[0xe] - (0xff < sVar36),
                                CONCAT16((0 < sVar35) * (sVar35 < 0x100) * auVar709[0xc] -
                                         (0xff < sVar35),
                                         CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar709[10] -
                                                  (0xff < sVar34),
                                                  CONCAT14((0 < sVar33) * (sVar33 < 0x100) *
                                                           auVar709[8] - (0xff < sVar33),
                                                           CONCAT13((0 < sVar32) * (sVar32 < 0x100)
                                                                    * auVar709[6] - (0xff < sVar32),
                                                                    CONCAT12((0 < sVar31) *
                                                                             (sVar31 < 0x100) *
                                                                             auVar709[4] -
                                                                             (0xff < sVar31),
                                                                             CONCAT11((0 < sVar43) *
                                                                                      (sVar43 < 
                                                  0x100) * auVar709[2] - (0xff < sVar43),
                                                  (0 < sVar30) * (sVar30 < 0x100) * auVar709[0] -
                                                  (0xff < sVar30))))))));
                  lVar126 = lVar126 + 8;
                } while (uVar107 != (uint)lVar126);
                if (0 < (int)uVar107) {
                  lVar126 = 0;
                  do {
                    uVar110 = *(ulong *)(puVar115 + lVar126);
                    uVar152 = *(undefined8 *)(uVar150 + lVar126);
                    auVar321._8_6_ = 0;
                    auVar321._0_8_ = uVar110;
                    auVar321[0xe] = (char)(uVar110 >> 0x38);
                    auVar321[0xf] = (char)((ulong)uVar152 >> 0x38);
                    auVar320._14_2_ = auVar321._14_2_;
                    auVar320._8_5_ = 0;
                    auVar320._0_8_ = uVar110;
                    auVar320[0xd] = (char)((ulong)uVar152 >> 0x30);
                    auVar319._13_3_ = auVar320._13_3_;
                    auVar319._8_4_ = 0;
                    auVar319._0_8_ = uVar110;
                    auVar319[0xc] = (char)(uVar110 >> 0x30);
                    auVar318._12_4_ = auVar319._12_4_;
                    auVar318._8_3_ = 0;
                    auVar318._0_8_ = uVar110;
                    auVar318[0xb] = (char)((ulong)uVar152 >> 0x28);
                    auVar317._11_5_ = auVar318._11_5_;
                    auVar317._8_2_ = 0;
                    auVar317._0_8_ = uVar110;
                    auVar317[10] = (char)(uVar110 >> 0x28);
                    auVar316._10_6_ = auVar317._10_6_;
                    auVar316[8] = 0;
                    auVar316._0_8_ = uVar110;
                    auVar316[9] = (char)((ulong)uVar152 >> 0x20);
                    auVar315._9_7_ = auVar316._9_7_;
                    auVar315[8] = (char)(uVar110 >> 0x20);
                    auVar315._0_8_ = uVar110;
                    auVar314._8_8_ = auVar315._8_8_;
                    auVar314[7] = (char)((ulong)uVar152 >> 0x18);
                    auVar314[6] = (char)(uVar110 >> 0x18);
                    auVar314[5] = (char)((ulong)uVar152 >> 0x10);
                    auVar314[4] = (char)(uVar110 >> 0x10);
                    auVar314[3] = (char)((ulong)uVar152 >> 8);
                    auVar314[2] = (char)(uVar110 >> 8);
                    auVar314[0] = (undefined1)uVar110;
                    auVar314[1] = (char)uVar152;
                    *(undefined1 (*) [16])(local_340 + lVar126 * 2) = auVar314;
                    uVar110 = *(ulong *)(local_288 + lVar126);
                    uVar152 = *(undefined8 *)(puVar133 + lVar126);
                    auVar418._8_6_ = 0;
                    auVar418._0_8_ = uVar110;
                    auVar418[0xe] = (char)(uVar110 >> 0x38);
                    auVar418[0xf] = (char)((ulong)uVar152 >> 0x38);
                    auVar417._14_2_ = auVar418._14_2_;
                    auVar417._8_5_ = 0;
                    auVar417._0_8_ = uVar110;
                    auVar417[0xd] = (char)((ulong)uVar152 >> 0x30);
                    auVar416._13_3_ = auVar417._13_3_;
                    auVar416._8_4_ = 0;
                    auVar416._0_8_ = uVar110;
                    auVar416[0xc] = (char)(uVar110 >> 0x30);
                    auVar415._12_4_ = auVar416._12_4_;
                    auVar415._8_3_ = 0;
                    auVar415._0_8_ = uVar110;
                    auVar415[0xb] = (char)((ulong)uVar152 >> 0x28);
                    auVar414._11_5_ = auVar415._11_5_;
                    auVar414._8_2_ = 0;
                    auVar414._0_8_ = uVar110;
                    auVar414[10] = (char)(uVar110 >> 0x28);
                    auVar413._10_6_ = auVar414._10_6_;
                    auVar413[8] = 0;
                    auVar413._0_8_ = uVar110;
                    auVar413[9] = (char)((ulong)uVar152 >> 0x20);
                    auVar412._9_7_ = auVar413._9_7_;
                    auVar412[8] = (char)(uVar110 >> 0x20);
                    auVar412._0_8_ = uVar110;
                    auVar411._8_8_ = auVar412._8_8_;
                    auVar411[7] = (char)((ulong)uVar152 >> 0x18);
                    auVar411[6] = (char)(uVar110 >> 0x18);
                    auVar411[5] = (char)((ulong)uVar152 >> 0x10);
                    auVar411[4] = (char)(uVar110 >> 0x10);
                    auVar411[3] = (char)((ulong)uVar152 >> 8);
                    auVar411[2] = (char)(uVar110 >> 8);
                    auVar411[0] = (undefined1)uVar110;
                    auVar411[1] = (char)uVar152;
                    uVar110 = *(ulong *)(lVar131 + lVar126);
                    uVar152 = *(undefined8 *)(puVar115 + lVar126);
                    auVar529._8_6_ = 0;
                    auVar529._0_8_ = uVar110;
                    auVar529[0xe] = (char)(uVar110 >> 0x38);
                    auVar529[0xf] = (char)((ulong)uVar152 >> 0x38);
                    auVar528._14_2_ = auVar529._14_2_;
                    auVar528._8_5_ = 0;
                    auVar528._0_8_ = uVar110;
                    auVar528[0xd] = (char)((ulong)uVar152 >> 0x30);
                    auVar527._13_3_ = auVar528._13_3_;
                    auVar527._8_4_ = 0;
                    auVar527._0_8_ = uVar110;
                    auVar527[0xc] = (char)(uVar110 >> 0x30);
                    auVar526._12_4_ = auVar527._12_4_;
                    auVar526._8_3_ = 0;
                    auVar526._0_8_ = uVar110;
                    auVar526[0xb] = (char)((ulong)uVar152 >> 0x28);
                    auVar525._11_5_ = auVar526._11_5_;
                    auVar525._8_2_ = 0;
                    auVar525._0_8_ = uVar110;
                    auVar525[10] = (char)(uVar110 >> 0x28);
                    auVar524._10_6_ = auVar525._10_6_;
                    auVar524[8] = 0;
                    auVar524._0_8_ = uVar110;
                    auVar524[9] = (char)((ulong)uVar152 >> 0x20);
                    auVar523._9_7_ = auVar524._9_7_;
                    auVar523[8] = (char)(uVar110 >> 0x20);
                    auVar523._0_8_ = uVar110;
                    auVar522._8_8_ = auVar523._8_8_;
                    auVar522[7] = (char)((ulong)uVar152 >> 0x18);
                    auVar522[6] = (char)(uVar110 >> 0x18);
                    auVar522[5] = (char)((ulong)uVar152 >> 0x10);
                    auVar522[4] = (char)(uVar110 >> 0x10);
                    auVar522[3] = (char)((ulong)uVar152 >> 8);
                    auVar522[2] = (char)(uVar110 >> 8);
                    auVar522[0] = (undefined1)uVar110;
                    auVar522[1] = (char)uVar152;
                    uVar110 = *(ulong *)(local_350 + lVar126);
                    uVar152 = *(undefined8 *)(puVar127 + lVar126);
                    auVar329._8_6_ = 0;
                    auVar329._0_8_ = uVar110;
                    auVar329[0xe] = (char)(uVar110 >> 0x38);
                    auVar329[0xf] = (char)((ulong)uVar152 >> 0x38);
                    auVar328._14_2_ = auVar329._14_2_;
                    auVar328._8_5_ = 0;
                    auVar328._0_8_ = uVar110;
                    auVar328[0xd] = (char)((ulong)uVar152 >> 0x30);
                    auVar327._13_3_ = auVar328._13_3_;
                    auVar327._8_4_ = 0;
                    auVar327._0_8_ = uVar110;
                    auVar327[0xc] = (char)(uVar110 >> 0x30);
                    auVar326._12_4_ = auVar327._12_4_;
                    auVar326._8_3_ = 0;
                    auVar326._0_8_ = uVar110;
                    auVar326[0xb] = (char)((ulong)uVar152 >> 0x28);
                    auVar325._11_5_ = auVar326._11_5_;
                    auVar325._8_2_ = 0;
                    auVar325._0_8_ = uVar110;
                    auVar325[10] = (char)(uVar110 >> 0x28);
                    auVar324._10_6_ = auVar325._10_6_;
                    auVar324[8] = 0;
                    auVar324._0_8_ = uVar110;
                    auVar324[9] = (char)((ulong)uVar152 >> 0x20);
                    auVar323._9_7_ = auVar324._9_7_;
                    auVar323[8] = (char)(uVar110 >> 0x20);
                    auVar323._0_8_ = uVar110;
                    auVar322._8_8_ = auVar323._8_8_;
                    auVar322[7] = (char)((ulong)uVar152 >> 0x18);
                    auVar322[6] = (char)(uVar110 >> 0x18);
                    auVar322[5] = (char)((ulong)uVar152 >> 0x10);
                    auVar322[4] = (char)(uVar110 >> 0x10);
                    auVar322[3] = (char)((ulong)uVar152 >> 8);
                    auVar322[2] = (char)(uVar110 >> 8);
                    auVar322[0] = (undefined1)uVar110;
                    auVar322[1] = (char)uVar152;
                    uVar110 = *(ulong *)(local_328._0_8_ + lVar126);
                    uVar152 = *(undefined8 *)(puVar117 + lVar126);
                    auVar642._8_6_ = 0;
                    auVar642._0_8_ = uVar110;
                    auVar642[0xe] = (char)(uVar110 >> 0x38);
                    auVar642[0xf] = (char)((ulong)uVar152 >> 0x38);
                    auVar641._14_2_ = auVar642._14_2_;
                    auVar641._8_5_ = 0;
                    auVar641._0_8_ = uVar110;
                    auVar641[0xd] = (char)((ulong)uVar152 >> 0x30);
                    auVar640._13_3_ = auVar641._13_3_;
                    auVar640._8_4_ = 0;
                    auVar640._0_8_ = uVar110;
                    auVar640[0xc] = (char)(uVar110 >> 0x30);
                    auVar639._12_4_ = auVar640._12_4_;
                    auVar639._8_3_ = 0;
                    auVar639._0_8_ = uVar110;
                    auVar639[0xb] = (char)((ulong)uVar152 >> 0x28);
                    auVar638._11_5_ = auVar639._11_5_;
                    auVar638._8_2_ = 0;
                    auVar638._0_8_ = uVar110;
                    auVar638[10] = (char)(uVar110 >> 0x28);
                    auVar637._10_6_ = auVar638._10_6_;
                    auVar637[8] = 0;
                    auVar637._0_8_ = uVar110;
                    auVar637[9] = (char)((ulong)uVar152 >> 0x20);
                    auVar636._9_7_ = auVar637._9_7_;
                    auVar636[8] = (char)(uVar110 >> 0x20);
                    auVar636._0_8_ = uVar110;
                    auVar635._8_8_ = auVar636._8_8_;
                    auVar635[7] = (char)((ulong)uVar152 >> 0x18);
                    auVar635[6] = (char)(uVar110 >> 0x18);
                    auVar635[5] = (char)((ulong)uVar152 >> 0x10);
                    auVar635[4] = (char)(uVar110 >> 0x10);
                    auVar635[3] = (char)((ulong)uVar152 >> 8);
                    auVar635[2] = (char)(uVar110 >> 8);
                    auVar635[0] = (undefined1)uVar110;
                    auVar635[1] = (char)uVar152;
                    auVar710 = pmaddubsw(auVar411,auVar153);
                    auVar729 = pmaddubsw(auVar522,auVar207);
                    auVar709 = pmaddubsw(auVar322,auVar208);
                    auVar732 = pmaddubsw(auVar635,auVar166);
                    auVar643._0_2_ = auVar732._0_2_ + auVar729._0_2_;
                    auVar643._2_2_ = auVar732._2_2_ + auVar729._2_2_;
                    auVar643._4_2_ = auVar732._4_2_ + auVar729._4_2_;
                    auVar643._6_2_ = auVar732._6_2_ + auVar729._6_2_;
                    auVar643._8_2_ = auVar732._8_2_ + auVar729._8_2_;
                    auVar643._10_2_ = auVar732._10_2_ + auVar729._10_2_;
                    auVar643._12_2_ = auVar732._12_2_ + auVar729._12_2_;
                    auVar643._14_2_ = auVar732._14_2_ + auVar729._14_2_;
                    auVar330._0_2_ = auVar709._0_2_ + auVar710._0_2_ + 0x40;
                    auVar330._2_2_ = auVar709._2_2_ + auVar710._2_2_ + 0x40;
                    auVar330._4_2_ = auVar709._4_2_ + auVar710._4_2_ + 0x40;
                    auVar330._6_2_ = auVar709._6_2_ + auVar710._6_2_ + 0x40;
                    auVar330._8_2_ = auVar709._8_2_ + auVar710._8_2_ + 0x40;
                    auVar330._10_2_ = auVar709._10_2_ + auVar710._10_2_ + 0x40;
                    auVar330._12_2_ = auVar709._12_2_ + auVar710._12_2_ + 0x40;
                    auVar330._14_2_ = auVar709._14_2_ + auVar710._14_2_ + 0x40;
                    auVar709 = paddsw(auVar330,auVar643);
                    auVar709 = psraw(auVar709,7);
                    sVar30 = auVar709._0_2_;
                    sVar31 = auVar709._2_2_;
                    sVar33 = auVar709._4_2_;
                    sVar35 = auVar709._6_2_;
                    sVar37 = auVar709._8_2_;
                    sVar39 = auVar709._10_2_;
                    sVar41 = auVar709._12_2_;
                    sVar44 = auVar709._14_2_;
                    uVar110 = *(ulong *)(lVar111 + lVar126);
                    uVar152 = *(undefined8 *)(uVar151 + lVar126);
                    auVar426._8_6_ = 0;
                    auVar426._0_8_ = uVar110;
                    auVar426[0xe] = (char)(uVar110 >> 0x38);
                    auVar426[0xf] = (char)((ulong)uVar152 >> 0x38);
                    auVar425._14_2_ = auVar426._14_2_;
                    auVar425._8_5_ = 0;
                    auVar425._0_8_ = uVar110;
                    auVar425[0xd] = (char)((ulong)uVar152 >> 0x30);
                    auVar424._13_3_ = auVar425._13_3_;
                    auVar424._8_4_ = 0;
                    auVar424._0_8_ = uVar110;
                    auVar424[0xc] = (char)(uVar110 >> 0x30);
                    auVar423._12_4_ = auVar424._12_4_;
                    auVar423._8_3_ = 0;
                    auVar423._0_8_ = uVar110;
                    auVar423[0xb] = (char)((ulong)uVar152 >> 0x28);
                    auVar422._11_5_ = auVar423._11_5_;
                    auVar422._8_2_ = 0;
                    auVar422._0_8_ = uVar110;
                    auVar422[10] = (char)(uVar110 >> 0x28);
                    auVar421._10_6_ = auVar422._10_6_;
                    auVar421[8] = 0;
                    auVar421._0_8_ = uVar110;
                    auVar421[9] = (char)((ulong)uVar152 >> 0x20);
                    auVar420._9_7_ = auVar421._9_7_;
                    auVar420[8] = (char)(uVar110 >> 0x20);
                    auVar420._0_8_ = uVar110;
                    auVar419._8_8_ = auVar420._8_8_;
                    auVar419[7] = (char)((ulong)uVar152 >> 0x18);
                    auVar419[6] = (char)(uVar110 >> 0x18);
                    auVar419[5] = (char)((ulong)uVar152 >> 0x10);
                    auVar419[4] = (char)(uVar110 >> 0x10);
                    auVar419[3] = (char)((ulong)uVar152 >> 8);
                    auVar419[2] = (char)(uVar110 >> 8);
                    auVar419[0] = (undefined1)uVar110;
                    auVar419[1] = (char)uVar152;
                    uVar110 = *(ulong *)(lVar128 + lVar126);
                    uVar152 = *(undefined8 *)(uVar150 + lVar126);
                    auVar537._8_6_ = 0;
                    auVar537._0_8_ = uVar110;
                    auVar537[0xe] = (char)(uVar110 >> 0x38);
                    auVar537[0xf] = (char)((ulong)uVar152 >> 0x38);
                    auVar536._14_2_ = auVar537._14_2_;
                    auVar536._8_5_ = 0;
                    auVar536._0_8_ = uVar110;
                    auVar536[0xd] = (char)((ulong)uVar152 >> 0x30);
                    auVar535._13_3_ = auVar536._13_3_;
                    auVar535._8_4_ = 0;
                    auVar535._0_8_ = uVar110;
                    auVar535[0xc] = (char)(uVar110 >> 0x30);
                    auVar534._12_4_ = auVar535._12_4_;
                    auVar534._8_3_ = 0;
                    auVar534._0_8_ = uVar110;
                    auVar534[0xb] = (char)((ulong)uVar152 >> 0x28);
                    auVar533._11_5_ = auVar534._11_5_;
                    auVar533._8_2_ = 0;
                    auVar533._0_8_ = uVar110;
                    auVar533[10] = (char)(uVar110 >> 0x28);
                    auVar532._10_6_ = auVar533._10_6_;
                    auVar532[8] = 0;
                    auVar532._0_8_ = uVar110;
                    auVar532[9] = (char)((ulong)uVar152 >> 0x20);
                    auVar531._9_7_ = auVar532._9_7_;
                    auVar531[8] = (char)(uVar110 >> 0x20);
                    auVar531._0_8_ = uVar110;
                    auVar530._8_8_ = auVar531._8_8_;
                    auVar530[7] = (char)((ulong)uVar152 >> 0x18);
                    auVar530[6] = (char)(uVar110 >> 0x18);
                    auVar530[5] = (char)((ulong)uVar152 >> 0x10);
                    auVar530[4] = (char)(uVar110 >> 0x10);
                    auVar530[3] = (char)((ulong)uVar152 >> 8);
                    auVar530[2] = (char)(uVar110 >> 8);
                    auVar530[0] = (undefined1)uVar110;
                    auVar530[1] = (char)uVar152;
                    uVar110 = *(ulong *)(lVar130 + lVar126);
                    uVar152 = *(undefined8 *)(lVar125 + lVar126);
                    auVar651._8_6_ = 0;
                    auVar651._0_8_ = uVar110;
                    auVar651[0xe] = (char)(uVar110 >> 0x38);
                    auVar651[0xf] = (char)((ulong)uVar152 >> 0x38);
                    auVar650._14_2_ = auVar651._14_2_;
                    auVar650._8_5_ = 0;
                    auVar650._0_8_ = uVar110;
                    auVar650[0xd] = (char)((ulong)uVar152 >> 0x30);
                    auVar649._13_3_ = auVar650._13_3_;
                    auVar649._8_4_ = 0;
                    auVar649._0_8_ = uVar110;
                    auVar649[0xc] = (char)(uVar110 >> 0x30);
                    auVar648._12_4_ = auVar649._12_4_;
                    auVar648._8_3_ = 0;
                    auVar648._0_8_ = uVar110;
                    auVar648[0xb] = (char)((ulong)uVar152 >> 0x28);
                    auVar647._11_5_ = auVar648._11_5_;
                    auVar647._8_2_ = 0;
                    auVar647._0_8_ = uVar110;
                    auVar647[10] = (char)(uVar110 >> 0x28);
                    auVar646._10_6_ = auVar647._10_6_;
                    auVar646[8] = 0;
                    auVar646._0_8_ = uVar110;
                    auVar646[9] = (char)((ulong)uVar152 >> 0x20);
                    auVar645._9_7_ = auVar646._9_7_;
                    auVar645[8] = (char)(uVar110 >> 0x20);
                    auVar645._0_8_ = uVar110;
                    auVar644._8_8_ = auVar645._8_8_;
                    auVar644[7] = (char)((ulong)uVar152 >> 0x18);
                    auVar644[6] = (char)(uVar110 >> 0x18);
                    auVar644[5] = (char)((ulong)uVar152 >> 0x10);
                    auVar644[4] = (char)(uVar110 >> 0x10);
                    auVar644[3] = (char)((ulong)uVar152 >> 8);
                    auVar644[2] = (char)(uVar110 >> 8);
                    auVar644[0] = (undefined1)uVar110;
                    auVar644[1] = (char)uVar152;
                    uVar110 = *(ulong *)(lVar139 + lVar126);
                    uVar152 = *(undefined8 *)(lVar135 + lVar126);
                    auVar683._8_6_ = 0;
                    auVar683._0_8_ = uVar110;
                    auVar683[0xe] = (char)(uVar110 >> 0x38);
                    auVar683[0xf] = (char)((ulong)uVar152 >> 0x38);
                    auVar682._14_2_ = auVar683._14_2_;
                    auVar682._8_5_ = 0;
                    auVar682._0_8_ = uVar110;
                    auVar682[0xd] = (char)((ulong)uVar152 >> 0x30);
                    auVar681._13_3_ = auVar682._13_3_;
                    auVar681._8_4_ = 0;
                    auVar681._0_8_ = uVar110;
                    auVar681[0xc] = (char)(uVar110 >> 0x30);
                    auVar680._12_4_ = auVar681._12_4_;
                    auVar680._8_3_ = 0;
                    auVar680._0_8_ = uVar110;
                    auVar680[0xb] = (char)((ulong)uVar152 >> 0x28);
                    auVar679._11_5_ = auVar680._11_5_;
                    auVar679._8_2_ = 0;
                    auVar679._0_8_ = uVar110;
                    auVar679[10] = (char)(uVar110 >> 0x28);
                    auVar678._10_6_ = auVar679._10_6_;
                    auVar678[8] = 0;
                    auVar678._0_8_ = uVar110;
                    auVar678[9] = (char)((ulong)uVar152 >> 0x20);
                    auVar677._9_7_ = auVar678._9_7_;
                    auVar677[8] = (char)(uVar110 >> 0x20);
                    auVar677._0_8_ = uVar110;
                    auVar676._8_8_ = auVar677._8_8_;
                    auVar676[7] = (char)((ulong)uVar152 >> 0x18);
                    auVar676[6] = (char)(uVar110 >> 0x18);
                    auVar676[5] = (char)((ulong)uVar152 >> 0x10);
                    auVar676[4] = (char)(uVar110 >> 0x10);
                    auVar676[3] = (char)((ulong)uVar152 >> 8);
                    auVar676[2] = (char)(uVar110 >> 8);
                    auVar676[0] = (undefined1)uVar110;
                    auVar676[1] = (char)uVar152;
                    auVar710 = pmaddubsw(auVar419,auVar153);
                    auVar729 = pmaddubsw(auVar530,auVar207);
                    auVar732 = pmaddubsw(auVar644,auVar208);
                    auVar719 = pmaddubsw(auVar676,auVar166);
                    auVar684._0_2_ = auVar719._0_2_ + auVar729._0_2_;
                    auVar684._2_2_ = auVar719._2_2_ + auVar729._2_2_;
                    auVar684._4_2_ = auVar719._4_2_ + auVar729._4_2_;
                    auVar684._6_2_ = auVar719._6_2_ + auVar729._6_2_;
                    auVar684._8_2_ = auVar719._8_2_ + auVar729._8_2_;
                    auVar684._10_2_ = auVar719._10_2_ + auVar729._10_2_;
                    auVar684._12_2_ = auVar719._12_2_ + auVar729._12_2_;
                    auVar684._14_2_ = auVar719._14_2_ + auVar729._14_2_;
                    auVar652._0_2_ = auVar732._0_2_ + auVar710._0_2_ + 0x40;
                    auVar652._2_2_ = auVar732._2_2_ + auVar710._2_2_ + 0x40;
                    auVar652._4_2_ = auVar732._4_2_ + auVar710._4_2_ + 0x40;
                    auVar652._6_2_ = auVar732._6_2_ + auVar710._6_2_ + 0x40;
                    auVar652._8_2_ = auVar732._8_2_ + auVar710._8_2_ + 0x40;
                    auVar652._10_2_ = auVar732._10_2_ + auVar710._10_2_ + 0x40;
                    auVar652._12_2_ = auVar732._12_2_ + auVar710._12_2_ + 0x40;
                    auVar652._14_2_ = auVar732._14_2_ + auVar710._14_2_ + 0x40;
                    auVar710 = paddsw(auVar652,auVar684);
                    auVar710 = psraw(auVar710,7);
                    sVar43 = auVar710._0_2_;
                    sVar32 = auVar710._2_2_;
                    sVar34 = auVar710._4_2_;
                    sVar36 = auVar710._6_2_;
                    sVar38 = auVar710._8_2_;
                    sVar40 = auVar710._10_2_;
                    sVar42 = auVar710._12_2_;
                    sVar45 = auVar710._14_2_;
                    puVar4 = local_158 + lVar126 * 2;
                    *puVar4 = (0 < sVar30) * (sVar30 < 0x100) * auVar709[0] - (0xff < sVar30);
                    puVar4[1] = (0 < sVar43) * (sVar43 < 0x100) * auVar710[0] - (0xff < sVar43);
                    puVar4[2] = (0 < sVar31) * (sVar31 < 0x100) * auVar709[2] - (0xff < sVar31);
                    puVar4[3] = (0 < sVar32) * (sVar32 < 0x100) * auVar710[2] - (0xff < sVar32);
                    puVar4[4] = (0 < sVar33) * (sVar33 < 0x100) * auVar709[4] - (0xff < sVar33);
                    puVar4[5] = (0 < sVar34) * (sVar34 < 0x100) * auVar710[4] - (0xff < sVar34);
                    puVar4[6] = (0 < sVar35) * (sVar35 < 0x100) * auVar709[6] - (0xff < sVar35);
                    puVar4[7] = (0 < sVar36) * (sVar36 < 0x100) * auVar710[6] - (0xff < sVar36);
                    puVar4[8] = (0 < sVar37) * (sVar37 < 0x100) * auVar709[8] - (0xff < sVar37);
                    puVar4[9] = (0 < sVar38) * (sVar38 < 0x100) * auVar710[8] - (0xff < sVar38);
                    puVar4[10] = (0 < sVar39) * (sVar39 < 0x100) * auVar709[10] - (0xff < sVar39);
                    puVar4[0xb] = (0 < sVar40) * (sVar40 < 0x100) * auVar710[10] - (0xff < sVar40);
                    puVar4[0xc] = (0 < sVar41) * (sVar41 < 0x100) * auVar709[0xc] - (0xff < sVar41);
                    puVar4[0xd] = (0 < sVar42) * (sVar42 < 0x100) * auVar710[0xc] - (0xff < sVar42);
                    puVar4[0xe] = (0 < sVar44) * (sVar44 < 0x100) * auVar709[0xe] - (0xff < sVar44);
                    puVar4[0xf] = (0 < sVar45) * (sVar45 < 0x100) * auVar710[0xe] - (0xff < sVar45);
                    lVar126 = lVar126 + 8;
                  } while (lVar126 < (int)uVar107);
                }
                puVar115 = puVar115 + lVar129;
                local_340 = local_340 + lVar116;
                puVar121 = puVar121 + lVar129;
                puVar117 = puVar117 + lVar129;
                local_328._0_8_ = local_328._0_8_ + lVar129;
                puVar127 = puVar127 + lVar129;
                local_350 = local_350 + lVar129;
                lVar131 = lVar131 + lVar129;
                puVar133 = puVar133 + lVar129;
                local_288 = local_288 + lVar129;
                local_278._0_4_ = local_278._0_4_ - 1;
                local_278._4_4_ = 0;
                local_278._8_8_ = auVar225._8_8_;
                lVar130 = lVar125;
                lVar125 = lVar139;
                puVar4 = local_158 + lVar116;
                lVar128 = uVar150;
                lVar139 = lVar135;
              } while (local_278._0_4_ != 0);
              free(__ptr);
              bVar144 = false;
              auVar166 = _DAT_0050f2b0;
            }
          }
          _DAT_0050f2b0 = auVar166;
          if (__ptr != (undefined8 *)0x0) goto LAB_003e864f;
        }
LAB_003e8651:
      } while ((!bVar144) && (uVar132 = uVar132 + 1, uVar132 != uVar134));
      if (bVar143) {
        av1_resize_and_extend_frame_c(src,dst,filter,phase,num_planes);
        return;
      }
    }
    aom_extend_frame_borders_c(dst,num_planes);
    return;
  }
LAB_003e8686:
  av1_resize_and_extend_frame_c(src,dst,filter,phase,num_planes);
  return;
}

Assistant:

void av1_resize_and_extend_frame_ssse3(const YV12_BUFFER_CONFIG *src,
                                       YV12_BUFFER_CONFIG *dst,
                                       const InterpFilter filter,
                                       const int phase, const int num_planes) {
  bool has_normative_scaler =
      has_normative_scaler_ssse3(src->y_crop_width, src->y_crop_height,
                                 dst->y_crop_width, dst->y_crop_height);

  if (num_planes > 1) {
    has_normative_scaler =
        has_normative_scaler &&
        has_normative_scaler_ssse3(src->uv_crop_width, src->uv_crop_height,
                                   dst->uv_crop_width, dst->uv_crop_height);
  }

  if (!has_normative_scaler) {
    av1_resize_and_extend_frame_c(src, dst, filter, phase, num_planes);
    return;
  }

  // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
  // the static analysis warnings.
  int malloc_failed = 0;
  for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); ++i) {
    const int is_uv = i > 0;
    const int src_w = src->crop_widths[is_uv];
    const int src_h = src->crop_heights[is_uv];
    const int src_y_w = (src->crop_widths[0] + 1) & ~1;
    const int dst_w = dst->crop_widths[is_uv];
    const int dst_h = dst->crop_heights[is_uv];
    const int dst_y_w = (dst->crop_widths[0] + 1) & ~1;
    const int dst_y_h = (dst->crop_heights[0] + 1) & ~1;

    if (2 * dst_w == src_w && 2 * dst_h == src_h) {
      // 2 to 1
      if (phase == 0) {
        scale_plane_2_to_1_phase_0(src->buffers[i], src->strides[is_uv],
                                   dst->buffers[i], dst->strides[is_uv], dst_w,
                                   dst_h);
      } else if (filter == BILINEAR) {
        const int16_t c0 = av1_bilinear_filters[phase][3];
        const int16_t c1 = av1_bilinear_filters[phase][4];
        const __m128i c0c1 = _mm_set1_epi16(c0 | (c1 << 8));  // c0 and c1 >= 0
        scale_plane_2_to_1_bilinear(src->buffers[i], src->strides[is_uv],
                                    dst->buffers[i], dst->strides[is_uv], dst_w,
                                    dst_h, c0c1);
      } else {
        const int buffer_stride = (dst_y_w + 3) & ~3;
        const int buffer_height = (2 * dst_y_h + SUBPEL_TAPS - 2 + 7) & ~7;
        uint8_t *const temp_buffer =
            (uint8_t *)malloc(buffer_stride * buffer_height);
        if (!temp_buffer) {
          malloc_failed = 1;
          break;
        }
        const InterpKernel *interp_kernel =
            (const InterpKernel *)av1_interp_filter_params_list[filter]
                .filter_ptr;
        scale_plane_2_to_1_general(src->buffers[i], src->strides[is_uv],
                                   dst->buffers[i], dst->strides[is_uv], dst_w,
                                   dst_h, interp_kernel[phase], temp_buffer);
        free(temp_buffer);
      }
    } else if (4 * dst_w == src_w && 4 * dst_h == src_h) {
      // 4 to 1
      if (phase == 0) {
        scale_plane_4_to_1_phase_0(src->buffers[i], src->strides[is_uv],
                                   dst->buffers[i], dst->strides[is_uv], dst_w,
                                   dst_h);
      } else if (filter == BILINEAR) {
        const int16_t c0 = av1_bilinear_filters[phase][3];
        const int16_t c1 = av1_bilinear_filters[phase][4];
        const __m128i c0c1 = _mm_set1_epi16(c0 | (c1 << 8));  // c0 and c1 >= 0
        scale_plane_4_to_1_bilinear(src->buffers[i], src->strides[is_uv],
                                    dst->buffers[i], dst->strides[is_uv], dst_w,
                                    dst_h, c0c1);
      } else {
        const int buffer_stride = (dst_y_w + 1) & ~1;
        const int buffer_height = (4 * dst_y_h + SUBPEL_TAPS - 2 + 7) & ~7;
        // When dst_w is 1 or 2, we need extra padding to avoid heap read
        // overflow
        const int extra_padding = 16;
        uint8_t *const temp_buffer =
            (uint8_t *)malloc(buffer_stride * buffer_height + extra_padding);
        if (!temp_buffer) {
          malloc_failed = 1;
          break;
        }
        const InterpKernel *interp_kernel =
            (const InterpKernel *)av1_interp_filter_params_list[filter]
                .filter_ptr;
        scale_plane_4_to_1_general(src->buffers[i], src->strides[is_uv],
                                   dst->buffers[i], dst->strides[is_uv], dst_w,
                                   dst_h, interp_kernel[phase], temp_buffer);
        free(temp_buffer);
      }
    } else if (4 * dst_w == 3 * src_w && 4 * dst_h == 3 * src_h) {
      // 4 to 3
      const int buffer_stride_hor = (dst_y_w + 5) - ((dst_y_w + 5) % 6) + 2;
      const int buffer_stride_ver = (dst_y_w + 7) & ~7;
      const int buffer_height = (4 * dst_y_h / 3 + SUBPEL_TAPS - 1 + 7) & ~7;
      // When the vertical filter reads more pixels than the horizontal filter
      // generated in each row, we need extra padding to avoid heap read
      // overflow. For example, the horizontal filter generates 18 pixels but
      // the vertical filter reads 24 pixels in a row. The difference is
      // multiplied by 2 since two rows are interlaced together in the
      // optimization.
      const int extra_padding =
          (buffer_stride_ver > buffer_stride_hor)
              ? 2 * (buffer_stride_ver - buffer_stride_hor)
              : 0;
      const int buffer_size = buffer_stride_hor * buffer_height + extra_padding;
      uint8_t *const temp_buffer = (uint8_t *)malloc(buffer_size);
      if (!temp_buffer) {
        malloc_failed = 1;
        break;
      }
      const InterpKernel *interp_kernel =
          (const InterpKernel *)av1_interp_filter_params_list[filter]
              .filter_ptr;
      scale_plane_4_to_3_general(src->buffers[i], src->strides[is_uv],
                                 dst->buffers[i], dst->strides[is_uv], dst_w,
                                 dst_h, interp_kernel, phase, temp_buffer);
      free(temp_buffer);
    } else {
      assert(dst_w == src_w * 2 && dst_h == src_h * 2);
      // 1 to 2
      uint8_t *const temp_buffer = (uint8_t *)malloc(8 * ((src_y_w + 7) & ~7));
      if (!temp_buffer) {
        malloc_failed = 1;
        break;
      }
      const InterpKernel *interp_kernel =
          (const InterpKernel *)av1_interp_filter_params_list[filter]
              .filter_ptr;
      scale_plane_1_to_2_phase_0(src->buffers[i], src->strides[is_uv],
                                 dst->buffers[i], dst->strides[is_uv], src_w,
                                 src_h, interp_kernel[8], temp_buffer);
      free(temp_buffer);
    }
  }

  if (malloc_failed) {
    av1_resize_and_extend_frame_c(src, dst, filter, phase, num_planes);
  } else {
    aom_extend_frame_borders(dst, num_planes);
  }
}